

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

bool embree::avx::CurveNvIntersector1<4>::
     occluded_t<embree::avx::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::avx::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  undefined8 uVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  Primitive PVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  long lVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  bool bVar57;
  bool bVar58;
  bool bVar59;
  bool bVar60;
  bool bVar61;
  bool bVar62;
  bool bVar63;
  bool bVar64;
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  long lVar71;
  ulong uVar72;
  byte bVar73;
  uint uVar74;
  ulong uVar75;
  uint uVar76;
  byte unaff_R13B;
  vint4 bi_1;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar105;
  float fVar106;
  float fVar107;
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  float fVar137;
  float fVar138;
  vint4 bi_2;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aVar139;
  undefined1 auVar111 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar140;
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  float fVar141;
  float fVar160;
  float fVar162;
  vint4 ai;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar142;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar161;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  float fVar169;
  float fVar181;
  float fVar182;
  vint4 bi;
  undefined1 auVar170 [16];
  float fVar183;
  undefined1 auVar171 [16];
  undefined1 auVar176 [28];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  float fVar184;
  float fVar185;
  float fVar202;
  float fVar204;
  vint4 ai_2;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  float fVar206;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  float fVar208;
  float fVar209;
  float fVar210;
  undefined1 auVar197 [32];
  float fVar203;
  float fVar205;
  float fVar207;
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar201 [32];
  float fVar211;
  float fVar228;
  float fVar229;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar216 [16];
  float fVar231;
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar215 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  float fVar230;
  float fVar232;
  float fVar233;
  float fVar234;
  undefined1 auVar227 [64];
  float fVar245;
  float fVar247;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  float fVar246;
  float fVar248;
  float fVar250;
  float fVar251;
  float fVar254;
  float fVar257;
  float fVar260;
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  float fVar249;
  float fVar252;
  float fVar255;
  float fVar258;
  float fVar261;
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  float fVar253;
  float fVar256;
  float fVar259;
  undefined1 auVar244 [64];
  float fVar262;
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  float fVar266;
  float fVar267;
  float fVar268;
  float fVar269;
  float fVar270;
  float fVar271;
  undefined1 auVar265 [64];
  float fVar272;
  float fVar285;
  float fVar290;
  vint4 ai_1;
  undefined4 uVar289;
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  float fVar273;
  float fVar274;
  float fVar275;
  float fVar286;
  float fVar287;
  float fVar288;
  float fVar291;
  float fVar292;
  float fVar293;
  float fVar294;
  float fVar295;
  float fVar296;
  float fVar297;
  float fVar298;
  float fVar299;
  float fVar300;
  float fVar301;
  float fVar302;
  float fVar303;
  float fVar304;
  float fVar305;
  float fVar306;
  float fVar307;
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar315 [16];
  float fVar313;
  float fVar314;
  undefined1 auVar310 [32];
  float fVar312;
  undefined1 auVar311 [64];
  float fVar319;
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar318 [64];
  undefined1 auVar320 [16];
  undefined1 auVar322 [28];
  float fVar326;
  undefined1 auVar323 [32];
  undefined1 auVar321 [16];
  undefined1 auVar325 [64];
  float fVar327;
  float fVar332;
  float fVar333;
  undefined1 auVar328 [16];
  float fVar334;
  float fVar335;
  float fVar336;
  float fVar337;
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  float fVar338;
  float fVar344;
  float fVar346;
  undefined1 auVar340 [16];
  float fVar339;
  undefined1 auVar341 [16];
  float fVar345;
  float fVar347;
  float fVar348;
  float fVar349;
  float fVar350;
  float fVar351;
  float fVar352;
  float fVar353;
  float fVar354;
  float fVar355;
  undefined1 auVar342 [32];
  float fVar356;
  undefined1 auVar343 [32];
  float fVar357;
  float fVar358;
  float fVar364;
  float fVar366;
  float fVar367;
  float fVar368;
  float fVar369;
  float fVar370;
  undefined1 auVar359 [32];
  float fVar365;
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  float fVar371;
  float fVar373;
  float fVar374;
  float fVar375;
  float fVar376;
  float fVar377;
  float fVar378;
  undefined1 auVar372 [32];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  bool local_aed;
  int local_aec;
  RayQueryContext *local_ae8;
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float fStack_ac8;
  float fStack_ac4;
  undefined4 local_aa4;
  float local_aa0;
  undefined4 uStack_a9c;
  undefined4 uStack_a98;
  undefined4 uStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float fStack_a88;
  float fStack_a84;
  ulong local_a68;
  float local_a60;
  float fStack_a5c;
  float fStack_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float fStack_a48;
  float fStack_a44;
  undefined1 local_a40 [32];
  undefined1 local_a20 [8];
  float fStack_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float fStack_a08;
  float fStack_a04;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9b0 [8];
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  undefined1 local_990 [8];
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  RTCFilterFunctionNArguments local_970;
  undefined1 local_940 [32];
  float local_920;
  float fStack_91c;
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [32];
  undefined8 local_8d0;
  undefined4 local_8c8;
  float local_8c4;
  undefined4 local_8c0;
  undefined4 local_8bc;
  undefined4 local_8b8;
  uint local_8b4;
  uint local_8b0;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  undefined1 auStack_890 [16];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [16];
  undefined1 local_7b0 [16];
  Primitive *local_798;
  Primitive *local_790;
  ulong local_788;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  float local_720;
  float fStack_71c;
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  float local_700;
  float fStack_6fc;
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  ulong local_5e0;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  undefined4 uStack_5c4;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  float local_520 [4];
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  float local_500 [4];
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined4 uStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined4 uStack_1c4;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar324 [32];
  undefined1 auVar331 [64];
  undefined1 auVar360 [32];
  
  PVar5 = prim[1];
  uVar75 = (ulong)(byte)PVar5;
  lVar71 = uVar75 * 0x19;
  auVar87 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + lVar71 + 6));
  fVar169 = *(float *)(prim + lVar71 + 0x12);
  auVar108._0_4_ = fVar169 * auVar87._0_4_;
  auVar108._4_4_ = fVar169 * auVar87._4_4_;
  auVar108._8_4_ = fVar169 * auVar87._8_4_;
  auVar108._12_4_ = fVar169 * auVar87._12_4_;
  auVar212._0_4_ = fVar169 * (ray->dir).field_0.m128[0];
  auVar212._4_4_ = fVar169 * (ray->dir).field_0.m128[1];
  auVar212._8_4_ = fVar169 * (ray->dir).field_0.m128[2];
  auVar212._12_4_ = fVar169 * (ray->dir).field_0.m128[3];
  auVar87 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar75 * 4 + 6)));
  auVar149 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar75 * 5 + 6)));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar89 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar75 * 6 + 6)));
  auVar149 = vcvtdq2ps_avx(auVar149);
  auVar116 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar75 * 0xb + 6)));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar5 * 0xc) + 6)));
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar88 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar5 * 0xc + uVar75 + 6)));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar88 = vcvtdq2ps_avx(auVar88);
  uVar72 = (ulong)(uint)((int)(uVar75 * 9) * 2);
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 + 6)));
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 + uVar75 + 6)));
  auVar79 = vcvtdq2ps_avx(auVar79);
  uVar72 = (ulong)(uint)((int)(uVar75 * 5) << 2);
  auVar110 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 + 6)));
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar318 = ZEXT1664(auVar110);
  auVar77 = vshufps_avx(auVar212,auVar212,0);
  auVar109 = vshufps_avx(auVar212,auVar212,0x55);
  auVar143 = vshufps_avx(auVar212,auVar212,0xaa);
  fVar169 = auVar143._0_4_;
  fVar184 = auVar143._4_4_;
  fVar211 = auVar143._8_4_;
  fVar181 = auVar143._12_4_;
  fVar229 = auVar109._0_4_;
  fVar183 = auVar109._4_4_;
  fVar206 = auVar109._8_4_;
  fVar230 = auVar109._12_4_;
  fVar202 = auVar77._0_4_;
  fVar228 = auVar77._4_4_;
  fVar182 = auVar77._8_4_;
  fVar204 = auVar77._12_4_;
  auVar328._0_4_ = fVar202 * auVar87._0_4_ + fVar229 * auVar149._0_4_ + fVar169 * auVar89._0_4_;
  auVar328._4_4_ = fVar228 * auVar87._4_4_ + fVar183 * auVar149._4_4_ + fVar184 * auVar89._4_4_;
  auVar328._8_4_ = fVar182 * auVar87._8_4_ + fVar206 * auVar149._8_4_ + fVar211 * auVar89._8_4_;
  auVar328._12_4_ = fVar204 * auVar87._12_4_ + fVar230 * auVar149._12_4_ + fVar181 * auVar89._12_4_;
  auVar331 = ZEXT1664(auVar328);
  auVar340._0_4_ = fVar202 * auVar116._0_4_ + fVar229 * auVar82._0_4_ + auVar88._0_4_ * fVar169;
  auVar340._4_4_ = fVar228 * auVar116._4_4_ + fVar183 * auVar82._4_4_ + auVar88._4_4_ * fVar184;
  auVar340._8_4_ = fVar182 * auVar116._8_4_ + fVar206 * auVar82._8_4_ + auVar88._8_4_ * fVar211;
  auVar340._12_4_ = fVar204 * auVar116._12_4_ + fVar230 * auVar82._12_4_ + auVar88._12_4_ * fVar181;
  auVar213._0_4_ = fVar202 * auVar78._0_4_ + fVar229 * auVar79._0_4_ + auVar110._0_4_ * fVar169;
  auVar213._4_4_ = fVar228 * auVar78._4_4_ + fVar183 * auVar79._4_4_ + auVar110._4_4_ * fVar184;
  auVar213._8_4_ = fVar182 * auVar78._8_4_ + fVar206 * auVar79._8_4_ + auVar110._8_4_ * fVar211;
  auVar213._12_4_ = fVar204 * auVar78._12_4_ + fVar230 * auVar79._12_4_ + auVar110._12_4_ * fVar181;
  auVar77 = vshufps_avx(auVar108,auVar108,0);
  auVar325 = ZEXT1664(auVar77);
  auVar109 = vshufps_avx(auVar108,auVar108,0x55);
  auVar143 = vshufps_avx(auVar108,auVar108,0xaa);
  fVar169 = auVar143._0_4_;
  fVar184 = auVar143._4_4_;
  fVar211 = auVar143._8_4_;
  fVar181 = auVar143._12_4_;
  fVar229 = auVar109._0_4_;
  fVar183 = auVar109._4_4_;
  fVar206 = auVar109._8_4_;
  fVar230 = auVar109._12_4_;
  fVar202 = auVar77._0_4_;
  fVar228 = auVar77._4_4_;
  fVar182 = auVar77._8_4_;
  fVar204 = auVar77._12_4_;
  auVar235._0_4_ = fVar202 * auVar87._0_4_ + fVar229 * auVar149._0_4_ + fVar169 * auVar89._0_4_;
  auVar235._4_4_ = fVar228 * auVar87._4_4_ + fVar183 * auVar149._4_4_ + fVar184 * auVar89._4_4_;
  auVar235._8_4_ = fVar182 * auVar87._8_4_ + fVar206 * auVar149._8_4_ + fVar211 * auVar89._8_4_;
  auVar235._12_4_ = fVar204 * auVar87._12_4_ + fVar230 * auVar149._12_4_ + fVar181 * auVar89._12_4_;
  auVar77._0_4_ = fVar202 * auVar116._0_4_ + auVar88._0_4_ * fVar169 + fVar229 * auVar82._0_4_;
  auVar77._4_4_ = fVar228 * auVar116._4_4_ + auVar88._4_4_ * fVar184 + fVar183 * auVar82._4_4_;
  auVar77._8_4_ = fVar182 * auVar116._8_4_ + auVar88._8_4_ * fVar211 + fVar206 * auVar82._8_4_;
  auVar77._12_4_ = fVar204 * auVar116._12_4_ + auVar88._12_4_ * fVar181 + fVar230 * auVar82._12_4_;
  auVar276._8_4_ = 0x7fffffff;
  auVar276._0_8_ = 0x7fffffff7fffffff;
  auVar276._12_4_ = 0x7fffffff;
  auVar87 = vandps_avx(auVar328,auVar276);
  auVar186._8_4_ = 0x219392ef;
  auVar186._0_8_ = 0x219392ef219392ef;
  auVar186._12_4_ = 0x219392ef;
  auVar87 = vcmpps_avx(auVar87,auVar186,1);
  auVar149 = vblendvps_avx(auVar328,auVar186,auVar87);
  auVar87 = vandps_avx(auVar340,auVar276);
  auVar87 = vcmpps_avx(auVar87,auVar186,1);
  auVar89 = vblendvps_avx(auVar340,auVar186,auVar87);
  auVar87 = vandps_avx(auVar276,auVar213);
  auVar87 = vcmpps_avx(auVar87,auVar186,1);
  auVar87 = vblendvps_avx(auVar213,auVar186,auVar87);
  auVar109._0_4_ = fVar202 * auVar78._0_4_ + fVar229 * auVar79._0_4_ + auVar110._0_4_ * fVar169;
  auVar109._4_4_ = fVar228 * auVar78._4_4_ + fVar183 * auVar79._4_4_ + auVar110._4_4_ * fVar184;
  auVar109._8_4_ = fVar182 * auVar78._8_4_ + fVar206 * auVar79._8_4_ + auVar110._8_4_ * fVar211;
  auVar109._12_4_ = fVar204 * auVar78._12_4_ + fVar230 * auVar79._12_4_ + auVar110._12_4_ * fVar181;
  auVar116 = vrcpps_avx(auVar149);
  fVar169 = auVar116._0_4_;
  auVar170._0_4_ = fVar169 * auVar149._0_4_;
  fVar181 = auVar116._4_4_;
  auVar170._4_4_ = fVar181 * auVar149._4_4_;
  fVar182 = auVar116._8_4_;
  auVar170._8_4_ = fVar182 * auVar149._8_4_;
  fVar183 = auVar116._12_4_;
  auVar170._12_4_ = fVar183 * auVar149._12_4_;
  auVar277._8_4_ = 0x3f800000;
  auVar277._0_8_ = &DAT_3f8000003f800000;
  auVar277._12_4_ = 0x3f800000;
  auVar149 = vsubps_avx(auVar277,auVar170);
  fVar169 = fVar169 + fVar169 * auVar149._0_4_;
  fVar181 = fVar181 + fVar181 * auVar149._4_4_;
  fVar182 = fVar182 + fVar182 * auVar149._8_4_;
  fVar183 = fVar183 + fVar183 * auVar149._12_4_;
  auVar149 = vrcpps_avx(auVar89);
  fVar184 = auVar149._0_4_;
  auVar187._0_4_ = fVar184 * auVar89._0_4_;
  fVar202 = auVar149._4_4_;
  auVar187._4_4_ = fVar202 * auVar89._4_4_;
  fVar204 = auVar149._8_4_;
  auVar187._8_4_ = fVar204 * auVar89._8_4_;
  fVar206 = auVar149._12_4_;
  auVar187._12_4_ = fVar206 * auVar89._12_4_;
  auVar149 = vsubps_avx(auVar277,auVar187);
  fVar184 = fVar184 + fVar184 * auVar149._0_4_;
  fVar202 = fVar202 + fVar202 * auVar149._4_4_;
  fVar204 = fVar204 + fVar204 * auVar149._8_4_;
  fVar206 = fVar206 + fVar206 * auVar149._12_4_;
  auVar149 = vrcpps_avx(auVar87);
  fVar211 = auVar149._0_4_;
  auVar214._0_4_ = fVar211 * auVar87._0_4_;
  fVar228 = auVar149._4_4_;
  auVar214._4_4_ = fVar228 * auVar87._4_4_;
  fVar229 = auVar149._8_4_;
  auVar214._8_4_ = fVar229 * auVar87._8_4_;
  fVar230 = auVar149._12_4_;
  auVar214._12_4_ = fVar230 * auVar87._12_4_;
  auVar149 = vsubps_avx(auVar277,auVar214);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar75 * 7 + 6);
  auVar87 = vpmovsxwd_avx(auVar87);
  fVar211 = fVar211 + fVar211 * auVar149._0_4_;
  fVar228 = fVar228 + fVar228 * auVar149._4_4_;
  fVar229 = fVar229 + fVar229 * auVar149._8_4_;
  fVar230 = fVar230 + fVar230 * auVar149._12_4_;
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,auVar235);
  auVar143._0_4_ = fVar169 * auVar87._0_4_;
  auVar143._4_4_ = fVar181 * auVar87._4_4_;
  auVar143._8_4_ = fVar182 * auVar87._8_4_;
  auVar143._12_4_ = fVar183 * auVar87._12_4_;
  auVar149._8_8_ = 0;
  auVar149._0_8_ = *(ulong *)(prim + uVar75 * 9 + 6);
  auVar87 = vpmovsxwd_avx(auVar149);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,auVar235);
  auVar171._0_4_ = fVar169 * auVar87._0_4_;
  auVar171._4_4_ = fVar181 * auVar87._4_4_;
  auVar171._8_4_ = fVar182 * auVar87._8_4_;
  auVar171._12_4_ = fVar183 * auVar87._12_4_;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + 6);
  auVar149 = vpmovsxwd_avx(auVar89);
  auVar116._8_8_ = 0;
  auVar116._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + uVar75 * -2 + 6);
  auVar87 = vpmovsxwd_avx(auVar116);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,auVar77);
  auVar278._0_4_ = auVar87._0_4_ * fVar184;
  auVar278._4_4_ = auVar87._4_4_ * fVar202;
  auVar278._8_4_ = auVar87._8_4_ * fVar204;
  auVar278._12_4_ = auVar87._12_4_ * fVar206;
  auVar87 = vcvtdq2ps_avx(auVar149);
  auVar87 = vsubps_avx(auVar87,auVar77);
  auVar78._0_4_ = fVar184 * auVar87._0_4_;
  auVar78._4_4_ = fVar202 * auVar87._4_4_;
  auVar78._8_4_ = fVar204 * auVar87._8_4_;
  auVar78._12_4_ = fVar206 * auVar87._12_4_;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar72 + uVar75 + 6);
  auVar87 = vpmovsxwd_avx(auVar82);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,auVar109);
  auVar188._0_4_ = auVar87._0_4_ * fVar211;
  auVar188._4_4_ = auVar87._4_4_ * fVar228;
  auVar188._8_4_ = auVar87._8_4_ * fVar229;
  auVar188._12_4_ = auVar87._12_4_ * fVar230;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar75 * 0x17 + 6);
  auVar87 = vpmovsxwd_avx(auVar88);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,auVar109);
  auVar110._0_4_ = auVar87._0_4_ * fVar211;
  auVar110._4_4_ = auVar87._4_4_ * fVar228;
  auVar110._8_4_ = auVar87._8_4_ * fVar229;
  auVar110._12_4_ = auVar87._12_4_ * fVar230;
  auVar87 = vpminsd_avx(auVar143,auVar171);
  auVar149 = vpminsd_avx(auVar278,auVar78);
  auVar87 = vmaxps_avx(auVar87,auVar149);
  auVar149 = vpminsd_avx(auVar188,auVar110);
  uVar289 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar308._4_4_ = uVar289;
  auVar308._0_4_ = uVar289;
  auVar308._8_4_ = uVar289;
  auVar308._12_4_ = uVar289;
  auVar149 = vmaxps_avx(auVar149,auVar308);
  auVar87 = vmaxps_avx(auVar87,auVar149);
  local_4d0._0_4_ = auVar87._0_4_ * 0.99999964;
  local_4d0._4_4_ = auVar87._4_4_ * 0.99999964;
  local_4d0._8_4_ = auVar87._8_4_ * 0.99999964;
  local_4d0._12_4_ = auVar87._12_4_ * 0.99999964;
  auVar87 = vpmaxsd_avx(auVar143,auVar171);
  auVar149 = vpmaxsd_avx(auVar278,auVar78);
  auVar87 = vminps_avx(auVar87,auVar149);
  auVar149 = vpmaxsd_avx(auVar188,auVar110);
  fVar169 = ray->tfar;
  auVar144._4_4_ = fVar169;
  auVar144._0_4_ = fVar169;
  auVar144._8_4_ = fVar169;
  auVar144._12_4_ = fVar169;
  auVar149 = vminps_avx(auVar149,auVar144);
  auVar87 = vminps_avx(auVar87,auVar149);
  auVar79._0_4_ = auVar87._0_4_ * 1.0000004;
  auVar79._4_4_ = auVar87._4_4_ * 1.0000004;
  auVar79._8_4_ = auVar87._8_4_ * 1.0000004;
  auVar79._12_4_ = auVar87._12_4_ * 1.0000004;
  auVar87 = vpshufd_avx(ZEXT116((byte)PVar5),0);
  auVar149 = vpcmpgtd_avx(auVar87,_DAT_01ff0cf0);
  auVar87 = vcmpps_avx(local_4d0,auVar79,2);
  auVar87 = vandps_avx(auVar87,auVar149);
  uVar74 = vmovmskps_avx(auVar87);
  local_aed = uVar74 != 0;
  if (uVar74 == 0) {
    return local_aed;
  }
  uVar74 = uVar74 & 0xff;
  local_798 = prim + lVar71 + 0x16;
  auVar94._16_16_ = mm_lookupmask_ps._240_16_;
  auVar94._0_16_ = mm_lookupmask_ps._240_16_;
  local_420 = vblendps_avx(auVar94,ZEXT832(0) << 0x20,0x80);
  local_ae8 = context;
  local_790 = prim;
LAB_00eec184:
  local_788 = (ulong)uVar74;
  lVar71 = 0;
  if (local_788 != 0) {
    for (; (uVar74 >> lVar71 & 1) == 0; lVar71 = lVar71 + 1) {
    }
  }
  local_788 = local_788 - 1 & local_788;
  local_aa4 = *(undefined4 *)(local_790 + lVar71 * 4 + 6);
  lVar71 = lVar71 * 0x40;
  lVar8 = 0;
  if (local_788 != 0) {
    for (; (local_788 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
    }
  }
  local_a68 = (ulong)*(uint *)(local_790 + 2);
  auVar87 = *(undefined1 (*) [16])(local_798 + lVar71);
  if (((local_788 != 0) && (uVar75 = local_788 - 1 & local_788, uVar75 != 0)) &&
     (lVar8 = 0, uVar75 != 0)) {
    for (; (uVar75 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
    }
  }
  auVar149 = *(undefined1 (*) [16])(local_798 + lVar71 + 0x10);
  auVar89 = *(undefined1 (*) [16])(local_798 + lVar71 + 0x20);
  auVar116 = *(undefined1 (*) [16])(local_798 + lVar71 + 0x30);
  auVar80._0_4_ = (auVar87._0_4_ + auVar149._0_4_ + auVar89._0_4_ + auVar116._0_4_) * 0.25;
  auVar80._4_4_ = (auVar87._4_4_ + auVar149._4_4_ + auVar89._4_4_ + auVar116._4_4_) * 0.25;
  auVar80._8_4_ = (auVar87._8_4_ + auVar149._8_4_ + auVar89._8_4_ + auVar116._8_4_) * 0.25;
  auVar80._12_4_ = (auVar87._12_4_ + auVar149._12_4_ + auVar89._12_4_ + auVar116._12_4_) * 0.25;
  aVar2 = (ray->org).field_0.field_1;
  aVar3 = (ray->dir).field_0.field_1;
  auVar82 = vsubps_avx(auVar80,(undefined1  [16])aVar2);
  auVar82 = vdpps_avx(auVar82,(undefined1  [16])aVar3,0x7f);
  auVar88 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
  auVar78 = vrcpss_avx(auVar88,auVar88);
  auVar311 = ZEXT464(0x40000000);
  fVar169 = auVar82._0_4_ * auVar78._0_4_ * (2.0 - auVar78._0_4_ * auVar88._0_4_);
  local_7c0 = ZEXT416((uint)fVar169);
  auVar88 = vshufps_avx(local_7c0,ZEXT416((uint)fVar169),0);
  fVar169 = aVar3.x;
  fVar184 = aVar3.y;
  fVar211 = aVar3.z;
  aVar139 = aVar3.field_3;
  auVar236._0_4_ = aVar2.x + fVar169 * auVar88._0_4_;
  auVar236._4_4_ = aVar2.y + fVar184 * auVar88._4_4_;
  auVar236._8_4_ = aVar2.z + fVar211 * auVar88._8_4_;
  auVar236._12_4_ = aVar2.field_3.w + aVar139.w * auVar88._12_4_;
  auVar82 = vblendps_avx(auVar236,_DAT_01feba10,8);
  auVar244 = ZEXT1664(auVar82);
  _local_980 = vsubps_avx(auVar87,auVar82);
  auVar265 = ZEXT1664(_local_980);
  _local_990 = vsubps_avx(auVar89,auVar82);
  _local_9a0 = vsubps_avx(auVar149,auVar82);
  _local_9b0 = vsubps_avx(auVar116,auVar82);
  auVar227 = ZEXT1664(_local_9b0);
  auVar87 = vshufps_avx(_local_980,_local_980,0);
  register0x00001290 = auVar87;
  _local_1a0 = auVar87;
  auVar87 = vshufps_avx(_local_980,_local_980,0x55);
  register0x00001290 = auVar87;
  _local_1c0 = auVar87;
  auVar87 = vshufps_avx(_local_980,_local_980,0xaa);
  register0x00001290 = auVar87;
  _local_1e0 = auVar87;
  auVar87 = vshufps_avx(_local_980,_local_980,0xff);
  register0x00001290 = auVar87;
  _local_200 = auVar87;
  auVar87 = vshufps_avx(_local_9a0,_local_9a0,0);
  register0x00001290 = auVar87;
  _local_220 = auVar87;
  auVar87 = vshufps_avx(_local_9a0,_local_9a0,0x55);
  register0x00001290 = auVar87;
  _local_2e0 = auVar87;
  auVar87 = vshufps_avx(_local_9a0,_local_9a0,0xaa);
  register0x00001290 = auVar87;
  _local_240 = auVar87;
  auVar111._0_4_ = fVar169 * fVar169;
  auVar111._4_4_ = fVar184 * fVar184;
  auVar111._8_4_ = fVar211 * fVar211;
  auVar111._12_4_ = aVar139.w * aVar139.w;
  auVar87 = vshufps_avx(auVar111,auVar111,0xaa);
  auVar149 = vshufps_avx(auVar111,auVar111,0x55);
  auVar89 = vshufps_avx(_local_9a0,_local_9a0,0xff);
  register0x000012d0 = auVar89;
  _local_260 = auVar89;
  auVar89 = vshufps_avx(auVar111,auVar111,0);
  local_280._0_4_ = auVar89._0_4_ + auVar149._0_4_ + auVar87._0_4_;
  local_280._4_4_ = auVar89._4_4_ + auVar149._4_4_ + auVar87._4_4_;
  local_280._8_4_ = auVar89._8_4_ + auVar149._8_4_ + auVar87._8_4_;
  local_280._12_4_ = auVar89._12_4_ + auVar149._12_4_ + auVar87._12_4_;
  local_280._16_4_ = auVar89._0_4_ + auVar149._0_4_ + auVar87._0_4_;
  local_280._20_4_ = auVar89._4_4_ + auVar149._4_4_ + auVar87._4_4_;
  local_280._24_4_ = auVar89._8_4_ + auVar149._8_4_ + auVar87._8_4_;
  local_280._28_4_ = auVar89._12_4_ + auVar149._12_4_ + auVar87._12_4_;
  auVar87 = vshufps_avx(_local_990,_local_990,0);
  register0x00001250 = auVar87;
  _local_300 = auVar87;
  auVar87 = vshufps_avx(_local_990,_local_990,0x55);
  register0x00001250 = auVar87;
  _local_320 = auVar87;
  auVar87 = vshufps_avx(_local_990,_local_990,0xaa);
  register0x00001250 = auVar87;
  _local_340 = auVar87;
  auVar87 = vshufps_avx(_local_990,_local_990,0xff);
  register0x00001250 = auVar87;
  _local_360 = auVar87;
  auVar87 = vshufps_avx(_local_9b0,_local_9b0,0);
  register0x00001250 = auVar87;
  _local_380 = auVar87;
  auVar87 = vshufps_avx(_local_9b0,_local_9b0,0x55);
  register0x00001250 = auVar87;
  _local_3a0 = auVar87;
  auVar87 = vshufps_avx(_local_9b0,_local_9b0,0xaa);
  register0x00001250 = auVar87;
  _local_3c0 = auVar87;
  auVar87 = vshufps_avx(_local_9b0,_local_9b0,0xff);
  local_3e0._16_16_ = auVar87;
  local_3e0._0_16_ = auVar87;
  register0x00001210 = auVar88;
  _local_740 = auVar88;
  local_5e0 = 1;
  uVar75 = 0;
  bVar73 = 0;
  local_400 = (ray->dir).field_0.m128[0];
  fStack_3fc = local_400;
  fStack_3f8 = local_400;
  fStack_3f4 = local_400;
  fStack_3f0 = local_400;
  fStack_3ec = local_400;
  fStack_3e8 = local_400;
  fStack_3e4 = local_400;
  local_700 = (ray->dir).field_0.m128[1];
  local_720 = (ray->dir).field_0.m128[2];
  auVar95._8_4_ = 0x7fffffff;
  auVar95._0_8_ = 0x7fffffff7fffffff;
  auVar95._12_4_ = 0x7fffffff;
  auVar95._16_4_ = 0x7fffffff;
  auVar95._20_4_ = 0x7fffffff;
  auVar95._24_4_ = 0x7fffffff;
  auVar95._28_4_ = 0x7fffffff;
  local_440 = vandps_avx(local_280,auVar95);
  local_7b0 = ZEXT816(0x3f80000000000000);
  fStack_71c = local_720;
  fStack_718 = local_720;
  fStack_714 = local_720;
  fStack_710 = local_720;
  fStack_70c = local_720;
  fStack_708 = local_720;
  fStack_704 = local_720;
  fStack_6fc = local_700;
  fStack_6f8 = local_700;
  fStack_6f4 = local_700;
  fStack_6f0 = local_700;
  fStack_6ec = local_700;
  fStack_6e8 = local_700;
  fStack_6e4 = local_700;
  do {
    auVar87 = vmovshdup_avx(local_7b0);
    fVar204 = auVar87._0_4_ - local_7b0._0_4_;
    auVar87 = vshufps_avx(local_7b0,local_7b0,0);
    local_880._16_16_ = auVar87;
    local_880._0_16_ = auVar87;
    auVar149 = vshufps_avx(ZEXT416((uint)fVar204),ZEXT416((uint)fVar204),0);
    local_820._16_16_ = auVar149;
    local_820._0_16_ = auVar149;
    fVar356 = auVar149._0_4_;
    fVar137 = auVar149._4_4_;
    fVar138 = auVar149._8_4_;
    fVar140 = auVar149._12_4_;
    fVar141 = auVar87._0_4_;
    auVar177._0_4_ = fVar141 + fVar356 * 0.0;
    fVar160 = auVar87._4_4_;
    auVar177._4_4_ = fVar160 + fVar137 * 0.14285715;
    fVar162 = auVar87._8_4_;
    auVar177._8_4_ = fVar162 + fVar138 * 0.2857143;
    fVar164 = auVar87._12_4_;
    auVar177._12_4_ = fVar164 + fVar140 * 0.42857146;
    auVar177._16_4_ = fVar141 + fVar356 * 0.5714286;
    auVar177._20_4_ = fVar160 + fVar137 * 0.71428573;
    auVar177._24_4_ = fVar162 + fVar138 * 0.8571429;
    auVar177._28_4_ = fVar164 + fVar140;
    auVar121._8_4_ = 0x3f800000;
    auVar121._0_8_ = &DAT_3f8000003f800000;
    auVar121._12_4_ = 0x3f800000;
    auVar121._16_4_ = 0x3f800000;
    auVar121._20_4_ = 0x3f800000;
    auVar121._24_4_ = 0x3f800000;
    auVar121._28_4_ = 0x3f800000;
    auVar94 = vsubps_avx(auVar121,auVar177);
    fVar169 = auVar94._0_4_;
    fVar184 = auVar94._4_4_;
    fVar211 = auVar94._8_4_;
    fVar181 = auVar94._12_4_;
    fVar202 = auVar94._16_4_;
    fVar228 = auVar94._20_4_;
    fVar182 = auVar94._24_4_;
    fVar230 = fVar169 * fVar169 * fVar169;
    fVar245 = fVar184 * fVar184 * fVar184;
    fVar247 = fVar211 * fVar211 * fVar211;
    fVar250 = fVar181 * fVar181 * fVar181;
    fVar253 = fVar202 * fVar202 * fVar202;
    fVar256 = fVar228 * fVar228 * fVar228;
    fVar259 = fVar182 * fVar182 * fVar182;
    fVar262 = auVar177._0_4_ * auVar177._0_4_ * auVar177._0_4_;
    fVar266 = auVar177._4_4_ * auVar177._4_4_ * auVar177._4_4_;
    fVar267 = auVar177._8_4_ * auVar177._8_4_ * auVar177._8_4_;
    fVar268 = auVar177._12_4_ * auVar177._12_4_ * auVar177._12_4_;
    fVar269 = auVar177._16_4_ * auVar177._16_4_ * auVar177._16_4_;
    fVar270 = auVar177._20_4_ * auVar177._20_4_ * auVar177._20_4_;
    fVar271 = auVar177._24_4_ * auVar177._24_4_ * auVar177._24_4_;
    fVar229 = auVar177._0_4_ * fVar169;
    fVar183 = auVar177._4_4_ * fVar184;
    fVar206 = auVar177._8_4_ * fVar211;
    fVar231 = auVar177._12_4_ * fVar181;
    fVar232 = auVar177._16_4_ * fVar202;
    fVar233 = auVar177._20_4_ * fVar228;
    fVar234 = auVar177._24_4_ * fVar182;
    fVar319 = auVar318._28_4_ + auVar331._28_4_;
    fVar307 = auVar265._28_4_ + auVar227._28_4_ + fVar319;
    fVar313 = fVar319 + auVar244._28_4_ + auVar325._28_4_ + auVar311._28_4_;
    fVar319 = fVar230 * 0.16666667;
    fVar246 = fVar245 * 0.16666667;
    fVar248 = fVar247 * 0.16666667;
    fVar251 = fVar250 * 0.16666667;
    fVar254 = fVar253 * 0.16666667;
    fVar257 = fVar256 * 0.16666667;
    fVar260 = fVar259 * 0.16666667;
    fVar272 = (fVar262 + fVar230 * 4.0 + fVar169 * fVar229 * 12.0 + auVar177._0_4_ * fVar229 * 6.0)
              * 0.16666667;
    fVar285 = (fVar266 + fVar245 * 4.0 + fVar184 * fVar183 * 12.0 + auVar177._4_4_ * fVar183 * 6.0)
              * 0.16666667;
    fVar290 = (fVar267 + fVar247 * 4.0 + fVar211 * fVar206 * 12.0 + auVar177._8_4_ * fVar206 * 6.0)
              * 0.16666667;
    fVar294 = (fVar268 + fVar250 * 4.0 + fVar181 * fVar231 * 12.0 + auVar177._12_4_ * fVar231 * 6.0)
              * 0.16666667;
    fVar298 = (fVar269 + fVar253 * 4.0 + fVar202 * fVar232 * 12.0 + auVar177._16_4_ * fVar232 * 6.0)
              * 0.16666667;
    fVar301 = (fVar270 + fVar256 * 4.0 + fVar228 * fVar233 * 12.0 + auVar177._20_4_ * fVar233 * 6.0)
              * 0.16666667;
    fVar304 = (fVar271 + fVar259 * 4.0 + fVar182 * fVar234 * 12.0 + auVar177._24_4_ * fVar234 * 6.0)
              * 0.16666667;
    fVar230 = (fVar262 * 4.0 + fVar230 + auVar177._0_4_ * fVar229 * 12.0 + fVar169 * fVar229 * 6.0)
              * 0.16666667;
    fVar245 = (fVar266 * 4.0 + fVar245 + auVar177._4_4_ * fVar183 * 12.0 + fVar184 * fVar183 * 6.0)
              * 0.16666667;
    fVar247 = (fVar267 * 4.0 + fVar247 + auVar177._8_4_ * fVar206 * 12.0 + fVar211 * fVar206 * 6.0)
              * 0.16666667;
    fVar250 = (fVar268 * 4.0 + fVar250 + auVar177._12_4_ * fVar231 * 12.0 + fVar181 * fVar231 * 6.0)
              * 0.16666667;
    fVar253 = (fVar269 * 4.0 + fVar253 + auVar177._16_4_ * fVar232 * 12.0 + fVar202 * fVar232 * 6.0)
              * 0.16666667;
    fVar256 = (fVar270 * 4.0 + fVar256 + auVar177._20_4_ * fVar233 * 12.0 + fVar228 * fVar233 * 6.0)
              * 0.16666667;
    fVar259 = (fVar271 * 4.0 + fVar259 + auVar177._24_4_ * fVar234 * 12.0 + fVar182 * fVar234 * 6.0)
              * 0.16666667;
    fVar262 = fVar262 * 0.16666667;
    fVar266 = fVar266 * 0.16666667;
    fVar267 = fVar267 * 0.16666667;
    fVar268 = fVar268 * 0.16666667;
    fVar269 = fVar269 * 0.16666667;
    fVar270 = fVar270 * 0.16666667;
    fVar271 = fVar271 * 0.16666667;
    fVar326 = auVar325._28_4_ + 12.0;
    fVar314 = fVar313 + 12.166667;
    local_920 = (float)local_1a0._0_4_ * fVar319 +
                fVar272 * (float)local_220._0_4_ +
                fVar262 * (float)local_380._0_4_ + fVar230 * (float)local_300._0_4_;
    fStack_91c = (float)local_1a0._4_4_ * fVar246 +
                 fVar285 * (float)local_220._4_4_ +
                 fVar266 * (float)local_380._4_4_ + fVar245 * (float)local_300._4_4_;
    fStack_918 = fStack_198 * fVar248 +
                 fVar290 * fStack_218 + fVar267 * fStack_378 + fVar247 * fStack_2f8;
    fStack_914 = fStack_194 * fVar251 +
                 fVar294 * fStack_214 + fVar268 * fStack_374 + fVar250 * fStack_2f4;
    fStack_910 = fStack_190 * fVar254 +
                 fVar298 * fStack_210 + fVar269 * fStack_370 + fVar253 * fStack_2f0;
    fStack_90c = fStack_18c * fVar257 +
                 fVar301 * fStack_20c + fVar270 * fStack_36c + fVar256 * fStack_2ec;
    fStack_908 = fStack_188 * fVar260 +
                 fVar304 * fStack_208 + fVar271 * fStack_368 + fVar259 * fStack_2e8;
    fStack_904 = fVar307 + fVar314;
    fVar273 = (float)local_1c0._0_4_ * fVar319 +
              fVar272 * (float)local_2e0._0_4_ +
              fVar262 * (float)local_3a0._0_4_ + fVar230 * (float)local_320._0_4_;
    fVar286 = (float)local_1c0._4_4_ * fVar246 +
              fVar285 * (float)local_2e0._4_4_ +
              fVar266 * (float)local_3a0._4_4_ + fVar245 * (float)local_320._4_4_;
    fVar291 = fStack_1b8 * fVar248 +
              fVar290 * fStack_2d8 + fVar267 * fStack_398 + fVar247 * fStack_318;
    fVar295 = fStack_1b4 * fVar251 +
              fVar294 * fStack_2d4 + fVar268 * fStack_394 + fVar250 * fStack_314;
    fStack_a90 = fStack_1b0 * fVar254 +
                 fVar298 * fStack_2d0 + fVar269 * fStack_390 + fVar253 * fStack_310;
    fStack_a8c = fStack_1ac * fVar257 +
                 fVar301 * fStack_2cc + fVar270 * fStack_38c + fVar256 * fStack_30c;
    fStack_a88 = fStack_1a8 * fVar260 +
                 fVar304 * fStack_2c8 + fVar271 * fStack_388 + fVar259 * fStack_308;
    fStack_a84 = fStack_904 + fVar326 + 12.166667;
    local_a60 = (float)local_1e0._0_4_ * fVar319 +
                (float)local_240._0_4_ * fVar272 +
                fVar262 * (float)local_3c0._0_4_ + fVar230 * (float)local_340._0_4_;
    fStack_a5c = (float)local_1e0._4_4_ * fVar246 +
                 (float)local_240._4_4_ * fVar285 +
                 fVar266 * (float)local_3c0._4_4_ + fVar245 * (float)local_340._4_4_;
    fStack_a58 = fStack_1d8 * fVar248 +
                 fStack_238 * fVar290 + fVar267 * fStack_3b8 + fVar247 * fStack_338;
    fStack_a54 = fStack_1d4 * fVar251 +
                 fStack_234 * fVar294 + fVar268 * fStack_3b4 + fVar250 * fStack_334;
    fStack_a50 = fStack_1d0 * fVar254 +
                 fStack_230 * fVar298 + fVar269 * fStack_3b0 + fVar253 * fStack_330;
    fStack_a4c = fStack_1cc * fVar257 +
                 fStack_22c * fVar301 + fVar270 * fStack_3ac + fVar256 * fStack_32c;
    fStack_a48 = fStack_1c8 * fVar260 +
                 fStack_228 * fVar304 + fVar271 * fStack_3a8 + fVar259 * fStack_328;
    fStack_a44 = fStack_a84 + fVar326 + auVar331._28_4_ + 12.0;
    local_ae0._0_4_ =
         (float)local_200._0_4_ * fVar319 +
         (float)local_260._0_4_ * fVar272 +
         fVar230 * (float)local_360._0_4_ + local_3e0._0_4_ * fVar262;
    local_ae0._4_4_ =
         (float)local_200._4_4_ * fVar246 +
         (float)local_260._4_4_ * fVar285 +
         fVar245 * (float)local_360._4_4_ + local_3e0._4_4_ * fVar266;
    fStack_ad8 = fStack_1f8 * fVar248 +
                 fStack_258 * fVar290 + fVar247 * fStack_358 + local_3e0._8_4_ * fVar267;
    fStack_ad4 = fStack_1f4 * fVar251 +
                 fStack_254 * fVar294 + fVar250 * fStack_354 + local_3e0._12_4_ * fVar268;
    fStack_ad0 = fStack_1f0 * fVar254 +
                 fStack_250 * fVar298 + fVar253 * fStack_350 + local_3e0._16_4_ * fVar269;
    fStack_acc = fStack_1ec * fVar257 +
                 fStack_24c * fVar301 + fVar256 * fStack_34c + local_3e0._20_4_ * fVar270;
    fStack_ac8 = fStack_1e8 * fVar260 +
                 fStack_248 * fVar304 + fVar259 * fStack_348 + local_3e0._24_4_ * fVar271;
    fStack_ac4 = auVar244._28_4_ + fVar307 + fVar313 + auVar265._28_4_;
    auVar9._4_4_ = auVar177._4_4_ * -auVar177._4_4_;
    auVar9._0_4_ = auVar177._0_4_ * -auVar177._0_4_;
    auVar9._8_4_ = auVar177._8_4_ * -auVar177._8_4_;
    auVar9._12_4_ = auVar177._12_4_ * -auVar177._12_4_;
    auVar9._16_4_ = auVar177._16_4_ * -auVar177._16_4_;
    auVar9._20_4_ = auVar177._20_4_ * -auVar177._20_4_;
    auVar9._24_4_ = auVar177._24_4_ * -auVar177._24_4_;
    auVar9._28_4_ = auVar177._28_4_;
    auVar224._4_4_ = fVar183 * 4.0;
    auVar224._0_4_ = fVar229 * 4.0;
    auVar224._8_4_ = fVar206 * 4.0;
    auVar224._12_4_ = fVar231 * 4.0;
    auVar224._16_4_ = fVar232 * 4.0;
    auVar224._20_4_ = fVar233 * 4.0;
    auVar224._24_4_ = fVar234 * 4.0;
    auVar224._28_4_ = auVar227._28_4_;
    auVar94 = vsubps_avx(auVar9,auVar224);
    fVar259 = fVar169 * -fVar169 * 0.5;
    fVar260 = fVar184 * -fVar184 * 0.5;
    fVar262 = fVar211 * -fVar211 * 0.5;
    fVar266 = fVar181 * -fVar181 * 0.5;
    fVar267 = fVar202 * -fVar202 * 0.5;
    fVar268 = fVar228 * -fVar228 * 0.5;
    fVar269 = fVar182 * -fVar182 * 0.5;
    fVar247 = auVar94._0_4_ * 0.5;
    fVar248 = auVar94._4_4_ * 0.5;
    fVar251 = auVar94._8_4_ * 0.5;
    fVar253 = auVar94._12_4_ * 0.5;
    fVar254 = auVar94._16_4_ * 0.5;
    fVar256 = auVar94._20_4_ * 0.5;
    fVar257 = auVar94._24_4_ * 0.5;
    fVar230 = (fVar169 * fVar169 + fVar229 * 4.0) * 0.5;
    fVar319 = (fVar184 * fVar184 + fVar183 * 4.0) * 0.5;
    fVar245 = (fVar211 * fVar211 + fVar206 * 4.0) * 0.5;
    fVar246 = (fVar181 * fVar181 + fVar231 * 4.0) * 0.5;
    fVar250 = (fVar202 * fVar202 + fVar232 * 4.0) * 0.5;
    fVar233 = (fVar228 * fVar228 + fVar233 * 4.0) * 0.5;
    fVar234 = (fVar182 * fVar182 + fVar234 * 4.0) * 0.5;
    fVar169 = auVar177._0_4_ * auVar177._0_4_ * 0.5;
    fVar184 = auVar177._4_4_ * auVar177._4_4_ * 0.5;
    fVar211 = auVar177._8_4_ * auVar177._8_4_ * 0.5;
    fVar181 = auVar177._12_4_ * auVar177._12_4_ * 0.5;
    fVar182 = auVar177._16_4_ * auVar177._16_4_ * 0.5;
    fVar229 = auVar177._20_4_ * auVar177._20_4_ * 0.5;
    fVar183 = auVar177._24_4_ * auVar177._24_4_ * 0.5;
    fVar314 = fStack_a84 + fVar314;
    auVar87 = vpermilps_avx(ZEXT416((uint)(fVar204 * 0.04761905)),0);
    fVar202 = auVar87._0_4_;
    fVar274 = fVar202 * ((float)local_1a0._0_4_ * fVar259 +
                        (float)local_220._0_4_ * fVar247 +
                        fVar230 * (float)local_300._0_4_ + fVar169 * (float)local_380._0_4_);
    fVar206 = auVar87._4_4_;
    fVar287 = fVar206 * ((float)local_1a0._4_4_ * fVar260 +
                        (float)local_220._4_4_ * fVar248 +
                        fVar319 * (float)local_300._4_4_ + fVar184 * (float)local_380._4_4_);
    local_a00._4_4_ = fVar287;
    local_a00._0_4_ = fVar274;
    fVar231 = auVar87._8_4_;
    fVar292 = fVar231 * (fStack_198 * fVar262 +
                        fStack_218 * fVar251 + fVar245 * fStack_2f8 + fVar211 * fStack_378);
    local_a00._8_4_ = fVar292;
    fVar232 = auVar87._12_4_;
    fVar296 = fVar232 * (fStack_194 * fVar266 +
                        fStack_214 * fVar253 + fVar246 * fStack_2f4 + fVar181 * fStack_374);
    local_a00._12_4_ = fVar296;
    fVar299 = fVar202 * (fStack_190 * fVar267 +
                        fStack_210 * fVar254 + fVar250 * fStack_2f0 + fVar182 * fStack_370);
    local_a00._16_4_ = fVar299;
    fVar302 = fVar206 * (fStack_18c * fVar268 +
                        fStack_20c * fVar256 + fVar233 * fStack_2ec + fVar229 * fStack_36c);
    local_a00._20_4_ = fVar302;
    fVar305 = fVar231 * (fStack_188 * fVar269 +
                        fStack_208 * fVar257 + fVar234 * fStack_2e8 + fVar183 * fStack_368);
    local_a00._24_4_ = fVar305;
    local_a00._28_4_ = fVar314;
    fVar327 = fVar202 * ((float)local_1c0._0_4_ * fVar259 +
                        fVar247 * (float)local_2e0._0_4_ +
                        fVar230 * (float)local_320._0_4_ + fVar169 * (float)local_3a0._0_4_);
    fVar332 = fVar206 * ((float)local_1c0._4_4_ * fVar260 +
                        fVar248 * (float)local_2e0._4_4_ +
                        fVar319 * (float)local_320._4_4_ + fVar184 * (float)local_3a0._4_4_);
    auVar13._4_4_ = fVar332;
    auVar13._0_4_ = fVar327;
    fVar333 = fVar231 * (fStack_1b8 * fVar262 +
                        fVar251 * fStack_2d8 + fVar245 * fStack_318 + fVar211 * fStack_398);
    auVar13._8_4_ = fVar333;
    fVar334 = fVar232 * (fStack_1b4 * fVar266 +
                        fVar253 * fStack_2d4 + fVar246 * fStack_314 + fVar181 * fStack_394);
    auVar13._12_4_ = fVar334;
    fVar335 = fVar202 * (fStack_1b0 * fVar267 +
                        fVar254 * fStack_2d0 + fVar250 * fStack_310 + fVar182 * fStack_390);
    auVar13._16_4_ = fVar335;
    fVar336 = fVar206 * (fStack_1ac * fVar268 +
                        fVar256 * fStack_2cc + fVar233 * fStack_30c + fVar229 * fStack_38c);
    auVar13._20_4_ = fVar336;
    fVar337 = fVar231 * (fStack_1a8 * fVar269 +
                        fVar257 * fStack_2c8 + fVar234 * fStack_308 + fVar183 * fStack_388);
    auVar13._24_4_ = fVar337;
    auVar13._28_4_ = fStack_1a4;
    fVar338 = fVar202 * ((float)local_1e0._0_4_ * fVar259 +
                        fVar169 * (float)local_3c0._0_4_ + fVar230 * (float)local_340._0_4_ +
                        (float)local_240._0_4_ * fVar247);
    fVar344 = fVar206 * ((float)local_1e0._4_4_ * fVar260 +
                        fVar184 * (float)local_3c0._4_4_ + fVar319 * (float)local_340._4_4_ +
                        (float)local_240._4_4_ * fVar248);
    auVar14._4_4_ = fVar344;
    auVar14._0_4_ = fVar338;
    fVar346 = fVar231 * (fStack_1d8 * fVar262 +
                        fVar211 * fStack_3b8 + fVar245 * fStack_338 + fStack_238 * fVar251);
    auVar14._8_4_ = fVar346;
    fVar348 = fVar232 * (fStack_1d4 * fVar266 +
                        fVar181 * fStack_3b4 + fVar246 * fStack_334 + fStack_234 * fVar253);
    auVar14._12_4_ = fVar348;
    fVar350 = fVar202 * (fStack_1d0 * fVar267 +
                        fVar182 * fStack_3b0 + fVar250 * fStack_330 + fStack_230 * fVar254);
    auVar14._16_4_ = fVar350;
    fVar352 = fVar206 * (fStack_1cc * fVar268 +
                        fVar229 * fStack_3ac + fVar233 * fStack_32c + fStack_22c * fVar256);
    auVar14._20_4_ = fVar352;
    fVar354 = fVar231 * (fStack_1c8 * fVar269 +
                        fVar183 * fStack_3a8 + fVar234 * fStack_328 + fStack_228 * fVar257);
    auVar14._24_4_ = fVar354;
    auVar14._28_4_ = uStack_1e4;
    fVar228 = fVar202 * ((float)local_200._0_4_ * fVar259 +
                        (float)local_260._0_4_ * fVar247 +
                        fVar169 * local_3e0._0_4_ + fVar230 * (float)local_360._0_4_);
    fVar230 = fVar206 * ((float)local_200._4_4_ * fVar260 +
                        (float)local_260._4_4_ * fVar248 +
                        fVar184 * local_3e0._4_4_ + fVar319 * (float)local_360._4_4_);
    auVar123._4_4_ = fVar230;
    auVar123._0_4_ = fVar228;
    fVar247 = fVar231 * (fStack_1f8 * fVar262 +
                        fStack_258 * fVar251 + fVar211 * local_3e0._8_4_ + fVar245 * fStack_358);
    auVar123._8_4_ = fVar247;
    fVar248 = fVar232 * (fStack_1f4 * fVar266 +
                        fStack_254 * fVar253 + fVar181 * local_3e0._12_4_ + fVar246 * fStack_354);
    auVar123._12_4_ = fVar248;
    fVar202 = fVar202 * (fStack_1f0 * fVar267 +
                        fStack_250 * fVar254 + fVar182 * local_3e0._16_4_ + fVar250 * fStack_350);
    auVar123._16_4_ = fVar202;
    fVar206 = fVar206 * (fStack_1ec * fVar268 +
                        fStack_24c * fVar256 + fVar229 * local_3e0._20_4_ + fVar233 * fStack_34c);
    auVar123._20_4_ = fVar206;
    fVar231 = fVar231 * (fStack_1e8 * fVar269 +
                        fStack_248 * fVar257 + fVar183 * local_3e0._24_4_ + fVar234 * fStack_348);
    auVar123._24_4_ = fVar231;
    auVar123._28_4_ = fVar232;
    auVar65._4_4_ = fVar286;
    auVar65._0_4_ = fVar273;
    auVar65._8_4_ = fVar291;
    auVar65._12_4_ = fVar295;
    auVar65._16_4_ = fStack_a90;
    auVar65._20_4_ = fStack_a8c;
    auVar65._24_4_ = fStack_a88;
    auVar65._28_4_ = fStack_a84;
    auVar94 = vperm2f128_avx(auVar65,auVar65,1);
    auVar94 = vshufps_avx(auVar94,auVar65,0x30);
    local_940 = vshufps_avx(auVar65,auVar94,0x29);
    auVar67._4_4_ = fStack_a5c;
    auVar67._0_4_ = local_a60;
    auVar67._8_4_ = fStack_a58;
    auVar67._12_4_ = fStack_a54;
    auVar67._16_4_ = fStack_a50;
    auVar67._20_4_ = fStack_a4c;
    auVar67._24_4_ = fStack_a48;
    auVar67._28_4_ = fStack_a44;
    auVar94 = vperm2f128_avx(auVar67,auVar67,1);
    auVar94 = vshufps_avx(auVar94,auVar67,0x30);
    _local_8a0 = vshufps_avx(auVar67,auVar94,0x29);
    auVar95 = vsubps_avx(_local_ae0,auVar123);
    auVar94 = vperm2f128_avx(auVar95,auVar95,1);
    auVar94 = vshufps_avx(auVar94,auVar95,0x30);
    local_800 = vshufps_avx(auVar95,auVar94,0x29);
    auVar9 = vsubps_avx(local_940,auVar65);
    _local_540 = vsubps_avx(_local_8a0,auVar67);
    fVar184 = auVar9._0_4_;
    fVar204 = auVar9._4_4_;
    auVar343._4_4_ = fVar344 * fVar204;
    auVar343._0_4_ = fVar338 * fVar184;
    fVar319 = auVar9._8_4_;
    auVar343._8_4_ = fVar346 * fVar319;
    fVar250 = auVar9._12_4_;
    auVar343._12_4_ = fVar348 * fVar250;
    fVar256 = auVar9._16_4_;
    auVar343._16_4_ = fVar350 * fVar256;
    fVar267 = auVar9._20_4_;
    auVar343._20_4_ = fVar352 * fVar267;
    fVar285 = auVar9._24_4_;
    auVar343._24_4_ = fVar354 * fVar285;
    auVar343._28_4_ = auVar95._28_4_;
    fVar211 = local_540._0_4_;
    fVar229 = local_540._4_4_;
    auVar10._4_4_ = fVar332 * fVar229;
    auVar10._0_4_ = fVar327 * fVar211;
    fVar245 = local_540._8_4_;
    auVar10._8_4_ = fVar333 * fVar245;
    fVar233 = local_540._12_4_;
    auVar10._12_4_ = fVar334 * fVar233;
    fVar257 = local_540._16_4_;
    auVar10._16_4_ = fVar335 * fVar257;
    fVar268 = local_540._20_4_;
    auVar10._20_4_ = fVar336 * fVar268;
    fVar290 = local_540._24_4_;
    auVar10._24_4_ = fVar337 * fVar290;
    auVar10._28_4_ = auVar94._28_4_;
    auVar9 = vsubps_avx(auVar10,auVar343);
    auVar68._4_4_ = fStack_91c;
    auVar68._0_4_ = local_920;
    auVar68._8_4_ = fStack_918;
    auVar68._12_4_ = fStack_914;
    auVar68._16_4_ = fStack_910;
    auVar68._20_4_ = fStack_90c;
    auVar68._24_4_ = fStack_908;
    auVar68._28_4_ = fStack_904;
    auVar94 = vperm2f128_avx(auVar68,auVar68,1);
    auVar94 = vshufps_avx(auVar94,auVar68,0x30);
    local_9e0 = vshufps_avx(auVar68,auVar94,0x29);
    auVar95 = vsubps_avx(local_9e0,auVar68);
    auVar281._4_4_ = fVar287 * fVar229;
    auVar281._0_4_ = fVar274 * fVar211;
    auVar281._8_4_ = fVar292 * fVar245;
    auVar281._12_4_ = fVar296 * fVar233;
    auVar281._16_4_ = fVar299 * fVar257;
    auVar281._20_4_ = fVar302 * fVar268;
    auVar281._24_4_ = fVar305 * fVar290;
    auVar281._28_4_ = auVar94._28_4_;
    fVar181 = auVar95._0_4_;
    fVar183 = auVar95._4_4_;
    auVar11._4_4_ = fVar344 * fVar183;
    auVar11._0_4_ = fVar338 * fVar181;
    fVar246 = auVar95._8_4_;
    auVar11._8_4_ = fVar346 * fVar246;
    fVar234 = auVar95._12_4_;
    auVar11._12_4_ = fVar348 * fVar234;
    fVar259 = auVar95._16_4_;
    auVar11._16_4_ = fVar350 * fVar259;
    fVar269 = auVar95._20_4_;
    auVar11._20_4_ = fVar352 * fVar269;
    fVar294 = auVar95._24_4_;
    auVar11._24_4_ = fVar354 * fVar294;
    auVar11._28_4_ = local_8a0._28_4_;
    auVar224 = vsubps_avx(auVar11,auVar281);
    auVar12._4_4_ = fVar332 * fVar183;
    auVar12._0_4_ = fVar327 * fVar181;
    auVar12._8_4_ = fVar333 * fVar246;
    auVar12._12_4_ = fVar334 * fVar234;
    auVar12._16_4_ = fVar335 * fVar259;
    auVar12._20_4_ = fVar336 * fVar269;
    auVar12._24_4_ = fVar337 * fVar294;
    auVar12._28_4_ = local_8a0._28_4_;
    auVar264._4_4_ = fVar287 * fVar204;
    auVar264._0_4_ = fVar274 * fVar184;
    auVar264._8_4_ = fVar292 * fVar319;
    auVar264._12_4_ = fVar296 * fVar250;
    auVar264._16_4_ = fVar299 * fVar256;
    auVar264._20_4_ = fVar302 * fVar267;
    auVar264._24_4_ = fVar305 * fVar285;
    auVar264._28_4_ = uStack_1c4;
    auVar123 = vsubps_avx(auVar264,auVar12);
    fVar169 = auVar123._28_4_;
    auVar122._0_4_ = fVar181 * fVar181 + fVar184 * fVar184 + fVar211 * fVar211;
    auVar122._4_4_ = fVar183 * fVar183 + fVar204 * fVar204 + fVar229 * fVar229;
    auVar122._8_4_ = fVar246 * fVar246 + fVar319 * fVar319 + fVar245 * fVar245;
    auVar122._12_4_ = fVar234 * fVar234 + fVar250 * fVar250 + fVar233 * fVar233;
    auVar122._16_4_ = fVar259 * fVar259 + fVar256 * fVar256 + fVar257 * fVar257;
    auVar122._20_4_ = fVar269 * fVar269 + fVar267 * fVar267 + fVar268 * fVar268;
    auVar122._24_4_ = fVar294 * fVar294 + fVar285 * fVar285 + fVar290 * fVar290;
    auVar122._28_4_ = fVar169 + fVar169 + auVar9._28_4_;
    auVar94 = vrcpps_avx(auVar122);
    fVar251 = auVar94._0_4_;
    fVar253 = auVar94._4_4_;
    auVar15._4_4_ = fVar253 * auVar122._4_4_;
    auVar15._0_4_ = fVar251 * auVar122._0_4_;
    fVar254 = auVar94._8_4_;
    auVar15._8_4_ = fVar254 * auVar122._8_4_;
    fVar260 = auVar94._12_4_;
    auVar15._12_4_ = fVar260 * auVar122._12_4_;
    fVar262 = auVar94._16_4_;
    auVar15._16_4_ = fVar262 * auVar122._16_4_;
    fVar266 = auVar94._20_4_;
    auVar15._20_4_ = fVar266 * auVar122._20_4_;
    fVar270 = auVar94._24_4_;
    auVar15._24_4_ = fVar270 * auVar122._24_4_;
    auVar15._28_4_ = uStack_1c4;
    auVar359._8_4_ = 0x3f800000;
    auVar359._0_8_ = &DAT_3f8000003f800000;
    auVar359._12_4_ = 0x3f800000;
    auVar359._16_4_ = 0x3f800000;
    auVar359._20_4_ = 0x3f800000;
    auVar359._24_4_ = 0x3f800000;
    auVar359._28_4_ = 0x3f800000;
    auVar343 = vsubps_avx(auVar359,auVar15);
    fVar251 = auVar343._0_4_ * fVar251 + fVar251;
    fVar253 = auVar343._4_4_ * fVar253 + fVar253;
    fVar254 = auVar343._8_4_ * fVar254 + fVar254;
    fVar260 = auVar343._12_4_ * fVar260 + fVar260;
    fVar262 = auVar343._16_4_ * fVar262 + fVar262;
    fVar266 = auVar343._20_4_ * fVar266 + fVar266;
    fVar270 = auVar343._24_4_ * fVar270 + fVar270;
    auVar95 = vperm2f128_avx(auVar13,auVar13,1);
    auVar95 = vshufps_avx(auVar95,auVar13,0x30);
    local_860 = vshufps_avx(auVar13,auVar95,0x29);
    auVar95 = vperm2f128_avx(auVar14,auVar14,1);
    auVar95 = vshufps_avx(auVar95,auVar14,0x30);
    local_900 = vshufps_avx(auVar14,auVar95,0x29);
    fVar339 = local_900._0_4_;
    fVar345 = local_900._4_4_;
    auVar16._4_4_ = fVar345 * fVar204;
    auVar16._0_4_ = fVar339 * fVar184;
    fVar347 = local_900._8_4_;
    auVar16._8_4_ = fVar347 * fVar319;
    fVar349 = local_900._12_4_;
    auVar16._12_4_ = fVar349 * fVar250;
    fVar351 = local_900._16_4_;
    auVar16._16_4_ = fVar351 * fVar256;
    fVar353 = local_900._20_4_;
    auVar16._20_4_ = fVar353 * fVar267;
    fVar355 = local_900._24_4_;
    auVar16._24_4_ = fVar355 * fVar285;
    auVar16._28_4_ = auVar95._28_4_;
    fVar357 = local_860._0_4_;
    fVar364 = local_860._4_4_;
    auVar17._4_4_ = fVar364 * fVar229;
    auVar17._0_4_ = fVar357 * fVar211;
    fVar366 = local_860._8_4_;
    auVar17._8_4_ = fVar366 * fVar245;
    fVar367 = local_860._12_4_;
    auVar17._12_4_ = fVar367 * fVar233;
    fVar368 = local_860._16_4_;
    auVar17._16_4_ = fVar368 * fVar257;
    fVar369 = local_860._20_4_;
    auVar17._20_4_ = fVar369 * fVar268;
    fVar370 = local_860._24_4_;
    auVar17._24_4_ = fVar370 * fVar290;
    auVar17._28_4_ = fStack_1a4;
    auVar10 = vsubps_avx(auVar17,auVar16);
    auVar95 = vperm2f128_avx(local_a00,local_a00,1);
    auVar95 = vshufps_avx(auVar95,local_a00,0x30);
    local_660 = vshufps_avx(local_a00,auVar95,0x29);
    fVar275 = local_660._0_4_;
    fVar288 = local_660._4_4_;
    auVar18._4_4_ = fVar288 * fVar229;
    auVar18._0_4_ = fVar275 * fVar211;
    fVar293 = local_660._8_4_;
    auVar18._8_4_ = fVar293 * fVar245;
    fVar297 = local_660._12_4_;
    auVar18._12_4_ = fVar297 * fVar233;
    fVar300 = local_660._16_4_;
    auVar18._16_4_ = fVar300 * fVar257;
    fVar303 = local_660._20_4_;
    auVar18._20_4_ = fVar303 * fVar268;
    fVar306 = local_660._24_4_;
    auVar18._24_4_ = fVar306 * fVar290;
    auVar18._28_4_ = auVar95._28_4_;
    auVar19._4_4_ = fVar345 * fVar183;
    auVar19._0_4_ = fVar339 * fVar181;
    auVar19._8_4_ = fVar347 * fVar246;
    auVar19._12_4_ = fVar349 * fVar234;
    auVar19._16_4_ = fVar351 * fVar259;
    auVar19._20_4_ = fVar353 * fVar269;
    uVar74 = local_900._28_4_;
    auVar19._24_4_ = fVar355 * fVar294;
    auVar19._28_4_ = uVar74;
    auVar95 = vsubps_avx(auVar19,auVar18);
    auVar20._4_4_ = fVar364 * fVar183;
    auVar20._0_4_ = fVar357 * fVar181;
    auVar20._8_4_ = fVar366 * fVar246;
    auVar20._12_4_ = fVar367 * fVar234;
    auVar20._16_4_ = fVar368 * fVar259;
    auVar20._20_4_ = fVar369 * fVar269;
    auVar20._24_4_ = fVar370 * fVar294;
    auVar20._28_4_ = uVar74;
    auVar21._4_4_ = fVar288 * fVar204;
    auVar21._0_4_ = fVar275 * fVar184;
    auVar21._8_4_ = fVar293 * fVar319;
    auVar21._12_4_ = fVar297 * fVar250;
    auVar21._16_4_ = fVar300 * fVar256;
    auVar21._20_4_ = fVar303 * fVar267;
    auVar21._24_4_ = fVar306 * fVar285;
    auVar21._28_4_ = local_860._28_4_;
    auVar281 = vsubps_avx(auVar21,auVar20);
    fVar182 = auVar281._28_4_;
    fVar272 = auVar95._28_4_ + fVar182;
    auVar22._4_4_ =
         (auVar9._4_4_ * auVar9._4_4_ +
         auVar224._4_4_ * auVar224._4_4_ + auVar123._4_4_ * auVar123._4_4_) * fVar253;
    auVar22._0_4_ =
         (auVar9._0_4_ * auVar9._0_4_ +
         auVar224._0_4_ * auVar224._0_4_ + auVar123._0_4_ * auVar123._0_4_) * fVar251;
    auVar22._8_4_ =
         (auVar9._8_4_ * auVar9._8_4_ +
         auVar224._8_4_ * auVar224._8_4_ + auVar123._8_4_ * auVar123._8_4_) * fVar254;
    auVar22._12_4_ =
         (auVar9._12_4_ * auVar9._12_4_ +
         auVar224._12_4_ * auVar224._12_4_ + auVar123._12_4_ * auVar123._12_4_) * fVar260;
    auVar22._16_4_ =
         (auVar9._16_4_ * auVar9._16_4_ +
         auVar224._16_4_ * auVar224._16_4_ + auVar123._16_4_ * auVar123._16_4_) * fVar262;
    auVar22._20_4_ =
         (auVar9._20_4_ * auVar9._20_4_ +
         auVar224._20_4_ * auVar224._20_4_ + auVar123._20_4_ * auVar123._20_4_) * fVar266;
    auVar22._24_4_ =
         (auVar9._24_4_ * auVar9._24_4_ +
         auVar224._24_4_ * auVar224._24_4_ + auVar123._24_4_ * auVar123._24_4_) * fVar270;
    auVar22._28_4_ = auVar9._28_4_ + auVar224._28_4_ + fVar169;
    auVar23._4_4_ =
         (auVar10._4_4_ * auVar10._4_4_ +
         auVar95._4_4_ * auVar95._4_4_ + auVar281._4_4_ * auVar281._4_4_) * fVar253;
    auVar23._0_4_ =
         (auVar10._0_4_ * auVar10._0_4_ +
         auVar95._0_4_ * auVar95._0_4_ + auVar281._0_4_ * auVar281._0_4_) * fVar251;
    auVar23._8_4_ =
         (auVar10._8_4_ * auVar10._8_4_ +
         auVar95._8_4_ * auVar95._8_4_ + auVar281._8_4_ * auVar281._8_4_) * fVar254;
    auVar23._12_4_ =
         (auVar10._12_4_ * auVar10._12_4_ +
         auVar95._12_4_ * auVar95._12_4_ + auVar281._12_4_ * auVar281._12_4_) * fVar260;
    auVar23._16_4_ =
         (auVar10._16_4_ * auVar10._16_4_ +
         auVar95._16_4_ * auVar95._16_4_ + auVar281._16_4_ * auVar281._16_4_) * fVar262;
    auVar23._20_4_ =
         (auVar10._20_4_ * auVar10._20_4_ +
         auVar95._20_4_ * auVar95._20_4_ + auVar281._20_4_ * auVar281._20_4_) * fVar266;
    auVar23._24_4_ =
         (auVar10._24_4_ * auVar10._24_4_ +
         auVar95._24_4_ * auVar95._24_4_ + auVar281._24_4_ * auVar281._24_4_) * fVar270;
    auVar23._28_4_ = auVar343._28_4_ + auVar94._28_4_;
    auVar94 = vmaxps_avx(auVar22,auVar23);
    auVar95 = vperm2f128_avx(_local_ae0,_local_ae0,1);
    auVar95 = vshufps_avx(auVar95,_local_ae0,0x30);
    local_680 = vshufps_avx(_local_ae0,auVar95,0x29);
    local_6a0._0_4_ = (float)local_ae0._0_4_ + fVar228;
    local_6a0._4_4_ = (float)local_ae0._4_4_ + fVar230;
    local_6a0._8_4_ = fStack_ad8 + fVar247;
    local_6a0._12_4_ = fStack_ad4 + fVar248;
    local_6a0._16_4_ = fStack_ad0 + fVar202;
    local_6a0._20_4_ = fStack_acc + fVar206;
    local_6a0._24_4_ = fStack_ac8 + fVar231;
    local_6a0._28_4_ = fStack_ac4 + fVar232;
    auVar95 = vmaxps_avx(_local_ae0,local_6a0);
    auVar9 = vmaxps_avx(local_800,local_680);
    auVar95 = vmaxps_avx(auVar95,auVar9);
    auVar9 = vrsqrtps_avx(auVar122);
    fVar169 = auVar9._0_4_;
    fVar202 = auVar9._4_4_;
    fVar228 = auVar9._8_4_;
    fVar206 = auVar9._12_4_;
    fVar230 = auVar9._16_4_;
    fVar231 = auVar9._20_4_;
    fVar247 = auVar9._24_4_;
    auVar24._4_4_ = fVar202 * fVar202 * fVar202 * auVar122._4_4_ * 0.5;
    auVar24._0_4_ = fVar169 * fVar169 * fVar169 * auVar122._0_4_ * 0.5;
    auVar24._8_4_ = fVar228 * fVar228 * fVar228 * auVar122._8_4_ * 0.5;
    auVar24._12_4_ = fVar206 * fVar206 * fVar206 * auVar122._12_4_ * 0.5;
    auVar24._16_4_ = fVar230 * fVar230 * fVar230 * auVar122._16_4_ * 0.5;
    auVar24._20_4_ = fVar231 * fVar231 * fVar231 * auVar122._20_4_ * 0.5;
    auVar24._24_4_ = fVar247 * fVar247 * fVar247 * auVar122._24_4_ * 0.5;
    auVar24._28_4_ = auVar122._28_4_;
    auVar25._4_4_ = fVar202 * 1.5;
    auVar25._0_4_ = fVar169 * 1.5;
    auVar25._8_4_ = fVar228 * 1.5;
    auVar25._12_4_ = fVar206 * 1.5;
    auVar25._16_4_ = fVar230 * 1.5;
    auVar25._20_4_ = fVar231 * 1.5;
    auVar25._24_4_ = fVar247 * 1.5;
    auVar25._28_4_ = auVar9._28_4_;
    auVar9 = vsubps_avx(auVar25,auVar24);
    auVar325 = ZEXT3264(auVar9);
    auVar66._4_4_ = fVar286;
    auVar66._0_4_ = fVar273;
    auVar66._8_4_ = fVar291;
    auVar66._12_4_ = fVar295;
    auVar66._16_4_ = fStack_a90;
    auVar66._20_4_ = fStack_a8c;
    auVar66._24_4_ = fStack_a88;
    auVar66._28_4_ = fStack_a84;
    auVar224 = vsubps_avx(ZEXT832(0) << 0x20,auVar66);
    auVar123 = vsubps_avx(ZEXT832(0) << 0x20,auVar67);
    fVar202 = auVar123._0_4_;
    fVar206 = auVar123._4_4_;
    fVar247 = auVar123._8_4_;
    fVar251 = auVar123._12_4_;
    fVar260 = auVar123._16_4_;
    fVar270 = auVar123._20_4_;
    fVar298 = auVar123._24_4_;
    fVar228 = auVar224._0_4_;
    fVar230 = auVar224._4_4_;
    fVar232 = auVar224._8_4_;
    fVar253 = auVar224._12_4_;
    fVar262 = auVar224._16_4_;
    fVar271 = auVar224._20_4_;
    fVar301 = auVar224._24_4_;
    auVar281 = ZEXT832(0) << 0x20;
    auVar343 = vsubps_avx(auVar281,auVar68);
    fVar371 = auVar343._0_4_;
    fVar373 = auVar343._4_4_;
    fVar374 = auVar343._8_4_;
    fVar375 = auVar343._12_4_;
    fVar376 = auVar343._16_4_;
    fVar377 = auVar343._20_4_;
    fVar378 = auVar343._24_4_;
    auVar316._0_4_ = fVar371 * local_400 + local_700 * fVar228 + local_720 * fVar202;
    auVar316._4_4_ = fVar373 * fStack_3fc + fStack_6fc * fVar230 + fStack_71c * fVar206;
    auVar316._8_4_ = fVar374 * fStack_3f8 + fStack_6f8 * fVar232 + fStack_718 * fVar247;
    auVar316._12_4_ = fVar375 * fStack_3f4 + fStack_6f4 * fVar253 + fStack_714 * fVar251;
    auVar316._16_4_ = fVar376 * fStack_3f0 + fStack_6f0 * fVar262 + fStack_710 * fVar260;
    auVar316._20_4_ = fVar377 * fStack_3ec + fStack_6ec * fVar271 + fStack_70c * fVar270;
    auVar316._24_4_ = fVar378 * fStack_3e8 + fStack_6e8 * fVar301 + fStack_708 * fVar298;
    auVar316._28_4_ = fVar272 + fVar272 + auVar10._28_4_ + fVar272;
    auVar329._0_4_ = fVar371 * fVar371 + fVar228 * fVar228 + fVar202 * fVar202;
    auVar329._4_4_ = fVar373 * fVar373 + fVar230 * fVar230 + fVar206 * fVar206;
    auVar329._8_4_ = fVar374 * fVar374 + fVar232 * fVar232 + fVar247 * fVar247;
    auVar329._12_4_ = fVar375 * fVar375 + fVar253 * fVar253 + fVar251 * fVar251;
    auVar329._16_4_ = fVar376 * fVar376 + fVar262 * fVar262 + fVar260 * fVar260;
    auVar329._20_4_ = fVar377 * fVar377 + fVar271 * fVar271 + fVar270 * fVar270;
    auVar329._24_4_ = fVar378 * fVar378 + fVar301 * fVar301 + fVar298 * fVar298;
    auVar329._28_4_ = fVar182 + fVar182 + fVar272;
    fVar182 = auVar9._0_4_;
    fVar231 = auVar9._4_4_;
    fVar248 = auVar9._8_4_;
    fVar254 = auVar9._12_4_;
    fVar266 = auVar9._16_4_;
    fVar272 = auVar9._20_4_;
    fVar304 = auVar9._24_4_;
    fVar169 = local_540._28_4_;
    fVar142 = local_400 * fVar182 * fVar181 +
              fVar184 * fVar182 * local_700 + fVar182 * fVar211 * local_720;
    fVar161 = fStack_3fc * fVar231 * fVar183 +
              fVar204 * fVar231 * fStack_6fc + fVar231 * fVar229 * fStack_71c;
    fVar163 = fStack_3f8 * fVar248 * fVar246 +
              fVar319 * fVar248 * fStack_6f8 + fVar248 * fVar245 * fStack_718;
    fVar165 = fStack_3f4 * fVar254 * fVar234 +
              fVar250 * fVar254 * fStack_6f4 + fVar254 * fVar233 * fStack_714;
    fVar166 = fStack_3f0 * fVar266 * fVar259 +
              fVar256 * fVar266 * fStack_6f0 + fVar266 * fVar257 * fStack_710;
    fVar167 = fStack_3ec * fVar272 * fVar269 +
              fVar267 * fVar272 * fStack_6ec + fVar272 * fVar268 * fStack_70c;
    fVar168 = fStack_3e8 * fVar304 * fVar294 +
              fVar285 * fVar304 * fStack_6e8 + fVar304 * fVar290 * fStack_708;
    fVar307 = fStack_3e4 + fVar169 + fStack_704;
    local_a20._0_4_ =
         fVar371 * fVar182 * fVar181 + fVar184 * fVar182 * fVar228 + fVar182 * fVar211 * fVar202;
    local_a20._4_4_ =
         fVar373 * fVar231 * fVar183 + fVar204 * fVar231 * fVar230 + fVar231 * fVar229 * fVar206;
    fStack_a18 = fVar374 * fVar248 * fVar246 +
                 fVar319 * fVar248 * fVar232 + fVar248 * fVar245 * fVar247;
    fStack_a14 = fVar375 * fVar254 * fVar234 +
                 fVar250 * fVar254 * fVar253 + fVar254 * fVar233 * fVar251;
    fStack_a10 = fVar376 * fVar266 * fVar259 +
                 fVar256 * fVar266 * fVar262 + fVar266 * fVar257 * fVar260;
    fStack_a0c = fVar377 * fVar272 * fVar269 +
                 fVar267 * fVar272 * fVar271 + fVar272 * fVar268 * fVar270;
    fStack_a08 = fVar378 * fVar304 * fVar294 +
                 fVar285 * fVar304 * fVar301 + fVar304 * fVar290 * fVar298;
    fStack_a04 = fVar169 + fVar307;
    auVar26._4_4_ = (float)local_a20._4_4_ * fVar161;
    auVar26._0_4_ = (float)local_a20._0_4_ * fVar142;
    auVar26._8_4_ = fStack_a18 * fVar163;
    auVar26._12_4_ = fStack_a14 * fVar165;
    auVar26._16_4_ = fStack_a10 * fVar166;
    auVar26._20_4_ = fStack_a0c * fVar167;
    auVar26._24_4_ = fStack_a08 * fVar168;
    auVar26._28_4_ = fVar307;
    auVar343 = vsubps_avx(auVar316,auVar26);
    auVar27._4_4_ = (float)local_a20._4_4_ * (float)local_a20._4_4_;
    auVar27._0_4_ = (float)local_a20._0_4_ * (float)local_a20._0_4_;
    auVar27._8_4_ = fStack_a18 * fStack_a18;
    auVar27._12_4_ = fStack_a14 * fStack_a14;
    auVar27._16_4_ = fStack_a10 * fStack_a10;
    auVar27._20_4_ = fStack_a0c * fStack_a0c;
    auVar27._24_4_ = fStack_a08 * fStack_a08;
    auVar27._28_4_ = fVar169;
    _local_6c0 = vsubps_avx(auVar329,auVar27);
    auVar9 = vsqrtps_avx(auVar94);
    fVar169 = (auVar9._0_4_ + auVar95._0_4_) * 1.0000002;
    fVar307 = (auVar9._4_4_ + auVar95._4_4_) * 1.0000002;
    fVar313 = (auVar9._8_4_ + auVar95._8_4_) * 1.0000002;
    fVar326 = (auVar9._12_4_ + auVar95._12_4_) * 1.0000002;
    fVar105 = (auVar9._16_4_ + auVar95._16_4_) * 1.0000002;
    fVar106 = (auVar9._20_4_ + auVar95._20_4_) * 1.0000002;
    fVar107 = (auVar9._24_4_ + auVar95._24_4_) * 1.0000002;
    auVar28._4_4_ = fVar307 * fVar307;
    auVar28._0_4_ = fVar169 * fVar169;
    auVar28._8_4_ = fVar313 * fVar313;
    auVar28._12_4_ = fVar326 * fVar326;
    auVar28._16_4_ = fVar105 * fVar105;
    auVar28._20_4_ = fVar106 * fVar106;
    auVar28._24_4_ = fVar107 * fVar107;
    auVar28._28_4_ = auVar9._28_4_ + auVar95._28_4_;
    fVar358 = auVar343._0_4_ + auVar343._0_4_;
    fVar365 = auVar343._4_4_ + auVar343._4_4_;
    auVar360._0_8_ = CONCAT44(fVar365,fVar358);
    auVar360._8_4_ = auVar343._8_4_ + auVar343._8_4_;
    auVar360._12_4_ = auVar343._12_4_ + auVar343._12_4_;
    auVar360._16_4_ = auVar343._16_4_ + auVar343._16_4_;
    auVar360._20_4_ = auVar343._20_4_ + auVar343._20_4_;
    auVar360._24_4_ = auVar343._24_4_ + auVar343._24_4_;
    auVar360._28_4_ = auVar343._28_4_ + auVar343._28_4_;
    auVar95 = vsubps_avx(_local_6c0,auVar28);
    auVar29._4_4_ = fVar161 * fVar161;
    auVar29._0_4_ = fVar142 * fVar142;
    auVar29._8_4_ = fVar163 * fVar163;
    auVar29._12_4_ = fVar165 * fVar165;
    auVar29._16_4_ = fVar166 * fVar166;
    auVar29._20_4_ = fVar167 * fVar167;
    auVar29._24_4_ = fVar168 * fVar168;
    auVar29._28_4_ = auVar316._28_4_;
    auVar244 = ZEXT3264(local_280);
    auVar343 = vsubps_avx(local_280,auVar29);
    auVar311 = ZEXT3264(auVar343);
    local_6e0._4_4_ = fVar365 * fVar365;
    local_6e0._0_4_ = fVar358 * fVar358;
    local_6e0._8_4_ = auVar360._8_4_ * auVar360._8_4_;
    local_6e0._12_4_ = auVar360._12_4_ * auVar360._12_4_;
    local_6e0._16_4_ = auVar360._16_4_ * auVar360._16_4_;
    local_6e0._20_4_ = auVar360._20_4_ * auVar360._20_4_;
    local_6e0._24_4_ = auVar360._24_4_ * auVar360._24_4_;
    local_6e0._28_4_ = 0x3f800002;
    fVar307 = auVar343._0_4_;
    fVar313 = auVar343._4_4_;
    fVar326 = auVar343._8_4_;
    fStack_5d8 = fVar326 * 4.0;
    fVar105 = auVar343._12_4_;
    fStack_5d4 = fVar105 * 4.0;
    fVar106 = auVar343._16_4_;
    fStack_5d0 = fVar106 * 4.0;
    fVar107 = auVar343._20_4_;
    fStack_5cc = fVar107 * 4.0;
    fVar312 = auVar343._24_4_;
    fStack_5c8 = fVar312 * 4.0;
    uStack_5c4 = 0x40800000;
    auVar30._4_4_ = fVar313 * 4.0 * auVar95._4_4_;
    auVar30._0_4_ = fVar307 * 4.0 * auVar95._0_4_;
    auVar30._8_4_ = fStack_5d8 * auVar95._8_4_;
    auVar30._12_4_ = fStack_5d4 * auVar95._12_4_;
    auVar30._16_4_ = fStack_5d0 * auVar95._16_4_;
    auVar30._20_4_ = fStack_5cc * auVar95._20_4_;
    auVar30._24_4_ = fStack_5c8 * auVar95._24_4_;
    auVar30._28_4_ = 0x40800000;
    auVar10 = vsubps_avx(local_6e0,auVar30);
    auVar94 = vcmpps_avx(auVar10,auVar281,5);
    fVar169 = auVar343._28_4_;
    if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar94 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar94 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar94 >> 0x7f,0) == '\0') &&
          (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar94 >> 0xbf,0) == '\0') &&
        (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar94[0x1f]) {
      auVar197._8_4_ = 0x7f800000;
      auVar197._0_8_ = 0x7f8000007f800000;
      auVar197._12_4_ = 0x7f800000;
      auVar197._16_4_ = 0x7f800000;
      auVar197._20_4_ = 0x7f800000;
      auVar197._24_4_ = 0x7f800000;
      auVar197._28_4_ = 0x7f800000;
      auVar331 = ZEXT3264(CONCAT428(0xff800000,
                                    CONCAT424(0xff800000,
                                              CONCAT420(0xff800000,
                                                        CONCAT416(0xff800000,
                                                                  CONCAT412(0xff800000,
                                                                            CONCAT48(0xff800000,
                                                                                                                                                                          
                                                  0xff800000ff800000)))))));
      auVar176._4_4_ = fStack_6fc;
      auVar176._0_4_ = local_700;
      auVar176._8_4_ = fStack_6f8;
      auVar176._12_4_ = fStack_6f4;
      auVar176._16_4_ = fStack_6f0;
      auVar176._20_4_ = fStack_6ec;
      auVar176._24_4_ = fStack_6e8;
      auVar318 = ZEXT3264(CONCAT428(fStack_704,
                                    CONCAT424(fStack_708,
                                              CONCAT420(fStack_70c,
                                                        CONCAT416(fStack_710,
                                                                  CONCAT412(fStack_714,
                                                                            CONCAT48(fStack_718,
                                                                                     CONCAT44(
                                                  fStack_71c,local_720))))))));
    }
    else {
      auVar12 = vsqrtps_avx(auVar10);
      auVar237._0_4_ = fVar307 + fVar307;
      auVar237._4_4_ = fVar313 + fVar313;
      auVar237._8_4_ = fVar326 + fVar326;
      auVar237._12_4_ = fVar105 + fVar105;
      auVar237._16_4_ = fVar106 + fVar106;
      auVar237._20_4_ = fVar107 + fVar107;
      auVar237._24_4_ = fVar312 + fVar312;
      auVar237._28_4_ = fVar169 + fVar169;
      auVar11 = vrcpps_avx(auVar237);
      auVar281 = vcmpps_avx(auVar10,auVar281,5);
      fVar185 = auVar11._0_4_;
      fVar203 = auVar11._4_4_;
      auVar31._4_4_ = auVar237._4_4_ * fVar203;
      auVar31._0_4_ = auVar237._0_4_ * fVar185;
      fVar205 = auVar11._8_4_;
      auVar31._8_4_ = auVar237._8_4_ * fVar205;
      fVar207 = auVar11._12_4_;
      auVar31._12_4_ = auVar237._12_4_ * fVar207;
      fVar208 = auVar11._16_4_;
      auVar31._16_4_ = auVar237._16_4_ * fVar208;
      fVar209 = auVar11._20_4_;
      auVar31._20_4_ = auVar237._20_4_ * fVar209;
      fVar210 = auVar11._24_4_;
      auVar31._24_4_ = auVar237._24_4_ * fVar210;
      auVar31._28_4_ = auVar10._28_4_;
      auVar154._8_4_ = 0x3f800000;
      auVar154._0_8_ = &DAT_3f8000003f800000;
      auVar154._12_4_ = 0x3f800000;
      auVar154._16_4_ = 0x3f800000;
      auVar154._20_4_ = 0x3f800000;
      auVar154._24_4_ = 0x3f800000;
      auVar154._28_4_ = 0x3f800000;
      auVar10 = vsubps_avx(auVar154,auVar31);
      fVar185 = fVar185 + fVar185 * auVar10._0_4_;
      fVar203 = fVar203 + fVar203 * auVar10._4_4_;
      fVar205 = fVar205 + fVar205 * auVar10._8_4_;
      fVar207 = fVar207 + fVar207 * auVar10._12_4_;
      fVar208 = fVar208 + fVar208 * auVar10._16_4_;
      fVar209 = fVar209 + fVar209 * auVar10._20_4_;
      fVar210 = fVar210 + fVar210 * auVar10._24_4_;
      auVar238._0_8_ = CONCAT44(fVar365,fVar358) ^ 0x8000000080000000;
      auVar238._8_4_ = -auVar360._8_4_;
      auVar238._12_4_ = -auVar360._12_4_;
      auVar238._16_4_ = -auVar360._16_4_;
      auVar238._20_4_ = -auVar360._20_4_;
      auVar238._24_4_ = -auVar360._24_4_;
      auVar238._28_4_ = -auVar360._28_4_;
      auVar264 = vsubps_avx(auVar238,auVar12);
      fVar358 = auVar264._0_4_ * fVar185;
      fVar365 = auVar264._4_4_ * fVar203;
      auVar32._4_4_ = fVar365;
      auVar32._0_4_ = fVar358;
      fVar249 = auVar264._8_4_ * fVar205;
      auVar32._8_4_ = fVar249;
      fVar252 = auVar264._12_4_ * fVar207;
      auVar32._12_4_ = fVar252;
      fVar255 = auVar264._16_4_ * fVar208;
      auVar32._16_4_ = fVar255;
      fVar258 = auVar264._20_4_ * fVar209;
      auVar32._20_4_ = fVar258;
      fVar261 = auVar264._24_4_ * fVar210;
      auVar32._24_4_ = fVar261;
      auVar32._28_4_ = auVar264._28_4_;
      auVar12 = vsubps_avx(auVar12,auVar360);
      fVar185 = auVar12._0_4_ * fVar185;
      fVar203 = auVar12._4_4_ * fVar203;
      auVar33._4_4_ = fVar203;
      auVar33._0_4_ = fVar185;
      fVar205 = auVar12._8_4_ * fVar205;
      auVar33._8_4_ = fVar205;
      fVar207 = auVar12._12_4_ * fVar207;
      auVar33._12_4_ = fVar207;
      fVar208 = auVar12._16_4_ * fVar208;
      auVar33._16_4_ = fVar208;
      fVar209 = auVar12._20_4_ * fVar209;
      auVar33._20_4_ = fVar209;
      fVar210 = auVar12._24_4_ * fVar210;
      auVar33._24_4_ = fVar210;
      auVar33._28_4_ = auVar12._28_4_;
      fStack_4e4 = fStack_a04 + auVar11._28_4_ + auVar10._28_4_;
      local_500[0] = fVar182 * ((float)local_a20._0_4_ + fVar142 * fVar358);
      local_500[1] = fVar231 * ((float)local_a20._4_4_ + fVar161 * fVar365);
      local_500[2] = fVar248 * (fStack_a18 + fVar163 * fVar249);
      local_500[3] = fVar254 * (fStack_a14 + fVar165 * fVar252);
      fStack_4f0 = fVar266 * (fStack_a10 + fVar166 * fVar255);
      fStack_4ec = fVar272 * (fStack_a0c + fVar167 * fVar258);
      fStack_4e8 = fVar304 * (fStack_a08 + fVar168 * fVar261);
      local_520[0] = fVar182 * ((float)local_a20._0_4_ + fVar142 * fVar185);
      local_520[1] = fVar231 * ((float)local_a20._4_4_ + fVar161 * fVar203);
      local_520[2] = fVar248 * (fStack_a18 + fVar163 * fVar205);
      local_520[3] = fVar254 * (fStack_a14 + fVar165 * fVar207);
      fStack_510 = fVar266 * (fStack_a10 + fVar166 * fVar208);
      fStack_50c = fVar272 * (fStack_a0c + fVar167 * fVar209);
      fStack_508 = fVar304 * (fStack_a08 + fVar168 * fVar210);
      fStack_504 = fStack_a04 + fStack_4e4;
      auVar198._8_4_ = 0x7f800000;
      auVar198._0_8_ = 0x7f8000007f800000;
      auVar198._12_4_ = 0x7f800000;
      auVar198._16_4_ = 0x7f800000;
      auVar198._20_4_ = 0x7f800000;
      auVar198._24_4_ = 0x7f800000;
      auVar198._28_4_ = 0x7f800000;
      auVar197 = vblendvps_avx(auVar198,auVar32,auVar281);
      auVar263._8_4_ = 0x7fffffff;
      auVar263._0_8_ = 0x7fffffff7fffffff;
      auVar263._12_4_ = 0x7fffffff;
      auVar263._16_4_ = 0x7fffffff;
      auVar263._20_4_ = 0x7fffffff;
      auVar263._24_4_ = 0x7fffffff;
      auVar263._28_4_ = 0x7fffffff;
      auVar10 = vandps_avx(auVar29,auVar263);
      auVar10 = vmaxps_avx(local_440,auVar10);
      auVar34._4_4_ = auVar10._4_4_ * 1.9073486e-06;
      auVar34._0_4_ = auVar10._0_4_ * 1.9073486e-06;
      auVar34._8_4_ = auVar10._8_4_ * 1.9073486e-06;
      auVar34._12_4_ = auVar10._12_4_ * 1.9073486e-06;
      auVar34._16_4_ = auVar10._16_4_ * 1.9073486e-06;
      auVar34._20_4_ = auVar10._20_4_ * 1.9073486e-06;
      auVar34._24_4_ = auVar10._24_4_ * 1.9073486e-06;
      auVar34._28_4_ = auVar10._28_4_;
      auVar10 = vandps_avx(auVar343,auVar263);
      auVar11 = vcmpps_avx(auVar10,auVar34,1);
      auVar239._8_4_ = 0xff800000;
      auVar239._0_8_ = 0xff800000ff800000;
      auVar239._12_4_ = 0xff800000;
      auVar239._16_4_ = 0xff800000;
      auVar239._20_4_ = 0xff800000;
      auVar239._24_4_ = 0xff800000;
      auVar239._28_4_ = 0xff800000;
      auVar244 = ZEXT3264(auVar239);
      auVar10 = vblendvps_avx(auVar239,auVar33,auVar281);
      auVar331 = ZEXT3264(auVar10);
      auVar12 = auVar281 & auVar11;
      if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar12 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar12 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar12 >> 0x7f,0) == '\0') &&
            (auVar12 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar12 >> 0xbf,0) == '\0') &&
          (auVar12 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar12[0x1f])
      {
        auVar176._4_4_ = fStack_6fc;
        auVar176._0_4_ = local_700;
        auVar176._8_4_ = fStack_6f8;
        auVar176._12_4_ = fStack_6f4;
        auVar176._16_4_ = fStack_6f0;
        auVar176._20_4_ = fStack_6ec;
        auVar176._24_4_ = fStack_6e8;
        auVar318 = ZEXT3264(CONCAT428(fStack_704,
                                      CONCAT424(fStack_708,
                                                CONCAT420(fStack_70c,
                                                          CONCAT416(fStack_710,
                                                                    CONCAT412(fStack_714,
                                                                              CONCAT48(fStack_718,
                                                                                       CONCAT44(
                                                  fStack_71c,local_720))))))));
      }
      else {
        auVar94 = vandps_avx(auVar11,auVar281);
        auVar87 = vpackssdw_avx(auVar94._0_16_,auVar94._16_16_);
        auVar11 = vcmpps_avx(auVar95,ZEXT832(0) << 0x20,2);
        auVar244 = ZEXT3264(auVar11);
        auVar362._8_4_ = 0xff800000;
        auVar362._0_8_ = 0xff800000ff800000;
        auVar362._12_4_ = 0xff800000;
        auVar362._16_4_ = 0xff800000;
        auVar362._20_4_ = 0xff800000;
        auVar362._24_4_ = 0xff800000;
        auVar362._28_4_ = 0xff800000;
        auVar283._8_4_ = 0x7f800000;
        auVar283._0_8_ = 0x7f8000007f800000;
        auVar283._12_4_ = 0x7f800000;
        auVar283._16_4_ = 0x7f800000;
        auVar283._20_4_ = 0x7f800000;
        auVar283._24_4_ = 0x7f800000;
        auVar283._28_4_ = 0x7f800000;
        auVar95 = vblendvps_avx(auVar283,auVar362,auVar11);
        auVar149 = vpmovsxwd_avx(auVar87);
        auVar87 = vpunpckhwd_avx(auVar87,auVar87);
        auVar226._16_16_ = auVar87;
        auVar226._0_16_ = auVar149;
        auVar197 = vblendvps_avx(auVar197,auVar95,auVar226);
        auVar95 = vblendvps_avx(auVar362,auVar283,auVar11);
        auVar95 = vblendvps_avx(auVar10,auVar95,auVar226);
        auVar331 = ZEXT3264(auVar95);
        auVar95 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar103._0_4_ = auVar94._0_4_ ^ auVar95._0_4_;
        auVar103._4_4_ = auVar94._4_4_ ^ auVar95._4_4_;
        auVar103._8_4_ = auVar94._8_4_ ^ auVar95._8_4_;
        auVar103._12_4_ = auVar94._12_4_ ^ auVar95._12_4_;
        auVar103._16_4_ = auVar94._16_4_ ^ auVar95._16_4_;
        auVar103._20_4_ = auVar94._20_4_ ^ auVar95._20_4_;
        auVar103._24_4_ = auVar94._24_4_ ^ auVar95._24_4_;
        auVar103._28_4_ = auVar94._28_4_ ^ auVar95._28_4_;
        auVar94 = vorps_avx(auVar11,auVar103);
        auVar94 = vandps_avx(auVar281,auVar94);
        auVar176._4_4_ = fStack_6fc;
        auVar176._0_4_ = local_700;
        auVar176._8_4_ = fStack_6f8;
        auVar176._12_4_ = fStack_6f4;
        auVar176._16_4_ = fStack_6f0;
        auVar176._20_4_ = fStack_6ec;
        auVar176._24_4_ = fStack_6e8;
        auVar318 = ZEXT3264(CONCAT428(fStack_704,
                                      CONCAT424(fStack_708,
                                                CONCAT420(fStack_70c,
                                                          CONCAT416(fStack_710,
                                                                    CONCAT412(fStack_714,
                                                                              CONCAT48(fStack_718,
                                                                                       CONCAT44(
                                                  fStack_71c,local_720))))))));
      }
    }
    auVar227 = ZEXT3264(local_420);
    auVar95 = local_420 & auVar94;
    auVar265 = ZEXT3264(_local_740);
    if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar95 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar95 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar95 >> 0x7f,0) != '\0') ||
          (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar95 >> 0xbf,0) != '\0') ||
        (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar95[0x1f] < '\0')
    {
      auVar87 = ZEXT416((uint)((ray->org).field_0.m128[3] - (float)local_7c0._0_4_));
      auVar87 = vshufps_avx(auVar87,auVar87,0);
      auVar217._16_16_ = auVar87;
      auVar217._0_16_ = auVar87;
      auVar10 = vmaxps_avx(auVar217,auVar197);
      auVar87 = ZEXT416((uint)(ray->tfar - (float)local_7c0._0_4_));
      auVar87 = vshufps_avx(auVar87,auVar87,0);
      auVar218._16_16_ = auVar87;
      auVar218._0_16_ = auVar87;
      auVar281 = vminps_avx(auVar218,auVar331._0_32_);
      fVar208 = auVar123._28_4_;
      fVar209 = auVar318._0_4_;
      fVar210 = auVar318._4_4_;
      fVar249 = auVar318._8_4_;
      fVar252 = auVar318._12_4_;
      fVar255 = auVar318._16_4_;
      fVar258 = auVar318._20_4_;
      fVar261 = auVar318._24_4_;
      auVar155._0_4_ = local_400 * fVar274 + auVar176._0_4_ * fVar327 + fVar209 * fVar338;
      auVar155._4_4_ = fStack_3fc * fVar287 + auVar176._4_4_ * fVar332 + fVar210 * fVar344;
      auVar155._8_4_ = fStack_3f8 * fVar292 + auVar176._8_4_ * fVar333 + fVar249 * fVar346;
      auVar155._12_4_ = fStack_3f4 * fVar296 + auVar176._12_4_ * fVar334 + fVar252 * fVar348;
      auVar155._16_4_ = fStack_3f0 * fVar299 + auVar176._16_4_ * fVar335 + fVar255 * fVar350;
      auVar155._20_4_ = fStack_3ec * fVar302 + auVar176._20_4_ * fVar336 + fVar258 * fVar352;
      auVar155._24_4_ = fStack_3e8 * fVar305 + auVar176._24_4_ * fVar337 + fVar261 * fVar354;
      auVar155._28_4_ = fVar314 + fStack_1a4 + fVar208;
      auVar95 = vrcpps_avx(auVar155);
      fVar314 = auVar95._0_4_;
      fVar358 = auVar95._4_4_;
      auVar35._4_4_ = auVar155._4_4_ * fVar358;
      auVar35._0_4_ = auVar155._0_4_ * fVar314;
      fVar365 = auVar95._8_4_;
      auVar35._8_4_ = auVar155._8_4_ * fVar365;
      fVar185 = auVar95._12_4_;
      auVar35._12_4_ = auVar155._12_4_ * fVar185;
      fVar203 = auVar95._16_4_;
      auVar35._16_4_ = auVar155._16_4_ * fVar203;
      fVar205 = auVar95._20_4_;
      auVar35._20_4_ = auVar155._20_4_ * fVar205;
      fVar207 = auVar95._24_4_;
      auVar35._24_4_ = auVar155._24_4_ * fVar207;
      auVar35._28_4_ = fStack_1a4;
      auVar330._8_4_ = 0x3f800000;
      auVar330._0_8_ = &DAT_3f8000003f800000;
      auVar330._12_4_ = 0x3f800000;
      auVar330._16_4_ = 0x3f800000;
      auVar330._20_4_ = 0x3f800000;
      auVar330._24_4_ = 0x3f800000;
      auVar330._28_4_ = 0x3f800000;
      auVar123 = vsubps_avx(auVar330,auVar35);
      auVar310._8_4_ = 0x7fffffff;
      auVar310._0_8_ = 0x7fffffff7fffffff;
      auVar310._12_4_ = 0x7fffffff;
      auVar310._16_4_ = 0x7fffffff;
      auVar310._20_4_ = 0x7fffffff;
      auVar310._24_4_ = 0x7fffffff;
      auVar310._28_4_ = 0x7fffffff;
      auVar95 = vandps_avx(auVar310,auVar155);
      auVar361._8_4_ = 0x219392ef;
      auVar361._0_8_ = 0x219392ef219392ef;
      auVar361._12_4_ = 0x219392ef;
      auVar361._16_4_ = 0x219392ef;
      auVar361._20_4_ = 0x219392ef;
      auVar361._24_4_ = 0x219392ef;
      auVar361._28_4_ = 0x219392ef;
      auVar95 = vcmpps_avx(auVar95,auVar361,1);
      auVar318 = ZEXT3264(CONCAT428(0x80000000,
                                    CONCAT424(0x80000000,
                                              CONCAT420(0x80000000,
                                                        CONCAT416(0x80000000,
                                                                  CONCAT412(0x80000000,
                                                                            CONCAT48(0x80000000,
                                                                                                                                                                          
                                                  0x8000000080000000)))))));
      auVar36._4_4_ =
           (fVar358 + fVar358 * auVar123._4_4_) *
           -(fVar373 * fVar287 + fVar332 * fVar230 + fVar344 * fVar206);
      auVar36._0_4_ =
           (fVar314 + fVar314 * auVar123._0_4_) *
           -(fVar371 * fVar274 + fVar327 * fVar228 + fVar338 * fVar202);
      auVar36._8_4_ =
           (fVar365 + fVar365 * auVar123._8_4_) *
           -(fVar374 * fVar292 + fVar333 * fVar232 + fVar346 * fVar247);
      auVar36._12_4_ =
           (fVar185 + fVar185 * auVar123._12_4_) *
           -(fVar375 * fVar296 + fVar334 * fVar253 + fVar348 * fVar251);
      auVar36._16_4_ =
           (fVar203 + fVar203 * auVar123._16_4_) *
           -(fVar376 * fVar299 + fVar335 * fVar262 + fVar350 * fVar260);
      auVar36._20_4_ =
           (fVar205 + fVar205 * auVar123._20_4_) *
           -(fVar377 * fVar302 + fVar336 * fVar271 + fVar352 * fVar270);
      auVar36._24_4_ =
           (fVar207 + fVar207 * auVar123._24_4_) *
           -(fVar378 * fVar305 + fVar337 * fVar301 + fVar354 * fVar298);
      auVar36._28_4_ = -(fVar208 + auVar224._28_4_ + fVar208);
      auVar224 = vcmpps_avx(auVar155,ZEXT832(0) << 0x20,1);
      auVar123 = vorps_avx(auVar95,auVar224);
      auVar224 = vcmpps_avx(auVar155,ZEXT832(0) << 0x20,6);
      auVar224 = vorps_avx(auVar95,auVar224);
      auVar323._8_4_ = 0xff800000;
      auVar323._0_8_ = 0xff800000ff800000;
      auVar323._12_4_ = 0xff800000;
      auVar323._16_4_ = 0xff800000;
      auVar323._20_4_ = 0xff800000;
      auVar323._24_4_ = 0xff800000;
      auVar323._28_4_ = 0xff800000;
      auVar325 = ZEXT3264(auVar323);
      auVar95 = vblendvps_avx(auVar36,auVar323,auVar123);
      auVar342._8_4_ = 0x7f800000;
      auVar342._0_8_ = 0x7f8000007f800000;
      auVar342._12_4_ = 0x7f800000;
      auVar342._16_4_ = 0x7f800000;
      auVar342._20_4_ = 0x7f800000;
      auVar342._24_4_ = 0x7f800000;
      auVar342._28_4_ = 0x7f800000;
      auVar224 = vblendvps_avx(auVar36,auVar342,auVar224);
      auVar123 = vmaxps_avx(auVar10,auVar95);
      auVar10 = vminps_avx(auVar281,auVar224);
      auVar311 = ZEXT3264(auVar10);
      auVar264 = ZEXT832(0) << 0x20;
      auVar95 = vsubps_avx(auVar264,local_940);
      auVar224 = vsubps_avx(auVar264,_local_8a0);
      auVar37._4_4_ = auVar224._4_4_ * -fVar345;
      auVar37._0_4_ = auVar224._0_4_ * -fVar339;
      auVar37._8_4_ = auVar224._8_4_ * -fVar347;
      auVar37._12_4_ = auVar224._12_4_ * -fVar349;
      auVar37._16_4_ = auVar224._16_4_ * -fVar351;
      auVar37._20_4_ = auVar224._20_4_ * -fVar353;
      auVar37._24_4_ = auVar224._24_4_ * -fVar355;
      auVar37._28_4_ = auVar224._28_4_;
      auVar38._4_4_ = fVar364 * auVar95._4_4_;
      auVar38._0_4_ = fVar357 * auVar95._0_4_;
      auVar38._8_4_ = fVar366 * auVar95._8_4_;
      auVar38._12_4_ = fVar367 * auVar95._12_4_;
      auVar38._16_4_ = fVar368 * auVar95._16_4_;
      auVar38._20_4_ = fVar369 * auVar95._20_4_;
      auVar38._24_4_ = fVar370 * auVar95._24_4_;
      auVar38._28_4_ = auVar95._28_4_;
      auVar95 = vsubps_avx(auVar37,auVar38);
      auVar224 = vsubps_avx(auVar264,local_9e0);
      auVar39._4_4_ = fVar288 * auVar224._4_4_;
      auVar39._0_4_ = fVar275 * auVar224._0_4_;
      auVar39._8_4_ = fVar293 * auVar224._8_4_;
      auVar39._12_4_ = fVar297 * auVar224._12_4_;
      auVar39._16_4_ = fVar300 * auVar224._16_4_;
      auVar39._20_4_ = fVar303 * auVar224._20_4_;
      uVar289 = auVar224._28_4_;
      auVar39._24_4_ = fVar306 * auVar224._24_4_;
      auVar39._28_4_ = uVar289;
      auVar281 = vsubps_avx(auVar95,auVar39);
      auVar40._4_4_ = fVar210 * -fVar345;
      auVar40._0_4_ = fVar209 * -fVar339;
      auVar40._8_4_ = fVar249 * -fVar347;
      auVar40._12_4_ = fVar252 * -fVar349;
      auVar40._16_4_ = fVar255 * -fVar351;
      auVar40._20_4_ = fVar258 * -fVar353;
      auVar40._24_4_ = fVar261 * -fVar355;
      auVar40._28_4_ = uVar74 ^ 0x80000000;
      auVar41._4_4_ = auVar176._4_4_ * fVar364;
      auVar41._0_4_ = auVar176._0_4_ * fVar357;
      auVar41._8_4_ = auVar176._8_4_ * fVar366;
      auVar41._12_4_ = auVar176._12_4_ * fVar367;
      auVar41._16_4_ = auVar176._16_4_ * fVar368;
      auVar41._20_4_ = auVar176._20_4_ * fVar369;
      auVar41._24_4_ = auVar176._24_4_ * fVar370;
      auVar41._28_4_ = uVar289;
      auVar95 = vsubps_avx(auVar40,auVar41);
      auVar42._4_4_ = fStack_3fc * fVar288;
      auVar42._0_4_ = local_400 * fVar275;
      auVar42._8_4_ = fStack_3f8 * fVar293;
      auVar42._12_4_ = fStack_3f4 * fVar297;
      auVar42._16_4_ = fStack_3f0 * fVar300;
      auVar42._20_4_ = fStack_3ec * fVar303;
      auVar42._24_4_ = fStack_3e8 * fVar306;
      auVar42._28_4_ = uVar289;
      auVar11 = vsubps_avx(auVar95,auVar42);
      auVar95 = vrcpps_avx(auVar11);
      fVar202 = auVar95._0_4_;
      fVar228 = auVar95._4_4_;
      auVar43._4_4_ = auVar11._4_4_ * fVar228;
      auVar43._0_4_ = auVar11._0_4_ * fVar202;
      fVar206 = auVar95._8_4_;
      auVar43._8_4_ = auVar11._8_4_ * fVar206;
      fVar230 = auVar95._12_4_;
      auVar43._12_4_ = auVar11._12_4_ * fVar230;
      fVar247 = auVar95._16_4_;
      auVar43._16_4_ = auVar11._16_4_ * fVar247;
      fVar232 = auVar95._20_4_;
      auVar43._20_4_ = auVar11._20_4_ * fVar232;
      fVar251 = auVar95._24_4_;
      auVar43._24_4_ = auVar11._24_4_ * fVar251;
      auVar43._28_4_ = local_860._28_4_;
      auVar96._8_4_ = 0x3f800000;
      auVar96._0_8_ = &DAT_3f8000003f800000;
      auVar96._12_4_ = 0x3f800000;
      auVar96._16_4_ = 0x3f800000;
      auVar96._20_4_ = 0x3f800000;
      auVar96._24_4_ = 0x3f800000;
      auVar96._28_4_ = 0x3f800000;
      auVar331 = ZEXT3264(auVar96);
      auVar12 = vsubps_avx(auVar96,auVar43);
      auVar97._8_4_ = 0x7fffffff;
      auVar97._0_8_ = 0x7fffffff7fffffff;
      auVar97._12_4_ = 0x7fffffff;
      auVar97._16_4_ = 0x7fffffff;
      auVar97._20_4_ = 0x7fffffff;
      auVar97._24_4_ = 0x7fffffff;
      auVar97._28_4_ = 0x7fffffff;
      auVar95 = vandps_avx(auVar11,auVar97);
      auVar224 = vcmpps_avx(auVar95,auVar361,1);
      auVar244 = ZEXT3264(auVar224);
      auVar44._4_4_ = (fVar228 + fVar228 * auVar12._4_4_) * -auVar281._4_4_;
      auVar44._0_4_ = (fVar202 + fVar202 * auVar12._0_4_) * -auVar281._0_4_;
      auVar44._8_4_ = (fVar206 + fVar206 * auVar12._8_4_) * -auVar281._8_4_;
      auVar44._12_4_ = (fVar230 + fVar230 * auVar12._12_4_) * -auVar281._12_4_;
      auVar44._16_4_ = (fVar247 + fVar247 * auVar12._16_4_) * -auVar281._16_4_;
      auVar44._20_4_ = (fVar232 + fVar232 * auVar12._20_4_) * -auVar281._20_4_;
      auVar44._24_4_ = (fVar251 + fVar251 * auVar12._24_4_) * -auVar281._24_4_;
      auVar44._28_4_ = auVar281._28_4_ ^ 0x80000000;
      auVar95 = vcmpps_avx(auVar11,auVar264,1);
      auVar95 = vorps_avx(auVar224,auVar95);
      auVar95 = vblendvps_avx(auVar44,auVar323,auVar95);
      _local_840 = vmaxps_avx(auVar123,auVar95);
      auVar227 = ZEXT864(0) << 0x20;
      auVar95 = vcmpps_avx(auVar11,ZEXT832(0) << 0x20,6);
      auVar95 = vorps_avx(auVar224,auVar95);
      auVar95 = vblendvps_avx(auVar44,auVar342,auVar95);
      auVar94 = vandps_avx(auVar94,local_420);
      local_4a0 = vminps_avx(auVar10,auVar95);
      auVar95 = vcmpps_avx(_local_840,local_4a0,2);
      auVar224 = auVar94 & auVar95;
      if ((((((((auVar224 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar224 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar224 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar224 >> 0x7f,0) != '\0') ||
            (auVar224 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar224 >> 0xbf,0) != '\0') ||
          (auVar224 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar224[0x1f] < '\0') {
        auVar224 = vminps_avx(_local_ae0,local_6a0);
        auVar123 = vminps_avx(local_800,local_680);
        auVar224 = vminps_avx(auVar224,auVar123);
        auVar9 = vsubps_avx(auVar224,auVar9);
        auVar94 = vandps_avx(auVar95,auVar94);
        auVar70._4_4_ = local_500[1];
        auVar70._0_4_ = local_500[0];
        auVar70._8_4_ = local_500[2];
        auVar70._12_4_ = local_500[3];
        auVar70._16_4_ = fStack_4f0;
        auVar70._20_4_ = fStack_4ec;
        auVar70._24_4_ = fStack_4e8;
        auVar70._28_4_ = fStack_4e4;
        auVar95 = vminps_avx(auVar70,auVar96);
        auVar95 = vmaxps_avx(auVar95,ZEXT832(0) << 0x20);
        local_500[0] = fVar141 + fVar356 * (auVar95._0_4_ + 0.0) * 0.125;
        local_500[1] = fVar160 + fVar137 * (auVar95._4_4_ + 1.0) * 0.125;
        local_500[2] = fVar162 + fVar138 * (auVar95._8_4_ + 2.0) * 0.125;
        local_500[3] = fVar164 + fVar140 * (auVar95._12_4_ + 3.0) * 0.125;
        fStack_4f0 = fVar141 + fVar356 * (auVar95._16_4_ + 4.0) * 0.125;
        fStack_4ec = fVar160 + fVar137 * (auVar95._20_4_ + 5.0) * 0.125;
        fStack_4e8 = fVar162 + fVar138 * (auVar95._24_4_ + 6.0) * 0.125;
        fStack_4e4 = fVar164 + auVar95._28_4_ + 7.0;
        auVar69._4_4_ = local_520[1];
        auVar69._0_4_ = local_520[0];
        auVar69._8_4_ = local_520[2];
        auVar69._12_4_ = local_520[3];
        auVar69._16_4_ = fStack_510;
        auVar69._20_4_ = fStack_50c;
        auVar69._24_4_ = fStack_508;
        auVar69._28_4_ = fStack_504;
        auVar95 = vminps_avx(auVar69,auVar96);
        auVar95 = vmaxps_avx(auVar95,ZEXT832(0) << 0x20);
        local_520[0] = fVar141 + fVar356 * (auVar95._0_4_ + 0.0) * 0.125;
        local_520[1] = fVar160 + fVar137 * (auVar95._4_4_ + 1.0) * 0.125;
        local_520[2] = fVar162 + fVar138 * (auVar95._8_4_ + 2.0) * 0.125;
        local_520[3] = fVar164 + fVar140 * (auVar95._12_4_ + 3.0) * 0.125;
        fStack_510 = fVar141 + fVar356 * (auVar95._16_4_ + 4.0) * 0.125;
        fStack_50c = fVar160 + fVar137 * (auVar95._20_4_ + 5.0) * 0.125;
        fStack_508 = fVar162 + fVar138 * (auVar95._24_4_ + 6.0) * 0.125;
        fStack_504 = fVar164 + auVar95._28_4_ + 7.0;
        auVar45._4_4_ = auVar9._4_4_ * 0.99999976;
        auVar45._0_4_ = auVar9._0_4_ * 0.99999976;
        auVar45._8_4_ = auVar9._8_4_ * 0.99999976;
        auVar45._12_4_ = auVar9._12_4_ * 0.99999976;
        auVar45._16_4_ = auVar9._16_4_ * 0.99999976;
        auVar45._20_4_ = auVar9._20_4_ * 0.99999976;
        auVar45._24_4_ = auVar9._24_4_ * 0.99999976;
        auVar45._28_4_ = 0x3f7ffffc;
        auVar95 = vmaxps_avx(ZEXT832(0) << 0x20,auVar45);
        auVar46._4_4_ = auVar95._4_4_ * auVar95._4_4_;
        auVar46._0_4_ = auVar95._0_4_ * auVar95._0_4_;
        auVar46._8_4_ = auVar95._8_4_ * auVar95._8_4_;
        auVar46._12_4_ = auVar95._12_4_ * auVar95._12_4_;
        auVar46._16_4_ = auVar95._16_4_ * auVar95._16_4_;
        auVar46._20_4_ = auVar95._20_4_ * auVar95._20_4_;
        auVar46._24_4_ = auVar95._24_4_ * auVar95._24_4_;
        auVar46._28_4_ = auVar95._28_4_;
        local_a40 = vsubps_avx(_local_6c0,auVar46);
        auVar47._4_4_ = local_a40._4_4_ * fVar313 * 4.0;
        auVar47._0_4_ = local_a40._0_4_ * fVar307 * 4.0;
        auVar47._8_4_ = local_a40._8_4_ * fStack_5d8;
        auVar47._12_4_ = local_a40._12_4_ * fStack_5d4;
        auVar47._16_4_ = local_a40._16_4_ * fStack_5d0;
        auVar47._20_4_ = local_a40._20_4_ * fStack_5cc;
        auVar47._24_4_ = local_a40._24_4_ * fStack_5c8;
        auVar47._28_4_ = auVar95._28_4_;
        auVar9 = vsubps_avx(local_6e0,auVar47);
        local_7e0 = vcmpps_avx(auVar9,ZEXT832(0) << 0x20,5);
        auVar95 = local_7e0;
        if ((((((((local_7e0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_7e0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_7e0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_7e0 >> 0x7f,0) == '\0') &&
              (local_7e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_7e0 >> 0xbf,0) == '\0') &&
            (local_7e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_7e0[0x1f]) {
          auVar123 = SUB6432(ZEXT864(0),0) << 0x20;
          _local_620 = ZEXT832(0) << 0x20;
          _local_640 = ZEXT832(0) << 0x20;
          auVar176 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar311 = ZEXT864(0) << 0x20;
          auVar199._8_4_ = 0x7f800000;
          auVar199._0_8_ = 0x7f8000007f800000;
          auVar199._12_4_ = 0x7f800000;
          auVar199._16_4_ = 0x7f800000;
          auVar199._20_4_ = 0x7f800000;
          auVar199._24_4_ = 0x7f800000;
          auVar199._28_4_ = 0x7f800000;
          auVar219._8_4_ = 0xff800000;
          auVar219._0_8_ = 0xff800000ff800000;
          auVar219._12_4_ = 0xff800000;
          auVar219._16_4_ = 0xff800000;
          auVar219._20_4_ = 0xff800000;
          auVar219._24_4_ = 0xff800000;
          auVar219._28_4_ = 0xff800000;
          auVar317 = local_820;
          local_a40 = auVar14;
          local_7e0 = auVar13;
          _local_600 = _local_620;
        }
        else {
          auVar123 = vsqrtps_avx(auVar9);
          auVar178._0_4_ = fVar307 + fVar307;
          auVar178._4_4_ = fVar313 + fVar313;
          auVar178._8_4_ = fVar326 + fVar326;
          auVar178._12_4_ = fVar105 + fVar105;
          auVar178._16_4_ = fVar106 + fVar106;
          auVar178._20_4_ = fVar107 + fVar107;
          auVar178._24_4_ = fVar312 + fVar312;
          auVar178._28_4_ = fVar169 + fVar169;
          auVar224 = vrcpps_avx(auVar178);
          fVar169 = auVar224._0_4_;
          fVar202 = auVar224._4_4_;
          auVar48._4_4_ = auVar178._4_4_ * fVar202;
          auVar48._0_4_ = auVar178._0_4_ * fVar169;
          fVar228 = auVar224._8_4_;
          auVar48._8_4_ = auVar178._8_4_ * fVar228;
          fVar206 = auVar224._12_4_;
          auVar48._12_4_ = auVar178._12_4_ * fVar206;
          fVar230 = auVar224._16_4_;
          auVar48._16_4_ = auVar178._16_4_ * fVar230;
          fVar247 = auVar224._20_4_;
          auVar48._20_4_ = auVar178._20_4_ * fVar247;
          fVar232 = auVar224._24_4_;
          auVar48._24_4_ = auVar178._24_4_ * fVar232;
          auVar48._28_4_ = auVar178._28_4_;
          auVar10 = vsubps_avx(auVar96,auVar48);
          fVar169 = fVar169 + fVar169 * auVar10._0_4_;
          fVar202 = fVar202 + fVar202 * auVar10._4_4_;
          fVar228 = fVar228 + fVar228 * auVar10._8_4_;
          fVar206 = fVar206 + fVar206 * auVar10._12_4_;
          fVar230 = fVar230 + fVar230 * auVar10._16_4_;
          fVar247 = fVar247 + fVar247 * auVar10._20_4_;
          fVar232 = fVar232 + fVar232 * auVar10._24_4_;
          fVar251 = auVar224._28_4_ + auVar10._28_4_;
          auVar220._0_8_ = auVar360._0_8_ ^ 0x8000000080000000;
          auVar220._8_4_ = -auVar360._8_4_;
          auVar220._12_4_ = -auVar360._12_4_;
          auVar220._16_4_ = -auVar360._16_4_;
          auVar220._20_4_ = -auVar360._20_4_;
          auVar220._24_4_ = -auVar360._24_4_;
          auVar220._28_4_ = -auVar360._28_4_;
          auVar224 = vsubps_avx(auVar220,auVar123);
          fVar307 = auVar224._0_4_ * fVar169;
          fVar313 = auVar224._4_4_ * fVar202;
          auVar49._4_4_ = fVar313;
          auVar49._0_4_ = fVar307;
          fVar326 = auVar224._8_4_ * fVar228;
          auVar49._8_4_ = fVar326;
          fVar105 = auVar224._12_4_ * fVar206;
          auVar49._12_4_ = fVar105;
          fVar106 = auVar224._16_4_ * fVar230;
          auVar49._16_4_ = fVar106;
          fVar107 = auVar224._20_4_ * fVar247;
          auVar49._20_4_ = fVar107;
          fVar356 = auVar224._24_4_ * fVar232;
          auVar49._24_4_ = fVar356;
          auVar49._28_4_ = 0x7f800000;
          auVar123 = vsubps_avx(auVar123,auVar360);
          fVar169 = auVar123._0_4_ * fVar169;
          fVar202 = auVar123._4_4_ * fVar202;
          auVar50._4_4_ = fVar202;
          auVar50._0_4_ = fVar169;
          fVar228 = auVar123._8_4_ * fVar228;
          auVar50._8_4_ = fVar228;
          fVar206 = auVar123._12_4_ * fVar206;
          auVar50._12_4_ = fVar206;
          fVar230 = auVar123._16_4_ * fVar230;
          auVar50._16_4_ = fVar230;
          fVar247 = auVar123._20_4_ * fVar247;
          auVar50._20_4_ = fVar247;
          fVar232 = auVar123._24_4_ * fVar232;
          auVar50._24_4_ = fVar232;
          auVar50._28_4_ = 0x3f800000;
          auVar331 = ZEXT3264(auVar50);
          fVar253 = fVar182 * (fVar307 * fVar142 + (float)local_a20._0_4_);
          fVar260 = fVar231 * (fVar313 * fVar161 + (float)local_a20._4_4_);
          fVar262 = fVar248 * (fVar326 * fVar163 + fStack_a18);
          fVar270 = fVar254 * (fVar105 * fVar165 + fStack_a14);
          fVar271 = fVar266 * (fVar106 * fVar166 + fStack_a10);
          fVar298 = fVar272 * (fVar107 * fVar167 + fStack_a0c);
          fVar301 = fVar304 * (fVar356 * fVar168 + fStack_a08);
          auVar124._0_4_ = local_920 + fVar181 * fVar253;
          auVar124._4_4_ = fStack_91c + fVar183 * fVar260;
          auVar124._8_4_ = fStack_918 + fVar246 * fVar262;
          auVar124._12_4_ = fStack_914 + fVar234 * fVar270;
          auVar124._16_4_ = fStack_910 + fVar259 * fVar271;
          auVar124._20_4_ = fStack_90c + fVar269 * fVar298;
          auVar124._24_4_ = fStack_908 + fVar294 * fVar301;
          auVar124._28_4_ = fStack_904 + auVar123._28_4_ + fStack_a04;
          auVar51._4_4_ = fStack_3fc * fVar313;
          auVar51._0_4_ = local_400 * fVar307;
          auVar51._8_4_ = fStack_3f8 * fVar326;
          auVar51._12_4_ = fStack_3f4 * fVar105;
          auVar51._16_4_ = fStack_3f0 * fVar106;
          auVar51._20_4_ = fStack_3ec * fVar107;
          auVar51._24_4_ = fStack_3e8 * fVar356;
          auVar51._28_4_ = fVar251;
          auVar123 = vsubps_avx(auVar51,auVar124);
          auVar179._0_4_ = fVar273 + fVar184 * fVar253;
          auVar179._4_4_ = fVar286 + fVar204 * fVar260;
          auVar179._8_4_ = fVar291 + fVar319 * fVar262;
          auVar179._12_4_ = fVar295 + fVar250 * fVar270;
          auVar179._16_4_ = fStack_a90 + fVar256 * fVar271;
          auVar179._20_4_ = fStack_a8c + fVar267 * fVar298;
          auVar179._24_4_ = fStack_a88 + fVar285 * fVar301;
          auVar179._28_4_ = fStack_a84 + fVar251;
          auVar240._0_4_ = local_700 * fVar307;
          auVar240._4_4_ = fStack_6fc * fVar313;
          auVar240._8_4_ = fStack_6f8 * fVar326;
          auVar240._12_4_ = fStack_6f4 * fVar105;
          auVar240._16_4_ = fStack_6f0 * fVar106;
          auVar240._20_4_ = fStack_6ec * fVar107;
          auVar240._24_4_ = fStack_6e8 * fVar356;
          auVar240._28_4_ = 0;
          _local_8a0 = vsubps_avx(auVar240,auVar179);
          auVar221._0_4_ = local_a60 + fVar211 * fVar253;
          auVar221._4_4_ = fStack_a5c + fVar229 * fVar260;
          auVar221._8_4_ = fStack_a58 + fVar245 * fVar262;
          auVar221._12_4_ = fStack_a54 + fVar233 * fVar270;
          auVar221._16_4_ = fStack_a50 + fVar257 * fVar271;
          auVar221._20_4_ = fStack_a4c + fVar268 * fVar298;
          auVar221._24_4_ = fStack_a48 + fVar290 * fVar301;
          auVar221._28_4_ = fStack_a44 + auVar224._28_4_;
          auVar52._4_4_ = fStack_71c * fVar313;
          auVar52._0_4_ = local_720 * fVar307;
          auVar52._8_4_ = fStack_718 * fVar326;
          auVar52._12_4_ = fStack_714 * fVar105;
          auVar52._16_4_ = fStack_710 * fVar106;
          auVar52._20_4_ = fStack_70c * fVar107;
          auVar52._24_4_ = fStack_708 * fVar356;
          auVar52._28_4_ = 0;
          local_a00 = vsubps_avx(auVar52,auVar221);
          fVar182 = fVar182 * (fVar169 * fVar142 + (float)local_a20._0_4_);
          fVar231 = fVar231 * (fVar202 * fVar161 + (float)local_a20._4_4_);
          fVar248 = fVar248 * (fVar228 * fVar163 + fStack_a18);
          fVar254 = fVar254 * (fVar206 * fVar165 + fStack_a14);
          fVar266 = fVar266 * (fVar230 * fVar166 + fStack_a10);
          fVar272 = fVar272 * (fVar247 * fVar167 + fStack_a0c);
          fVar304 = fVar304 * (fVar232 * fVar168 + fStack_a08);
          auVar241._0_4_ = local_920 + fVar181 * fVar182;
          auVar241._4_4_ = fStack_91c + fVar183 * fVar231;
          auVar241._8_4_ = fStack_918 + fVar246 * fVar248;
          auVar241._12_4_ = fStack_914 + fVar234 * fVar254;
          auVar241._16_4_ = fStack_910 + fVar259 * fVar266;
          auVar241._20_4_ = fStack_90c + fVar269 * fVar272;
          auVar241._24_4_ = fStack_908 + fVar294 * fVar304;
          auVar241._28_4_ = fStack_904 + 0.0;
          auVar53._4_4_ = fStack_3fc * fVar202;
          auVar53._0_4_ = local_400 * fVar169;
          auVar53._8_4_ = fStack_3f8 * fVar228;
          auVar53._12_4_ = fStack_3f4 * fVar206;
          auVar53._16_4_ = fStack_3f0 * fVar230;
          auVar53._20_4_ = fStack_3ec * fVar247;
          auVar53._24_4_ = fStack_3e8 * fVar232;
          auVar53._28_4_ = fStack_904;
          _local_620 = vsubps_avx(auVar53,auVar241);
          auVar242._0_4_ = fVar273 + fVar184 * fVar182;
          auVar242._4_4_ = fVar286 + fVar204 * fVar231;
          auVar242._8_4_ = fVar291 + fVar319 * fVar248;
          auVar242._12_4_ = fVar295 + fVar250 * fVar254;
          auVar242._16_4_ = fStack_a90 + fVar256 * fVar266;
          auVar242._20_4_ = fStack_a8c + fVar267 * fVar272;
          auVar242._24_4_ = fStack_a88 + fVar285 * fVar304;
          auVar242._28_4_ = fStack_a84 + local_620._28_4_;
          auVar54._4_4_ = fStack_6fc * fVar202;
          auVar54._0_4_ = local_700 * fVar169;
          auVar54._8_4_ = fStack_6f8 * fVar228;
          auVar54._12_4_ = fStack_6f4 * fVar206;
          auVar54._16_4_ = fStack_6f0 * fVar230;
          auVar54._20_4_ = fStack_6ec * fVar247;
          auVar54._24_4_ = fStack_6e8 * fVar232;
          auVar54._28_4_ = fStack_904;
          _local_600 = vsubps_avx(auVar54,auVar242);
          auVar222._0_4_ = local_a60 + fVar211 * fVar182;
          auVar222._4_4_ = fStack_a5c + fVar229 * fVar231;
          auVar222._8_4_ = fStack_a58 + fVar245 * fVar248;
          auVar222._12_4_ = fStack_a54 + fVar233 * fVar254;
          auVar222._16_4_ = fStack_a50 + fVar257 * fVar266;
          auVar222._20_4_ = fStack_a4c + fVar268 * fVar272;
          auVar222._24_4_ = fStack_a48 + fVar290 * fVar304;
          auVar222._28_4_ = fStack_a44 + local_a00._28_4_ + fStack_a04;
          auVar55._4_4_ = fStack_71c * fVar202;
          auVar55._0_4_ = local_720 * fVar169;
          auVar55._8_4_ = fStack_718 * fVar228;
          auVar55._12_4_ = fStack_714 * fVar206;
          auVar55._16_4_ = fStack_710 * fVar230;
          auVar55._20_4_ = fStack_70c * fVar247;
          auVar55._24_4_ = fStack_708 * fVar232;
          auVar55._28_4_ = local_600._28_4_;
          _local_640 = vsubps_avx(auVar55,auVar222);
          auVar224 = vcmpps_avx(auVar9,_DAT_02020f00,5);
          auVar200._8_4_ = 0x7f800000;
          auVar200._0_8_ = 0x7f8000007f800000;
          auVar200._12_4_ = 0x7f800000;
          auVar200._16_4_ = 0x7f800000;
          auVar200._20_4_ = 0x7f800000;
          auVar200._24_4_ = 0x7f800000;
          auVar200._28_4_ = 0x7f800000;
          auVar199 = vblendvps_avx(auVar200,auVar49,auVar224);
          auVar282._8_4_ = 0x7fffffff;
          auVar282._0_8_ = 0x7fffffff7fffffff;
          auVar282._12_4_ = 0x7fffffff;
          auVar282._16_4_ = 0x7fffffff;
          auVar282._20_4_ = 0x7fffffff;
          auVar282._24_4_ = 0x7fffffff;
          auVar282._28_4_ = 0x7fffffff;
          auVar9 = vandps_avx(auVar282,auVar29);
          auVar9 = vmaxps_avx(local_440,auVar9);
          auVar317._8_4_ = 0x36000000;
          auVar317._0_8_ = 0x3600000036000000;
          auVar317._12_4_ = 0x36000000;
          auVar317._16_4_ = 0x36000000;
          auVar317._20_4_ = 0x36000000;
          auVar317._24_4_ = 0x36000000;
          auVar317._28_4_ = 0x36000000;
          auVar56._4_4_ = auVar9._4_4_ * 1.9073486e-06;
          auVar56._0_4_ = auVar9._0_4_ * 1.9073486e-06;
          auVar56._8_4_ = auVar9._8_4_ * 1.9073486e-06;
          auVar56._12_4_ = auVar9._12_4_ * 1.9073486e-06;
          auVar56._16_4_ = auVar9._16_4_ * 1.9073486e-06;
          auVar56._20_4_ = auVar9._20_4_ * 1.9073486e-06;
          auVar56._24_4_ = auVar9._24_4_ * 1.9073486e-06;
          auVar56._28_4_ = auVar9._28_4_;
          auVar9 = vandps_avx(auVar282,auVar343);
          auVar9 = vcmpps_avx(auVar9,auVar56,1);
          auVar223._8_4_ = 0xff800000;
          auVar223._0_8_ = 0xff800000ff800000;
          auVar223._12_4_ = 0xff800000;
          auVar223._16_4_ = 0xff800000;
          auVar223._20_4_ = 0xff800000;
          auVar223._24_4_ = 0xff800000;
          auVar223._28_4_ = 0xff800000;
          auVar219 = vblendvps_avx(auVar223,auVar50,auVar224);
          auVar343 = auVar224 & auVar9;
          if ((((((((auVar343 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar343 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar343 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar343 >> 0x7f,0) != '\0') ||
                (auVar343 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar343 >> 0xbf,0) != '\0') ||
              (auVar343 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar343[0x1f] < '\0') {
            auVar95 = vandps_avx(auVar9,auVar224);
            auVar87 = vpackssdw_avx(auVar95._0_16_,auVar95._16_16_);
            auVar343 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar317 = vcmpps_avx(local_a40,auVar343,2);
            auVar363._8_4_ = 0xff800000;
            auVar363._0_8_ = 0xff800000ff800000;
            auVar363._12_4_ = 0xff800000;
            auVar363._16_4_ = 0xff800000;
            auVar363._20_4_ = 0xff800000;
            auVar363._24_4_ = 0xff800000;
            auVar363._28_4_ = 0xff800000;
            auVar372._8_4_ = 0x7f800000;
            auVar372._0_8_ = 0x7f8000007f800000;
            auVar372._12_4_ = 0x7f800000;
            auVar372._16_4_ = 0x7f800000;
            auVar372._20_4_ = 0x7f800000;
            auVar372._24_4_ = 0x7f800000;
            auVar372._28_4_ = 0x7f800000;
            auVar9 = vblendvps_avx(auVar372,auVar363,auVar317);
            auVar149 = vpmovsxwd_avx(auVar87);
            auVar331 = ZEXT1664(auVar149);
            auVar87 = vpunpckhwd_avx(auVar87,auVar87);
            auVar284._16_16_ = auVar87;
            auVar284._0_16_ = auVar149;
            auVar199 = vblendvps_avx(auVar199,auVar9,auVar284);
            auVar9 = vblendvps_avx(auVar363,auVar372,auVar317);
            auVar219 = vblendvps_avx(auVar219,auVar9,auVar284);
            auVar9 = vcmpps_avx(auVar343,ZEXT1232(ZEXT412(0)) << 0x20,0xf);
            auVar104._0_4_ = auVar9._0_4_ ^ auVar95._0_4_;
            auVar104._4_4_ = auVar9._4_4_ ^ auVar95._4_4_;
            auVar104._8_4_ = auVar9._8_4_ ^ auVar95._8_4_;
            auVar104._12_4_ = auVar9._12_4_ ^ auVar95._12_4_;
            auVar104._16_4_ = auVar9._16_4_ ^ auVar95._16_4_;
            auVar104._20_4_ = auVar9._20_4_ ^ auVar95._20_4_;
            auVar104._24_4_ = auVar9._24_4_ ^ auVar95._24_4_;
            auVar104._28_4_ = auVar9._28_4_ ^ auVar95._28_4_;
            auVar95 = vorps_avx(auVar317,auVar104);
            auVar95 = vandps_avx(auVar224,auVar95);
          }
          auVar176 = local_8a0._0_28_;
          auVar311 = ZEXT3264(local_a00);
          _local_ae0 = auVar94;
          local_940 = auVar123;
        }
        auVar318 = ZEXT3264(auVar317);
        fVar169 = (ray->dir).field_0.m128[0];
        auVar243._4_4_ = fVar169;
        auVar243._0_4_ = fVar169;
        auVar243._8_4_ = fVar169;
        auVar243._12_4_ = fVar169;
        auVar243._16_4_ = fVar169;
        auVar243._20_4_ = fVar169;
        auVar243._24_4_ = fVar169;
        auVar243._28_4_ = fVar169;
        auVar244 = ZEXT3264(auVar243);
        fVar184 = (ray->dir).field_0.m128[1];
        auVar322._4_4_ = fVar184;
        auVar322._0_4_ = fVar184;
        auVar322._8_4_ = fVar184;
        auVar322._12_4_ = fVar184;
        auVar322._16_4_ = fVar184;
        auVar322._20_4_ = fVar184;
        auVar322._24_4_ = fVar184;
        auVar324._28_4_ = fVar184;
        auVar324._0_28_ = auVar322;
        auVar325 = ZEXT3264(auVar324);
        fStack_57c = (ray->dir).field_0.m128[2];
        local_480 = _local_840;
        local_460 = vminps_avx(local_4a0,auVar199);
        auVar224 = vmaxps_avx(_local_840,auVar219);
        auVar227 = ZEXT3264(auVar224);
        _local_4c0 = auVar224;
        auVar9 = vcmpps_avx(_local_840,local_460,2);
        local_560 = vandps_avx(auVar9,auVar94);
        auVar9 = vcmpps_avx(auVar224,local_4a0,2);
        local_780 = vandps_avx(auVar9,auVar94);
        auVar94 = vorps_avx(local_780,local_560);
        if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar94 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar94 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar94 >> 0x7f,0) != '\0') ||
              (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar94 >> 0xbf,0) != '\0') ||
            (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar94[0x1f] < '\0') {
          auVar94 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
          local_2c0._0_4_ = auVar95._0_4_ ^ auVar94._0_4_;
          local_2c0._4_4_ = auVar95._4_4_ ^ auVar94._4_4_;
          local_2c0._8_4_ = auVar95._8_4_ ^ auVar94._8_4_;
          local_2c0._12_4_ = auVar95._12_4_ ^ auVar94._12_4_;
          local_2c0._16_4_ = auVar95._16_4_ ^ auVar94._16_4_;
          local_2c0._20_4_ = auVar95._20_4_ ^ auVar94._20_4_;
          local_2c0._24_4_ = auVar95._24_4_ ^ auVar94._24_4_;
          local_2c0._28_4_ = (uint)auVar95._28_4_ ^ (uint)auVar94._28_4_;
          auVar99._0_4_ =
               auVar123._0_4_ * fVar169 + fVar184 * auVar176._0_4_ + auVar311._0_4_ * fStack_57c;
          auVar99._4_4_ =
               auVar123._4_4_ * fVar169 + fVar184 * auVar176._4_4_ + auVar311._4_4_ * fStack_57c;
          auVar99._8_4_ =
               auVar123._8_4_ * fVar169 + fVar184 * auVar176._8_4_ + auVar311._8_4_ * fStack_57c;
          auVar99._12_4_ =
               auVar123._12_4_ * fVar169 + fVar184 * auVar176._12_4_ + auVar311._12_4_ * fStack_57c;
          auVar99._16_4_ =
               auVar123._16_4_ * fVar169 + fVar184 * auVar176._16_4_ + auVar311._16_4_ * fStack_57c;
          auVar99._20_4_ =
               auVar123._20_4_ * fVar169 + fVar184 * auVar176._20_4_ + auVar311._20_4_ * fStack_57c;
          auVar99._24_4_ =
               auVar123._24_4_ * fVar169 + fVar184 * auVar176._24_4_ + auVar311._24_4_ * fStack_57c;
          auVar99._28_4_ = auVar95._28_4_ + auVar123._28_4_ + auVar94._28_4_;
          auVar126._8_4_ = 0x7fffffff;
          auVar126._0_8_ = 0x7fffffff7fffffff;
          auVar126._12_4_ = 0x7fffffff;
          auVar126._16_4_ = 0x7fffffff;
          auVar126._20_4_ = 0x7fffffff;
          auVar126._24_4_ = 0x7fffffff;
          auVar126._28_4_ = 0x7fffffff;
          auVar94 = vandps_avx(auVar99,auVar126);
          auVar127._8_4_ = 0x3e99999a;
          auVar127._0_8_ = 0x3e99999a3e99999a;
          auVar127._12_4_ = 0x3e99999a;
          auVar127._16_4_ = 0x3e99999a;
          auVar127._20_4_ = 0x3e99999a;
          auVar127._24_4_ = 0x3e99999a;
          auVar127._28_4_ = 0x3e99999a;
          auVar94 = vcmpps_avx(auVar94,auVar127,1);
          auVar94 = vorps_avx(auVar94,local_2c0);
          auVar128._8_4_ = 3;
          auVar128._0_8_ = 0x300000003;
          auVar128._12_4_ = 3;
          auVar128._16_4_ = 3;
          auVar128._20_4_ = 3;
          auVar128._24_4_ = 3;
          auVar128._28_4_ = 3;
          auVar156._8_4_ = 2;
          auVar156._0_8_ = 0x200000002;
          auVar156._12_4_ = 2;
          auVar156._16_4_ = 2;
          auVar156._20_4_ = 2;
          auVar156._24_4_ = 2;
          auVar156._28_4_ = 2;
          auVar94 = vblendvps_avx(auVar156,auVar128,auVar94);
          local_2a0 = ZEXT432((uint)local_5e0);
          local_4e0 = vpshufd_avx(ZEXT416((uint)local_5e0),0);
          auVar87 = vpcmpgtd_avx(auVar94._16_16_,local_4e0);
          auVar149 = vpcmpgtd_avx(auVar94._0_16_,local_4e0);
          auVar129._16_16_ = auVar87;
          auVar129._0_16_ = auVar149;
          auVar95 = vblendps_avx(ZEXT1632(auVar149),auVar129,0xf0);
          auVar94 = vandnps_avx(auVar95,local_560);
          auVar9 = local_560 & ~auVar95;
          auVar227 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
          local_580 = fStack_57c;
          fStack_578 = fStack_57c;
          fStack_574 = fStack_57c;
          fStack_570 = fStack_57c;
          fStack_56c = fStack_57c;
          fStack_568 = fStack_57c;
          fStack_564 = fStack_57c;
          local_760 = auVar95;
          local_5a0 = auVar94;
          if ((((((((auVar9 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar9 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar9 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar9 >> 0x7f,0) != '\0') ||
                (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar9 >> 0xbf,0) != '\0') ||
              (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar9[0x1f] < '\0') {
            local_540._4_4_ = (float)local_840._4_4_ + (float)local_740._4_4_;
            local_540._0_4_ = (float)local_840._0_4_ + (float)local_740._0_4_;
            fStack_538 = fStack_838 + fStack_738;
            fStack_534 = fStack_834 + fStack_734;
            fStack_530 = fStack_830 + fStack_730;
            fStack_52c = fStack_82c + fStack_72c;
            fStack_528 = fStack_828 + fStack_728;
            fStack_524 = fStack_824 + fStack_724;
            local_900 = auVar243;
            local_880 = auVar224;
            local_820 = auVar324;
            local_5c0 = local_780;
            do {
              auVar189 = auVar227._0_16_;
              auVar130._8_4_ = 0x7f800000;
              auVar130._0_8_ = 0x7f8000007f800000;
              auVar130._12_4_ = 0x7f800000;
              auVar130._16_4_ = 0x7f800000;
              auVar130._20_4_ = 0x7f800000;
              auVar130._24_4_ = 0x7f800000;
              auVar130._28_4_ = 0x7f800000;
              auVar95 = vblendvps_avx(auVar130,_local_840,auVar94);
              auVar9 = vshufps_avx(auVar95,auVar95,0xb1);
              auVar9 = vminps_avx(auVar95,auVar9);
              auVar224 = vshufpd_avx(auVar9,auVar9,5);
              auVar9 = vminps_avx(auVar9,auVar224);
              auVar224 = vperm2f128_avx(auVar9,auVar9,1);
              auVar9 = vminps_avx(auVar9,auVar224);
              auVar9 = vcmpps_avx(auVar95,auVar9,0);
              auVar224 = auVar94 & auVar9;
              auVar95 = auVar94;
              if ((((((((auVar224 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar224 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar224 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar224 >> 0x7f,0) != '\0') ||
                    (auVar224 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar224 >> 0xbf,0) != '\0') ||
                  (auVar224 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar224[0x1f] < '\0') {
                auVar95 = vandps_avx(auVar9,auVar94);
              }
              uVar76 = vmovmskps_avx(auVar95);
              uVar74 = 0;
              if (uVar76 != 0) {
                for (; (uVar76 >> uVar74 & 1) == 0; uVar74 = uVar74 + 1) {
                }
              }
              uVar72 = (ulong)uVar74;
              local_5a0 = auVar94;
              *(undefined4 *)(local_5a0 + uVar72 * 4) = 0;
              aVar4 = (ray->dir).field_0;
              _local_a20 = (undefined1  [16])aVar4;
              auVar87 = vdpps_avx((undefined1  [16])aVar4,(undefined1  [16])aVar4,0x7f);
              local_aa0 = *(float *)(local_480 + uVar72 * 4);
              uStack_a9c = 0;
              uStack_a98 = 0;
              uStack_a94 = 0;
              if (auVar87._0_4_ < 0.0) {
                _local_ae0 = ZEXT416((uint)local_500[uVar72]);
                fVar181 = sqrtf(auVar87._0_4_);
                auVar189._8_4_ = 0x7fffffff;
                auVar189._0_8_ = 0x7fffffff7fffffff;
                auVar189._12_4_ = 0x7fffffff;
                fVar169 = (float)local_ae0._0_4_;
                uVar289 = local_ae0._4_4_;
                fVar184 = fStack_ad8;
                fVar211 = fStack_ad4;
              }
              else {
                auVar87 = vsqrtss_avx(auVar87,auVar87);
                fVar181 = auVar87._0_4_;
                fVar169 = local_500[uVar72];
                uVar289 = 0;
                fVar184 = (float)0;
                fVar211 = (float)0;
              }
              auVar149 = vminps_avx(_local_980,_local_9a0);
              auVar87 = vmaxps_avx(_local_980,_local_9a0);
              auVar89 = vminps_avx(_local_990,_local_9b0);
              auVar116 = vminps_avx(auVar149,auVar89);
              auVar149 = vmaxps_avx(_local_990,_local_9b0);
              auVar89 = vmaxps_avx(auVar87,auVar149);
              auVar87 = vandps_avx(auVar116,auVar189);
              auVar149 = vandps_avx(auVar89,auVar189);
              auVar87 = vmaxps_avx(auVar87,auVar149);
              auVar149 = vmovshdup_avx(auVar87);
              auVar149 = vmaxss_avx(auVar149,auVar87);
              auVar87 = vshufpd_avx(auVar87,auVar87,1);
              auVar87 = vmaxss_avx(auVar87,auVar149);
              local_940._0_4_ = auVar87._0_4_ * 1.9073486e-06;
              local_660._0_4_ = fVar181 * 1.9073486e-06;
              local_6e0._0_16_ = vshufps_avx(auVar89,auVar89,0xff);
              lVar71 = 5;
              do {
                auVar94 = _local_ae0;
                local_920 = 1.0 - fVar169;
                auVar341 = ZEXT416((uint)local_920);
                fVar181 = local_920 * local_920;
                fVar202 = local_920 * fVar181;
                fVar228 = fVar169 * fVar169;
                fVar182 = fVar169 * fVar228;
                fVar204 = fVar169 * local_920;
                local_ae0._4_4_ = uVar289;
                local_ae0._0_4_ = fVar169;
                fStack_ad8 = fVar184;
                _fStack_ad0 = auVar94._16_16_;
                fStack_ad4 = fVar211;
                auVar87 = vshufps_avx(ZEXT416((uint)(fVar182 * 0.16666667)),
                                      ZEXT416((uint)(fVar182 * 0.16666667)),0);
                auVar149 = ZEXT416((uint)((fVar182 * 4.0 + fVar202 +
                                          fVar169 * fVar204 * 12.0 + local_920 * fVar204 * 6.0) *
                                         0.16666667));
                auVar149 = vshufps_avx(auVar149,auVar149,0);
                auVar89 = ZEXT416((uint)((fVar202 * 4.0 + fVar182 +
                                         local_920 * fVar204 * 12.0 + fVar169 * fVar204 * 6.0) *
                                        0.16666667));
                auVar89 = vshufps_avx(auVar89,auVar89,0);
                auVar315._4_4_ = uStack_a9c;
                auVar315._0_4_ = local_aa0;
                auVar315._8_4_ = uStack_a98;
                auVar315._12_4_ = uStack_a94;
                auVar116 = vshufps_avx(auVar315,auVar315,0);
                auVar145._0_4_ = auVar116._0_4_ * (float)local_a20._0_4_ + 0.0;
                auVar145._4_4_ = auVar116._4_4_ * (float)local_a20._4_4_ + 0.0;
                auVar145._8_4_ = auVar116._8_4_ * fStack_a18 + 0.0;
                auVar145._12_4_ = auVar116._12_4_ * fStack_a14 + 0.0;
                auVar116 = vshufps_avx(ZEXT416((uint)(fVar202 * 0.16666667)),
                                       ZEXT416((uint)(fVar202 * 0.16666667)),0);
                auVar81._0_4_ =
                     auVar116._0_4_ * (float)local_980._0_4_ +
                     auVar89._0_4_ * (float)local_9a0._0_4_ +
                     auVar87._0_4_ * (float)local_9b0._0_4_ +
                     auVar149._0_4_ * (float)local_990._0_4_;
                auVar81._4_4_ =
                     auVar116._4_4_ * (float)local_980._4_4_ +
                     auVar89._4_4_ * (float)local_9a0._4_4_ +
                     auVar87._4_4_ * (float)local_9b0._4_4_ +
                     auVar149._4_4_ * (float)local_990._4_4_;
                auVar81._8_4_ =
                     auVar116._8_4_ * fStack_978 +
                     auVar89._8_4_ * fStack_998 +
                     auVar87._8_4_ * fStack_9a8 + auVar149._8_4_ * fStack_988;
                auVar81._12_4_ =
                     auVar116._12_4_ * fStack_974 +
                     auVar89._12_4_ * fStack_994 +
                     auVar87._12_4_ * fStack_9a4 + auVar149._12_4_ * fStack_984;
                local_7e0._0_16_ = auVar81;
                auVar87 = vsubps_avx(auVar145,auVar81);
                _local_8a0 = auVar87;
                auVar87 = vdpps_avx(auVar87,auVar87,0x7f);
                local_a60 = auVar87._0_4_;
                fStack_a5c = auVar87._4_4_;
                fStack_a58 = auVar87._8_4_;
                fStack_a54 = auVar87._12_4_;
                if (local_a60 < 0.0) {
                  fStack_91c = 0.0;
                  fStack_918 = 0.0;
                  fStack_914 = 0.0;
                  local_a00._0_4_ = fVar228;
                  local_a40._0_4_ = fVar181;
                  local_9e0._0_4_ = fVar204;
                  auVar318._0_4_ = sqrtf(local_a60);
                  auVar318._4_60_ = extraout_var;
                  auVar341._4_4_ = fStack_91c;
                  auVar341._0_4_ = local_920;
                  auVar341._8_4_ = fStack_918;
                  auVar341._12_4_ = fStack_914;
                  auVar315._4_4_ = uStack_a9c;
                  auVar315._0_4_ = local_aa0;
                  auVar315._8_4_ = uStack_a98;
                  auVar315._12_4_ = uStack_a94;
                  auVar87 = auVar318._0_16_;
                  fVar181 = (float)local_a40._0_4_;
                  fVar204 = (float)local_9e0._0_4_;
                }
                else {
                  auVar87 = vsqrtss_avx(auVar87,auVar87);
                  local_a00._0_4_ = fVar228;
                }
                auVar331 = ZEXT1664(auVar87);
                auVar318 = ZEXT1664(auVar315);
                fVar184 = auVar341._0_4_;
                fVar169 = local_ae0._0_4_;
                auVar149 = vshufps_avx(ZEXT416((uint)((float)local_a00._0_4_ * 0.5)),
                                       ZEXT416((uint)((float)local_a00._0_4_ * 0.5)),0);
                auVar89 = ZEXT416((uint)((fVar181 + fVar204 * 4.0) * 0.5));
                auVar89 = vshufps_avx(auVar89,auVar89,0);
                auVar116 = ZEXT416((uint)((fVar169 * -fVar169 - fVar204 * 4.0) * 0.5));
                auVar116 = vshufps_avx(auVar116,auVar116,0);
                auVar82 = ZEXT416((uint)(fVar184 * -fVar184 * 0.5));
                auVar82 = vshufps_avx(auVar82,auVar82,0);
                local_a00._0_4_ =
                     (float)local_980._0_4_ * auVar82._0_4_ +
                     (float)local_9a0._0_4_ * auVar116._0_4_ +
                     (float)local_9b0._0_4_ * auVar149._0_4_ +
                     (float)local_990._0_4_ * auVar89._0_4_;
                local_a00._4_4_ =
                     (float)local_980._4_4_ * auVar82._4_4_ +
                     (float)local_9a0._4_4_ * auVar116._4_4_ +
                     (float)local_9b0._4_4_ * auVar149._4_4_ +
                     (float)local_990._4_4_ * auVar89._4_4_;
                local_a00._8_4_ =
                     fStack_978 * auVar82._8_4_ +
                     fStack_998 * auVar116._8_4_ +
                     fStack_9a8 * auVar149._8_4_ + fStack_988 * auVar89._8_4_;
                local_a00._12_4_ =
                     fStack_974 * auVar82._12_4_ +
                     fStack_994 * auVar116._12_4_ +
                     fStack_9a4 * auVar149._12_4_ + fStack_984 * auVar89._12_4_;
                auVar325 = ZEXT1664(local_a00._0_16_);
                auVar149 = vshufps_avx(_local_ae0,_local_ae0,0);
                auVar89 = ZEXT416((uint)(fVar184 - (fVar169 + fVar169)));
                auVar116 = vshufps_avx(auVar89,auVar89,0);
                auVar89 = ZEXT416((uint)(fVar169 - (fVar184 + fVar184)));
                auVar82 = vshufps_avx(auVar89,auVar89,0);
                auVar88 = vshufps_avx(auVar341,auVar341,0);
                auVar89 = vdpps_avx(local_a00._0_16_,local_a00._0_16_,0x7f);
                auVar112._0_4_ =
                     (float)local_980._0_4_ * auVar88._0_4_ +
                     (float)local_9a0._0_4_ * auVar82._0_4_ +
                     (float)local_9b0._0_4_ * auVar149._0_4_ +
                     (float)local_990._0_4_ * auVar116._0_4_;
                auVar112._4_4_ =
                     (float)local_980._4_4_ * auVar88._4_4_ +
                     (float)local_9a0._4_4_ * auVar82._4_4_ +
                     (float)local_9b0._4_4_ * auVar149._4_4_ +
                     (float)local_990._4_4_ * auVar116._4_4_;
                auVar112._8_4_ =
                     fStack_978 * auVar88._8_4_ +
                     fStack_998 * auVar82._8_4_ +
                     fStack_9a8 * auVar149._8_4_ + fStack_988 * auVar116._8_4_;
                auVar112._12_4_ =
                     fStack_974 * auVar88._12_4_ +
                     fStack_994 * auVar82._12_4_ +
                     fStack_9a4 * auVar149._12_4_ + fStack_984 * auVar116._12_4_;
                auVar149 = vblendps_avx(auVar89,_DAT_01feba10,0xe);
                auVar116 = vrsqrtss_avx(auVar149,auVar149);
                fVar184 = auVar116._0_4_;
                fVar169 = auVar89._0_4_;
                auVar116 = vdpps_avx(local_a00._0_16_,auVar112,0x7f);
                auVar82 = vshufps_avx(auVar89,auVar89,0);
                auVar113._0_4_ = auVar112._0_4_ * auVar82._0_4_;
                auVar113._4_4_ = auVar112._4_4_ * auVar82._4_4_;
                auVar113._8_4_ = auVar112._8_4_ * auVar82._8_4_;
                auVar113._12_4_ = auVar112._12_4_ * auVar82._12_4_;
                auVar116 = vshufps_avx(auVar116,auVar116,0);
                auVar190._0_4_ = (float)local_a00._0_4_ * auVar116._0_4_;
                auVar190._4_4_ = local_a00._4_4_ * auVar116._4_4_;
                auVar190._8_4_ = local_a00._8_4_ * auVar116._8_4_;
                auVar190._12_4_ = local_a00._12_4_ * auVar116._12_4_;
                auVar82 = vsubps_avx(auVar113,auVar190);
                auVar116 = vrcpss_avx(auVar149,auVar149);
                auVar149 = vmaxss_avx(ZEXT416((uint)local_940._0_4_),
                                      ZEXT416((uint)(auVar315._0_4_ * (float)local_660._0_4_)));
                local_920 = auVar149._0_4_;
                auVar149 = ZEXT416((uint)(auVar116._0_4_ * (2.0 - fVar169 * auVar116._0_4_)));
                auVar149 = vshufps_avx(auVar149,auVar149,0);
                uVar72 = CONCAT44(local_a00._4_4_,local_a00._0_4_);
                auVar279._0_8_ = uVar72 ^ 0x8000000080000000;
                auVar279._8_4_ = -local_a00._8_4_;
                auVar279._12_4_ = -local_a00._12_4_;
                auVar116 = ZEXT416((uint)(fVar184 * 1.5 +
                                         fVar169 * -0.5 * fVar184 * fVar184 * fVar184));
                auVar116 = vshufps_avx(auVar116,auVar116,0);
                auVar172._0_4_ = auVar116._0_4_ * auVar82._0_4_ * auVar149._0_4_;
                auVar172._4_4_ = auVar116._4_4_ * auVar82._4_4_ * auVar149._4_4_;
                auVar172._8_4_ = auVar116._8_4_ * auVar82._8_4_ * auVar149._8_4_;
                auVar172._12_4_ = auVar116._12_4_ * auVar82._12_4_ * auVar149._12_4_;
                local_860._0_4_ = (float)local_a00._0_4_ * auVar116._0_4_;
                local_860._4_4_ = local_a00._4_4_ * auVar116._4_4_;
                local_860._8_4_ = local_a00._8_4_ * auVar116._8_4_;
                local_860._12_4_ = local_a00._12_4_ * auVar116._12_4_;
                if (fVar169 < 0.0) {
                  local_a40._0_4_ = auVar87._0_4_;
                  local_9e0._0_16_ = auVar279;
                  local_800._0_16_ = auVar172;
                  auVar318 = ZEXT1664(auVar315);
                  auVar325 = ZEXT1664(local_a00._0_16_);
                  fVar169 = sqrtf(fVar169);
                  auVar331 = ZEXT464((uint)local_a40._0_4_);
                  auVar172 = local_800._0_16_;
                  auVar279 = local_9e0._0_16_;
                }
                else {
                  auVar87 = vsqrtss_avx(auVar89,auVar89);
                  fVar169 = auVar87._0_4_;
                }
                auVar309._4_4_ = fStack_a5c;
                auVar309._0_4_ = local_a60;
                auVar309._8_4_ = fStack_a58;
                auVar309._12_4_ = fStack_a54;
                local_a40._0_16_ = vdpps_avx(_local_8a0,local_860._0_16_,0x7f);
                local_9e0._0_4_ =
                     ((float)local_940._0_4_ / fVar169) * (auVar331._0_4_ + 1.0) +
                     auVar331._0_4_ * (float)local_940._0_4_ + local_920;
                auVar87 = vdpps_avx(auVar279,local_860._0_16_,0x7f);
                auVar149 = vdpps_avx(_local_8a0,auVar172,0x7f);
                auVar89 = vdpps_avx(_local_a20,local_860._0_16_,0x7f);
                auVar116 = vdpps_avx(_local_8a0,auVar279,0x7f);
                fVar169 = auVar87._0_4_ + auVar149._0_4_;
                fVar184 = local_a40._0_4_;
                auVar83._0_4_ = fVar184 * fVar184;
                auVar83._4_4_ = local_a40._4_4_ * local_a40._4_4_;
                auVar83._8_4_ = local_a40._8_4_ * local_a40._8_4_;
                auVar83._12_4_ = local_a40._12_4_ * local_a40._12_4_;
                auVar149 = vsubps_avx(auVar309,auVar83);
                local_860._0_16_ = ZEXT416((uint)fVar169);
                auVar87 = vdpps_avx(_local_8a0,_local_a20,0x7f);
                fVar211 = auVar116._0_4_ - fVar184 * fVar169;
                fVar184 = auVar87._0_4_ - fVar184 * auVar89._0_4_;
                auVar87 = vrsqrtss_avx(auVar149,auVar149);
                fVar181 = auVar149._0_4_;
                fVar169 = auVar87._0_4_;
                fVar169 = fVar169 * 1.5 + fVar181 * -0.5 * fVar169 * fVar169 * fVar169;
                if (fVar181 < 0.0) {
                  local_800._0_16_ = auVar89;
                  local_680._0_4_ = fVar211;
                  local_6a0._0_4_ = fVar184;
                  local_6c0._0_4_ = fVar169;
                  auVar318 = ZEXT1664(auVar318._0_16_);
                  auVar325 = ZEXT1664(auVar325._0_16_);
                  auVar331 = ZEXT1664(auVar331._0_16_);
                  fVar181 = sqrtf(fVar181);
                  auVar309._4_4_ = fStack_a5c;
                  auVar309._0_4_ = local_a60;
                  auVar309._8_4_ = fStack_a58;
                  auVar309._12_4_ = fStack_a54;
                  fVar169 = (float)local_6c0._0_4_;
                  fVar211 = (float)local_680._0_4_;
                  fVar184 = (float)local_6a0._0_4_;
                  auVar89 = local_800._0_16_;
                }
                else {
                  auVar87 = vsqrtss_avx(auVar149,auVar149);
                  fVar181 = auVar87._0_4_;
                }
                auVar311 = ZEXT1664(auVar309);
                auVar322 = local_820._0_28_;
                auVar116 = vpermilps_avx(local_7e0._0_16_,0xff);
                auVar82 = vpermilps_avx(local_a00._0_16_,0xff);
                fVar211 = fVar211 * fVar169 - auVar82._0_4_;
                auVar191._0_8_ = auVar89._0_8_ ^ 0x8000000080000000;
                auVar191._8_4_ = auVar89._8_4_ ^ 0x80000000;
                auVar191._12_4_ = auVar89._12_4_ ^ 0x80000000;
                auVar215._0_4_ = -fVar211;
                auVar215._4_4_ = 0x80000000;
                auVar215._8_4_ = 0x80000000;
                auVar215._12_4_ = 0x80000000;
                auVar87 = vinsertps_avx(ZEXT416((uint)(fVar184 * fVar169)),auVar191,0x10);
                auVar149 = vmovsldup_avx(ZEXT416((uint)(local_860._0_4_ * fVar184 * fVar169 -
                                                       auVar89._0_4_ * fVar211)));
                auVar87 = vdivps_avx(auVar87,auVar149);
                auVar116 = ZEXT416((uint)(fVar181 - auVar116._0_4_));
                auVar89 = vinsertps_avx(local_a40._0_16_,auVar116,0x10);
                auVar173._0_4_ = auVar89._0_4_ * auVar87._0_4_;
                auVar173._4_4_ = auVar89._4_4_ * auVar87._4_4_;
                auVar173._8_4_ = auVar89._8_4_ * auVar87._8_4_;
                auVar173._12_4_ = auVar89._12_4_ * auVar87._12_4_;
                auVar87 = vinsertps_avx(auVar215,local_860._0_16_,0x1c);
                auVar87 = vdivps_avx(auVar87,auVar149);
                auVar149 = vhaddps_avx(auVar173,auVar173);
                auVar146._0_4_ = auVar89._0_4_ * auVar87._0_4_;
                auVar146._4_4_ = auVar89._4_4_ * auVar87._4_4_;
                auVar146._8_4_ = auVar89._8_4_ * auVar87._8_4_;
                auVar146._12_4_ = auVar89._12_4_ * auVar87._12_4_;
                auVar87 = vhaddps_avx(auVar146,auVar146);
                fVar169 = (float)local_ae0._0_4_ - auVar149._0_4_;
                uVar289 = 0;
                fVar184 = 0.0;
                fVar211 = 0.0;
                local_aa0 = local_aa0 - auVar87._0_4_;
                uStack_a9c = 0;
                uStack_a98 = 0;
                uStack_a94 = 0;
                auVar192._8_4_ = 0x7fffffff;
                auVar192._0_8_ = 0x7fffffff7fffffff;
                auVar192._12_4_ = 0x7fffffff;
                auVar227 = ZEXT1664(auVar192);
                auVar87 = vandps_avx(local_a40._0_16_,auVar192);
                bVar57 = true;
                if ((float)local_9e0._0_4_ <= auVar87._0_4_) {
                  auVar244 = ZEXT3264(local_900);
                }
                else {
                  auVar87 = vandps_avx(auVar116,auVar192);
                  auVar244 = ZEXT3264(local_900);
                  if (auVar87._0_4_ <
                      (float)local_6e0._0_4_ * 1.9073486e-06 + (float)local_9e0._0_4_ + local_920) {
                    local_aa0 = local_aa0 + (float)local_7c0._0_4_;
                    uStack_a9c = 0;
                    uStack_a98 = 0;
                    uStack_a94 = 0;
                    if ((((ray->org).field_0.m128[3] <= local_aa0) &&
                        (fVar181 = ray->tfar, local_aa0 <= fVar181)) &&
                       ((0.0 <= fVar169 && (fVar169 <= 1.0)))) {
                      auVar87 = vrsqrtss_avx(auVar309,auVar309);
                      fVar202 = auVar87._0_4_;
                      pGVar6 = (local_ae8->scene->geometries).items[local_a68].ptr;
                      local_a60 = fVar181;
                      if ((pGVar6->mask & ray->mask) != 0) {
                        if ((local_ae8->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                          unaff_R13B = 1;
                        }
                        else {
                          auVar87 = ZEXT416((uint)(fVar202 * 1.5 +
                                                  auVar309._0_4_ * -0.5 * fVar202 *
                                                  fVar202 * fVar202));
                          auVar87 = vshufps_avx(auVar87,auVar87,0);
                          auVar114._0_4_ = auVar87._0_4_ * (float)local_8a0._0_4_;
                          auVar114._4_4_ = auVar87._4_4_ * (float)local_8a0._4_4_;
                          auVar114._8_4_ = auVar87._8_4_ * fStack_898;
                          auVar114._12_4_ = auVar87._12_4_ * fStack_894;
                          auVar311 = ZEXT1664(local_a00._0_16_);
                          auVar84._0_4_ = local_a00._0_4_ + auVar82._0_4_ * auVar114._0_4_;
                          auVar84._4_4_ = local_a00._4_4_ + auVar82._4_4_ * auVar114._4_4_;
                          auVar84._8_4_ = local_a00._8_4_ + auVar82._8_4_ * auVar114._8_4_;
                          auVar84._12_4_ = local_a00._12_4_ + auVar82._12_4_ * auVar114._12_4_;
                          auVar87 = vshufps_avx(auVar114,auVar114,0xc9);
                          auVar149 = vshufps_avx(local_a00._0_16_,local_a00._0_16_,0xc9);
                          auVar115._0_4_ = auVar149._0_4_ * auVar114._0_4_;
                          auVar115._4_4_ = auVar149._4_4_ * auVar114._4_4_;
                          auVar115._8_4_ = auVar149._8_4_ * auVar114._8_4_;
                          auVar115._12_4_ = auVar149._12_4_ * auVar114._12_4_;
                          auVar147._0_4_ = local_a00._0_4_ * auVar87._0_4_;
                          auVar147._4_4_ = local_a00._4_4_ * auVar87._4_4_;
                          auVar147._8_4_ = local_a00._8_4_ * auVar87._8_4_;
                          auVar147._12_4_ = local_a00._12_4_ * auVar87._12_4_;
                          auVar89 = vsubps_avx(auVar147,auVar115);
                          auVar87 = vshufps_avx(auVar89,auVar89,0xc9);
                          auVar149 = vshufps_avx(auVar84,auVar84,0xc9);
                          auVar148._0_4_ = auVar149._0_4_ * auVar87._0_4_;
                          auVar148._4_4_ = auVar149._4_4_ * auVar87._4_4_;
                          auVar148._8_4_ = auVar149._8_4_ * auVar87._8_4_;
                          auVar148._12_4_ = auVar149._12_4_ * auVar87._12_4_;
                          auVar87 = vshufps_avx(auVar89,auVar89,0xd2);
                          auVar85._0_4_ = auVar84._0_4_ * auVar87._0_4_;
                          auVar85._4_4_ = auVar84._4_4_ * auVar87._4_4_;
                          auVar85._8_4_ = auVar84._8_4_ * auVar87._8_4_;
                          auVar85._12_4_ = auVar84._12_4_ * auVar87._12_4_;
                          auVar149 = vsubps_avx(auVar148,auVar85);
                          auVar87 = vshufps_avx(auVar149,auVar149,0xe9);
                          local_8d0 = vmovlps_avx(auVar87);
                          local_8c8 = auVar149._0_4_;
                          local_8c0 = 0;
                          local_8bc = local_aa4;
                          local_8b8 = (undefined4)local_a68;
                          local_8b4 = local_ae8->user->instID[0];
                          local_8b0 = local_ae8->user->instPrimID[0];
                          ray->tfar = local_aa0;
                          local_aec = -1;
                          local_970.valid = &local_aec;
                          local_970.geometryUserPtr = pGVar6->userPtr;
                          local_970.context = local_ae8->user;
                          local_970.hit = (RTCHitN *)&local_8d0;
                          local_970.N = 1;
                          _local_ae0 = ZEXT416((uint)fVar169);
                          local_970.ray = (RTCRayN *)ray;
                          local_8c4 = fVar169;
                          if (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00eeddcb:
                            p_Var7 = local_ae8->args->filter;
                            if (p_Var7 != (RTCFilterFunctionN)0x0) {
                              if (((local_ae8->args->flags &
                                   RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                   RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                 (((pGVar6->field_8).field_0x2 & 0x40) != 0)) {
                                auVar311 = ZEXT1664(auVar311._0_16_);
                                auVar318 = ZEXT1664(auVar318._0_16_);
                                auVar325 = ZEXT1664(auVar325._0_16_);
                                auVar331 = ZEXT1664(auVar331._0_16_);
                                (*p_Var7)(&local_970);
                                auVar322 = local_820._0_28_;
                                auVar244 = ZEXT3264(local_900);
                                auVar227 = ZEXT1664(CONCAT412(0x7fffffff,
                                                              CONCAT48(0x7fffffff,0x7fffffff7fffffff
                                                                      )));
                                fVar169 = (float)local_ae0._0_4_;
                                uVar289 = local_ae0._4_4_;
                                fVar184 = fStack_ad8;
                                fVar211 = fStack_ad4;
                              }
                              if (*local_970.valid == 0) {
                                unaff_R13B = 0;
                                goto LAB_00eede59;
                              }
                            }
                            unaff_R13B = 1;
                          }
                          else {
                            auVar311 = ZEXT1664(local_a00._0_16_);
                            auVar318 = ZEXT1664(auVar318._0_16_);
                            auVar325 = ZEXT1664(auVar325._0_16_);
                            auVar331 = ZEXT1664(auVar331._0_16_);
                            (*pGVar6->occlusionFilterN)(&local_970);
                            auVar322 = local_820._0_28_;
                            auVar244 = ZEXT3264(local_900);
                            auVar227 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                            fVar169 = (float)local_ae0._0_4_;
                            uVar289 = local_ae0._4_4_;
                            fVar184 = fStack_ad8;
                            fVar211 = fStack_ad4;
                            if (*local_970.valid != 0) goto LAB_00eeddcb;
                            unaff_R13B = 0;
                          }
LAB_00eede59:
                          if (unaff_R13B == 0) {
                            ray->tfar = local_a60;
                          }
                        }
                        bVar57 = false;
                        goto LAB_00eedc40;
                      }
                    }
                    bVar57 = false;
                    unaff_R13B = 0;
                  }
                }
LAB_00eedc40:
                if (!bVar57) goto LAB_00eede82;
                lVar71 = lVar71 + -1;
              } while (lVar71 != 0);
              unaff_R13B = 0;
              auVar244 = ZEXT3264(local_900);
LAB_00eede82:
              unaff_R13B = unaff_R13B & 1;
              bVar73 = bVar73 | unaff_R13B;
              fVar169 = ray->tfar;
              auVar100._4_4_ = fVar169;
              auVar100._0_4_ = fVar169;
              auVar100._8_4_ = fVar169;
              auVar100._12_4_ = fVar169;
              auVar100._16_4_ = fVar169;
              auVar100._20_4_ = fVar169;
              auVar100._24_4_ = fVar169;
              auVar100._28_4_ = fVar169;
              auVar95 = vcmpps_avx(_local_540,auVar100,2);
              auVar94 = vandps_avx(auVar95,local_5a0);
              auVar9 = local_5a0 & auVar95;
              auVar224 = local_880;
              local_5a0 = auVar94;
            } while ((((((((auVar9 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar9 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar9 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar9 >> 0x7f,0) != '\0') ||
                       (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar9 >> 0xbf,0) != '\0') ||
                     (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar9[0x1f] < '\0');
          }
          auVar101._0_4_ =
               auVar244._0_4_ * (float)local_620._0_4_ +
               auVar322._0_4_ * (float)local_600._0_4_ + local_580 * (float)local_640._0_4_;
          auVar101._4_4_ =
               auVar244._4_4_ * (float)local_620._4_4_ +
               auVar322._4_4_ * (float)local_600._4_4_ + fStack_57c * (float)local_640._4_4_;
          auVar101._8_4_ =
               auVar244._8_4_ * fStack_618 + auVar322._8_4_ * fStack_5f8 + fStack_578 * fStack_638;
          auVar101._12_4_ =
               auVar244._12_4_ * fStack_614 + auVar322._12_4_ * fStack_5f4 + fStack_574 * fStack_634
          ;
          auVar101._16_4_ =
               auVar244._16_4_ * fStack_610 + auVar322._16_4_ * fStack_5f0 + fStack_570 * fStack_630
          ;
          auVar101._20_4_ =
               auVar244._20_4_ * fStack_60c + auVar322._20_4_ * fStack_5ec + fStack_56c * fStack_62c
          ;
          auVar101._24_4_ =
               auVar244._24_4_ * fStack_608 + auVar322._24_4_ * fStack_5e8 + fStack_568 * fStack_628
          ;
          auVar101._28_4_ = auVar95._28_4_ + auVar95._28_4_ + fStack_564;
          auVar131._8_4_ = 0x7fffffff;
          auVar131._0_8_ = 0x7fffffff7fffffff;
          auVar131._12_4_ = 0x7fffffff;
          auVar131._16_4_ = 0x7fffffff;
          auVar131._20_4_ = 0x7fffffff;
          auVar131._24_4_ = 0x7fffffff;
          auVar131._28_4_ = 0x7fffffff;
          auVar94 = vandps_avx(auVar101,auVar131);
          auVar132._8_4_ = 0x3e99999a;
          auVar132._0_8_ = 0x3e99999a3e99999a;
          auVar132._12_4_ = 0x3e99999a;
          auVar132._16_4_ = 0x3e99999a;
          auVar132._20_4_ = 0x3e99999a;
          auVar132._24_4_ = 0x3e99999a;
          auVar132._28_4_ = 0x3e99999a;
          auVar94 = vcmpps_avx(auVar94,auVar132,1);
          auVar95 = vorps_avx(auVar94,local_2c0);
          auVar133._0_4_ = (float)local_740._0_4_ + auVar224._0_4_;
          auVar133._4_4_ = (float)local_740._4_4_ + auVar224._4_4_;
          auVar133._8_4_ = fStack_738 + auVar224._8_4_;
          auVar133._12_4_ = fStack_734 + auVar224._12_4_;
          auVar133._16_4_ = fStack_730 + auVar224._16_4_;
          auVar133._20_4_ = fStack_72c + auVar224._20_4_;
          auVar133._24_4_ = fStack_728 + auVar224._24_4_;
          auVar133._28_4_ = fStack_724 + auVar224._28_4_;
          fVar169 = ray->tfar;
          auVar157._4_4_ = fVar169;
          auVar157._0_4_ = fVar169;
          auVar157._8_4_ = fVar169;
          auVar157._12_4_ = fVar169;
          auVar157._16_4_ = fVar169;
          auVar157._20_4_ = fVar169;
          auVar157._24_4_ = fVar169;
          auVar157._28_4_ = fVar169;
          auVar94 = vcmpps_avx(auVar133,auVar157,2);
          local_6e0 = vandps_avx(auVar94,local_780);
          auVar134._8_4_ = 3;
          auVar134._0_8_ = 0x300000003;
          auVar134._12_4_ = 3;
          auVar134._16_4_ = 3;
          auVar134._20_4_ = 3;
          auVar134._24_4_ = 3;
          auVar134._28_4_ = 3;
          auVar158._8_4_ = 2;
          auVar158._0_8_ = 0x200000002;
          auVar158._12_4_ = 2;
          auVar158._16_4_ = 2;
          auVar158._20_4_ = 2;
          auVar158._24_4_ = 2;
          auVar158._28_4_ = 2;
          auVar94 = vblendvps_avx(auVar158,auVar134,auVar95);
          auVar87 = vpcmpgtd_avx(auVar94._16_16_,local_4e0);
          auVar149 = vpshufd_avx(local_2a0._0_16_,0);
          auVar149 = vpcmpgtd_avx(auVar94._0_16_,auVar149);
          auVar135._16_16_ = auVar87;
          auVar135._0_16_ = auVar149;
          _local_840 = vblendps_avx(ZEXT1632(auVar149),auVar135,0xf0);
          auVar94 = vandnps_avx(_local_840,local_6e0);
          auVar95 = local_6e0 & ~_local_840;
          if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar95 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar95 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar95 >> 0x7f,0) != '\0') ||
                (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar95 >> 0xbf,0) != '\0') ||
              (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar95[0x1f] < '\0') {
            local_6a0 = _local_4c0;
            local_6c0._4_4_ = (float)local_740._4_4_ + (float)local_4c0._4_4_;
            local_6c0._0_4_ = (float)local_740._0_4_ + (float)local_4c0._0_4_;
            fStack_6b8 = fStack_738 + fStack_4b8;
            fStack_6b4 = fStack_734 + fStack_4b4;
            fStack_6b0 = fStack_730 + fStack_4b0;
            fStack_6ac = fStack_72c + fStack_4ac;
            fStack_6a8 = fStack_728 + fStack_4a8;
            fStack_6a4 = fStack_724 + fStack_4a4;
            do {
              auVar193 = auVar227._0_16_;
              auVar136._8_4_ = 0x7f800000;
              auVar136._0_8_ = 0x7f8000007f800000;
              auVar136._12_4_ = 0x7f800000;
              auVar136._16_4_ = 0x7f800000;
              auVar136._20_4_ = 0x7f800000;
              auVar136._24_4_ = 0x7f800000;
              auVar136._28_4_ = 0x7f800000;
              auVar95 = vblendvps_avx(auVar136,local_6a0,auVar94);
              auVar9 = vshufps_avx(auVar95,auVar95,0xb1);
              auVar9 = vminps_avx(auVar95,auVar9);
              auVar224 = vshufpd_avx(auVar9,auVar9,5);
              auVar9 = vminps_avx(auVar9,auVar224);
              auVar224 = vperm2f128_avx(auVar9,auVar9,1);
              auVar9 = vminps_avx(auVar9,auVar224);
              auVar9 = vcmpps_avx(auVar95,auVar9,0);
              auVar224 = auVar94 & auVar9;
              auVar95 = auVar94;
              if ((((((((auVar224 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar224 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar224 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar224 >> 0x7f,0) != '\0') ||
                    (auVar224 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar224 >> 0xbf,0) != '\0') ||
                  (auVar224 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar224[0x1f] < '\0') {
                auVar95 = vandps_avx(auVar9,auVar94);
              }
              uVar76 = vmovmskps_avx(auVar95);
              uVar74 = 0;
              if (uVar76 != 0) {
                for (; (uVar76 >> uVar74 & 1) == 0; uVar74 = uVar74 + 1) {
                }
              }
              uVar72 = (ulong)uVar74;
              local_5c0 = auVar94;
              *(undefined4 *)(local_5c0 + uVar72 * 4) = 0;
              aVar4 = (ray->dir).field_0;
              _local_a20 = (undefined1  [16])aVar4;
              auVar87 = vdpps_avx((undefined1  [16])aVar4,(undefined1  [16])aVar4,0x7f);
              local_aa0 = local_520[uVar72];
              auVar325 = ZEXT464((uint)local_aa0);
              auVar265 = ZEXT464(*(uint *)(local_4a0 + uVar72 * 4));
              if (auVar87._0_4_ < 0.0) {
                uStack_a9c = 0;
                uStack_a98 = 0;
                uStack_a94 = 0;
                _local_ae0 = ZEXT416(*(uint *)(local_4a0 + uVar72 * 4));
                fVar169 = sqrtf(auVar87._0_4_);
                auVar265 = ZEXT1664(_local_ae0);
                auVar325 = ZEXT1664(CONCAT412(uStack_a94,
                                              CONCAT48(uStack_a98,CONCAT44(uStack_a9c,local_aa0))));
                auVar193._8_4_ = 0x7fffffff;
                auVar193._0_8_ = 0x7fffffff7fffffff;
                auVar193._12_4_ = 0x7fffffff;
              }
              else {
                auVar87 = vsqrtss_avx(auVar87,auVar87);
                fVar169 = auVar87._0_4_;
              }
              auVar149 = vminps_avx(_local_980,_local_9a0);
              auVar87 = vmaxps_avx(_local_980,_local_9a0);
              auVar89 = vminps_avx(_local_990,_local_9b0);
              auVar116 = vminps_avx(auVar149,auVar89);
              auVar149 = vmaxps_avx(_local_990,_local_9b0);
              auVar89 = vmaxps_avx(auVar87,auVar149);
              auVar87 = vandps_avx(auVar116,auVar193);
              auVar149 = vandps_avx(auVar89,auVar193);
              auVar87 = vmaxps_avx(auVar87,auVar149);
              auVar149 = vmovshdup_avx(auVar87);
              auVar149 = vmaxss_avx(auVar149,auVar87);
              auVar87 = vshufpd_avx(auVar87,auVar87,1);
              auVar87 = vmaxss_avx(auVar87,auVar149);
              local_940._0_4_ = auVar87._0_4_ * 1.9073486e-06;
              local_660._0_4_ = fVar169 * 1.9073486e-06;
              local_680._0_16_ = vshufps_avx(auVar89,auVar89,0xff);
              lVar71 = 5;
              do {
                local_aa0 = auVar325._0_4_;
                fVar202 = 1.0 - local_aa0;
                auVar331 = ZEXT464((uint)fVar202);
                fVar169 = fVar202 * fVar202;
                fVar184 = fVar202 * fVar169;
                fVar211 = local_aa0 * local_aa0;
                fVar181 = local_aa0 * fVar211;
                local_920 = local_aa0 * fVar202;
                auVar87 = vshufps_avx(ZEXT416((uint)(fVar181 * 0.16666667)),
                                      ZEXT416((uint)(fVar181 * 0.16666667)),0);
                auVar149 = ZEXT416((uint)((fVar181 * 4.0 + fVar184 +
                                          local_aa0 * local_920 * 12.0 + fVar202 * local_920 * 6.0)
                                         * 0.16666667));
                auVar149 = vshufps_avx(auVar149,auVar149,0);
                auVar89 = ZEXT416((uint)((fVar184 * 4.0 + fVar181 +
                                         fVar202 * local_920 * 12.0 + local_aa0 * local_920 * 6.0) *
                                        0.16666667));
                auVar89 = vshufps_avx(auVar89,auVar89,0);
                auVar82 = auVar265._0_16_;
                auVar116 = vshufps_avx(auVar82,auVar82,0);
                auVar150._0_4_ = auVar116._0_4_ * (float)local_a20._0_4_ + 0.0;
                auVar150._4_4_ = auVar116._4_4_ * (float)local_a20._4_4_ + 0.0;
                auVar150._8_4_ = auVar116._8_4_ * fStack_a18 + 0.0;
                auVar150._12_4_ = auVar116._12_4_ * fStack_a14 + 0.0;
                auVar116 = vshufps_avx(ZEXT416((uint)(fVar184 * 0.16666667)),
                                       ZEXT416((uint)(fVar184 * 0.16666667)),0);
                auVar86._0_4_ =
                     auVar116._0_4_ * (float)local_980._0_4_ +
                     auVar89._0_4_ * (float)local_9a0._0_4_ +
                     auVar87._0_4_ * (float)local_9b0._0_4_ +
                     auVar149._0_4_ * (float)local_990._0_4_;
                auVar86._4_4_ =
                     auVar116._4_4_ * (float)local_980._4_4_ +
                     auVar89._4_4_ * (float)local_9a0._4_4_ +
                     auVar87._4_4_ * (float)local_9b0._4_4_ +
                     auVar149._4_4_ * (float)local_990._4_4_;
                auVar86._8_4_ =
                     auVar116._8_4_ * fStack_978 +
                     auVar89._8_4_ * fStack_998 +
                     auVar87._8_4_ * fStack_9a8 + auVar149._8_4_ * fStack_988;
                auVar86._12_4_ =
                     auVar116._12_4_ * fStack_974 +
                     auVar89._12_4_ * fStack_994 +
                     auVar87._12_4_ * fStack_9a4 + auVar149._12_4_ * fStack_984;
                local_7e0._0_16_ = auVar86;
                auVar87 = vsubps_avx(auVar150,auVar86);
                _local_8a0 = auVar87;
                auVar87 = vdpps_avx(auVar87,auVar87,0x7f);
                local_a60 = auVar87._0_4_;
                auVar320 = auVar325._0_16_;
                uStack_a9c = auVar325._4_4_;
                uStack_a98 = auVar325._8_4_;
                uStack_a94 = auVar325._12_4_;
                _local_ae0 = auVar82;
                fStack_a5c = auVar87._4_4_;
                fStack_a58 = auVar87._8_4_;
                fStack_a54 = auVar87._12_4_;
                if (local_a60 < 0.0) {
                  local_a00._0_16_ = ZEXT416((uint)fVar202);
                  local_a40._0_4_ = fVar211;
                  local_9e0._0_4_ = fVar169;
                  auVar325._0_4_ = sqrtf(local_a60);
                  auVar325._4_60_ = extraout_var_00;
                  auVar331 = ZEXT1664(local_a00._0_16_);
                  auVar320._4_4_ = uStack_a9c;
                  auVar320._0_4_ = local_aa0;
                  auVar320._8_4_ = uStack_a98;
                  auVar320._12_4_ = uStack_a94;
                  auVar87 = auVar325._0_16_;
                  fVar211 = (float)local_a40._0_4_;
                  fVar169 = (float)local_9e0._0_4_;
                  auVar82 = _local_ae0;
                }
                else {
                  auVar87 = vsqrtss_avx(auVar87,auVar87);
                }
                auVar318 = ZEXT1664(auVar87);
                fVar181 = auVar331._0_4_;
                fVar184 = auVar320._0_4_;
                auVar149 = vshufps_avx(ZEXT416((uint)(fVar211 * 0.5)),ZEXT416((uint)(fVar211 * 0.5))
                                       ,0);
                auVar89 = ZEXT416((uint)((fVar169 + local_920 * 4.0) * 0.5));
                auVar89 = vshufps_avx(auVar89,auVar89,0);
                auVar116 = ZEXT416((uint)((fVar184 * -fVar184 - local_920 * 4.0) * 0.5));
                auVar116 = vshufps_avx(auVar116,auVar116,0);
                auVar88 = ZEXT416((uint)(fVar181 * -fVar181 * 0.5));
                auVar88 = vshufps_avx(auVar88,auVar88,0);
                local_a00._0_4_ =
                     (float)local_980._0_4_ * auVar88._0_4_ +
                     (float)local_9a0._0_4_ * auVar116._0_4_ +
                     (float)local_9b0._0_4_ * auVar149._0_4_ +
                     (float)local_990._0_4_ * auVar89._0_4_;
                local_a00._4_4_ =
                     (float)local_980._4_4_ * auVar88._4_4_ +
                     (float)local_9a0._4_4_ * auVar116._4_4_ +
                     (float)local_9b0._4_4_ * auVar149._4_4_ +
                     (float)local_990._4_4_ * auVar89._4_4_;
                local_a00._8_4_ =
                     fStack_978 * auVar88._8_4_ +
                     fStack_998 * auVar116._8_4_ +
                     fStack_9a8 * auVar149._8_4_ + fStack_988 * auVar89._8_4_;
                local_a00._12_4_ =
                     fStack_974 * auVar88._12_4_ +
                     fStack_994 * auVar116._12_4_ +
                     fStack_9a4 * auVar149._12_4_ + fStack_984 * auVar89._12_4_;
                auVar149 = vshufps_avx(auVar320,auVar320,0);
                auVar89 = ZEXT416((uint)(fVar181 - (fVar184 + fVar184)));
                auVar116 = vshufps_avx(auVar89,auVar89,0);
                auVar89 = ZEXT416((uint)(fVar184 - (fVar181 + fVar181)));
                auVar88 = vshufps_avx(auVar89,auVar89,0);
                auVar79 = auVar331._0_16_;
                auVar78 = vshufps_avx(auVar79,auVar79,0);
                auVar89 = vdpps_avx(local_a00._0_16_,local_a00._0_16_,0x7f);
                auVar117._0_4_ =
                     (float)local_980._0_4_ * auVar78._0_4_ +
                     (float)local_9a0._0_4_ * auVar88._0_4_ +
                     (float)local_9b0._0_4_ * auVar149._0_4_ +
                     (float)local_990._0_4_ * auVar116._0_4_;
                auVar117._4_4_ =
                     (float)local_980._4_4_ * auVar78._4_4_ +
                     (float)local_9a0._4_4_ * auVar88._4_4_ +
                     (float)local_9b0._4_4_ * auVar149._4_4_ +
                     (float)local_990._4_4_ * auVar116._4_4_;
                auVar117._8_4_ =
                     fStack_978 * auVar78._8_4_ +
                     fStack_998 * auVar88._8_4_ +
                     fStack_9a8 * auVar149._8_4_ + fStack_988 * auVar116._8_4_;
                auVar117._12_4_ =
                     fStack_974 * auVar78._12_4_ +
                     fStack_994 * auVar88._12_4_ +
                     fStack_9a4 * auVar149._12_4_ + fStack_984 * auVar116._12_4_;
                auVar149 = vblendps_avx(auVar89,_DAT_01feba10,0xe);
                auVar116 = vrsqrtss_avx(auVar149,auVar149);
                fVar184 = auVar116._0_4_;
                fVar169 = auVar89._0_4_;
                auVar116 = vdpps_avx(local_a00._0_16_,auVar117,0x7f);
                auVar88 = vshufps_avx(auVar89,auVar89,0);
                auVar118._0_4_ = auVar117._0_4_ * auVar88._0_4_;
                auVar118._4_4_ = auVar117._4_4_ * auVar88._4_4_;
                auVar118._8_4_ = auVar117._8_4_ * auVar88._8_4_;
                auVar118._12_4_ = auVar117._12_4_ * auVar88._12_4_;
                auVar116 = vshufps_avx(auVar116,auVar116,0);
                auVar194._0_4_ = (float)local_a00._0_4_ * auVar116._0_4_;
                auVar194._4_4_ = local_a00._4_4_ * auVar116._4_4_;
                auVar194._8_4_ = local_a00._8_4_ * auVar116._8_4_;
                auVar194._12_4_ = local_a00._12_4_ * auVar116._12_4_;
                auVar88 = vsubps_avx(auVar118,auVar194);
                auVar116 = vrcpss_avx(auVar149,auVar149);
                auVar149 = vmaxss_avx(ZEXT416((uint)local_940._0_4_),
                                      ZEXT416((uint)(auVar82._0_4_ * (float)local_660._0_4_)));
                local_920 = auVar149._0_4_;
                auVar149 = ZEXT416((uint)(auVar116._0_4_ * (2.0 - fVar169 * auVar116._0_4_)));
                auVar149 = vshufps_avx(auVar149,auVar149,0);
                uVar72 = CONCAT44(local_a00._4_4_,local_a00._0_4_);
                auVar321._0_8_ = uVar72 ^ 0x8000000080000000;
                auVar321._8_4_ = -local_a00._8_4_;
                auVar321._12_4_ = -local_a00._12_4_;
                auVar116 = ZEXT416((uint)(fVar184 * 1.5 +
                                         fVar169 * -0.5 * fVar184 * fVar184 * fVar184));
                auVar116 = vshufps_avx(auVar116,auVar116,0);
                auVar174._0_4_ = auVar116._0_4_ * auVar88._0_4_ * auVar149._0_4_;
                auVar174._4_4_ = auVar116._4_4_ * auVar88._4_4_ * auVar149._4_4_;
                auVar174._8_4_ = auVar116._8_4_ * auVar88._8_4_ * auVar149._8_4_;
                auVar174._12_4_ = auVar116._12_4_ * auVar88._12_4_ * auVar149._12_4_;
                local_860._0_4_ = (float)local_a00._0_4_ * auVar116._0_4_;
                local_860._4_4_ = local_a00._4_4_ * auVar116._4_4_;
                local_860._8_4_ = local_a00._8_4_ * auVar116._8_4_;
                local_860._12_4_ = local_a00._12_4_ * auVar116._12_4_;
                if (fVar169 < 0.0) {
                  local_a40._0_4_ = auVar87._0_4_;
                  local_9e0._0_16_ = auVar321;
                  local_900._0_16_ = auVar174;
                  auVar331 = ZEXT1664(auVar79);
                  fVar169 = sqrtf(fVar169);
                  auVar318 = ZEXT464((uint)local_a40._0_4_);
                  auVar174 = local_900._0_16_;
                  auVar321 = local_9e0._0_16_;
                }
                else {
                  auVar87 = vsqrtss_avx(auVar89,auVar89);
                  fVar169 = auVar87._0_4_;
                }
                auVar280._4_4_ = fStack_a5c;
                auVar280._0_4_ = local_a60;
                auVar280._8_4_ = fStack_a58;
                auVar280._12_4_ = fStack_a54;
                local_a40._0_16_ = vdpps_avx(_local_8a0,local_860._0_16_,0x7f);
                local_9e0._0_4_ =
                     ((float)local_940._0_4_ / fVar169) * (auVar318._0_4_ + 1.0) +
                     auVar318._0_4_ * (float)local_940._0_4_ + local_920;
                auVar87 = vdpps_avx(auVar321,local_860._0_16_,0x7f);
                auVar149 = vdpps_avx(_local_8a0,auVar174,0x7f);
                auVar89 = vdpps_avx(_local_a20,local_860._0_16_,0x7f);
                auVar116 = vdpps_avx(_local_8a0,auVar321,0x7f);
                fVar169 = auVar87._0_4_ + auVar149._0_4_;
                fVar184 = local_a40._0_4_;
                auVar90._0_4_ = fVar184 * fVar184;
                auVar90._4_4_ = local_a40._4_4_ * local_a40._4_4_;
                auVar90._8_4_ = local_a40._8_4_ * local_a40._8_4_;
                auVar90._12_4_ = local_a40._12_4_ * local_a40._12_4_;
                auVar149 = vsubps_avx(auVar280,auVar90);
                local_860._0_16_ = ZEXT416((uint)fVar169);
                auVar87 = vdpps_avx(_local_8a0,_local_a20,0x7f);
                fVar211 = auVar116._0_4_ - fVar184 * fVar169;
                fVar184 = auVar87._0_4_ - fVar184 * auVar89._0_4_;
                auVar87 = vrsqrtss_avx(auVar149,auVar149);
                fVar181 = auVar149._0_4_;
                fVar169 = auVar87._0_4_;
                fVar169 = fVar169 * 1.5 + fVar181 * -0.5 * fVar169 * fVar169 * fVar169;
                if (fVar181 < 0.0) {
                  local_900._0_16_ = auVar89;
                  local_880._0_4_ = fVar211;
                  local_820._0_4_ = fVar184;
                  local_800._0_4_ = fVar169;
                  auVar318 = ZEXT1664(auVar318._0_16_);
                  auVar331 = ZEXT1664(auVar331._0_16_);
                  fVar181 = sqrtf(fVar181);
                  auVar280._4_4_ = fStack_a5c;
                  auVar280._0_4_ = local_a60;
                  auVar280._8_4_ = fStack_a58;
                  auVar280._12_4_ = fStack_a54;
                  fVar169 = (float)local_800._0_4_;
                  fVar211 = (float)local_880._0_4_;
                  fVar184 = (float)local_820._0_4_;
                  auVar89 = local_900._0_16_;
                }
                else {
                  auVar87 = vsqrtss_avx(auVar149,auVar149);
                  fVar181 = auVar87._0_4_;
                }
                auVar311 = ZEXT1664(local_a00._0_16_);
                auVar82 = vpermilps_avx(local_7e0._0_16_,0xff);
                auVar116 = vshufps_avx(local_a00._0_16_,local_a00._0_16_,0xff);
                fVar211 = fVar211 * fVar169 - auVar116._0_4_;
                auVar195._0_8_ = auVar89._0_8_ ^ 0x8000000080000000;
                auVar195._8_4_ = auVar89._8_4_ ^ 0x80000000;
                auVar195._12_4_ = auVar89._12_4_ ^ 0x80000000;
                auVar216._0_4_ = -fVar211;
                auVar216._4_4_ = 0x80000000;
                auVar216._8_4_ = 0x80000000;
                auVar216._12_4_ = 0x80000000;
                auVar87 = vinsertps_avx(ZEXT416((uint)(fVar184 * fVar169)),auVar195,0x10);
                auVar149 = vmovsldup_avx(ZEXT416((uint)(local_860._0_4_ * fVar184 * fVar169 -
                                                       auVar89._0_4_ * fVar211)));
                auVar87 = vdivps_avx(auVar87,auVar149);
                auVar244 = ZEXT1664(local_a40._0_16_);
                auVar82 = ZEXT416((uint)(fVar181 - auVar82._0_4_));
                auVar89 = vinsertps_avx(local_a40._0_16_,auVar82,0x10);
                auVar175._0_4_ = auVar89._0_4_ * auVar87._0_4_;
                auVar175._4_4_ = auVar89._4_4_ * auVar87._4_4_;
                auVar175._8_4_ = auVar89._8_4_ * auVar87._8_4_;
                auVar175._12_4_ = auVar89._12_4_ * auVar87._12_4_;
                auVar87 = vinsertps_avx(auVar216,local_860._0_16_,0x1c);
                auVar87 = vdivps_avx(auVar87,auVar149);
                auVar149 = vhaddps_avx(auVar175,auVar175);
                auVar151._0_4_ = auVar89._0_4_ * auVar87._0_4_;
                auVar151._4_4_ = auVar89._4_4_ * auVar87._4_4_;
                auVar151._8_4_ = auVar89._8_4_ * auVar87._8_4_;
                auVar151._12_4_ = auVar89._12_4_ * auVar87._12_4_;
                auVar87 = vhaddps_avx(auVar151,auVar151);
                local_aa0 = local_aa0 - auVar149._0_4_;
                auVar325 = ZEXT464((uint)local_aa0);
                fVar169 = (float)local_ae0._0_4_ - auVar87._0_4_;
                auVar265 = ZEXT464((uint)fVar169);
                auVar196._8_4_ = 0x7fffffff;
                auVar196._0_8_ = 0x7fffffff7fffffff;
                auVar196._12_4_ = 0x7fffffff;
                auVar227 = ZEXT1664(auVar196);
                auVar87 = vandps_avx(local_a40._0_16_,auVar196);
                bVar57 = true;
                if (auVar87._0_4_ < (float)local_9e0._0_4_) {
                  auVar87 = vandps_avx(auVar82,auVar196);
                  if (auVar87._0_4_ <
                      (float)local_680._0_4_ * 1.9073486e-06 + (float)local_9e0._0_4_ + local_920) {
                    fVar169 = fVar169 + (float)local_7c0._0_4_;
                    auVar265 = ZEXT464((uint)fVar169);
                    if (((((ray->org).field_0.m128[3] <= fVar169) &&
                         (fVar184 = ray->tfar, fVar169 <= fVar184)) && (0.0 <= local_aa0)) &&
                       (local_aa0 <= 1.0)) {
                      auVar87 = vrsqrtss_avx(auVar280,auVar280);
                      fVar211 = auVar87._0_4_;
                      pGVar6 = (local_ae8->scene->geometries).items[local_a68].ptr;
                      if ((pGVar6->mask & ray->mask) != 0) {
                        if ((local_ae8->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                          unaff_R13B = 1;
                        }
                        else {
                          auVar87 = ZEXT416((uint)(fVar211 * 1.5 +
                                                  auVar280._0_4_ * -0.5 * fVar211 *
                                                  fVar211 * fVar211));
                          auVar87 = vshufps_avx(auVar87,auVar87,0);
                          auVar119._0_4_ = auVar87._0_4_ * (float)local_8a0._0_4_;
                          auVar119._4_4_ = auVar87._4_4_ * (float)local_8a0._4_4_;
                          auVar119._8_4_ = auVar87._8_4_ * fStack_898;
                          auVar119._12_4_ = auVar87._12_4_ * fStack_894;
                          auVar91._0_4_ = local_a00._0_4_ + auVar116._0_4_ * auVar119._0_4_;
                          auVar91._4_4_ = local_a00._4_4_ + auVar116._4_4_ * auVar119._4_4_;
                          auVar91._8_4_ = local_a00._8_4_ + auVar116._8_4_ * auVar119._8_4_;
                          auVar91._12_4_ = local_a00._12_4_ + auVar116._12_4_ * auVar119._12_4_;
                          auVar87 = vshufps_avx(auVar119,auVar119,0xc9);
                          auVar149 = vshufps_avx(local_a00._0_16_,local_a00._0_16_,0xc9);
                          auVar120._0_4_ = auVar149._0_4_ * auVar119._0_4_;
                          auVar120._4_4_ = auVar149._4_4_ * auVar119._4_4_;
                          auVar120._8_4_ = auVar149._8_4_ * auVar119._8_4_;
                          auVar120._12_4_ = auVar149._12_4_ * auVar119._12_4_;
                          auVar152._0_4_ = local_a00._0_4_ * auVar87._0_4_;
                          auVar152._4_4_ = local_a00._4_4_ * auVar87._4_4_;
                          auVar152._8_4_ = local_a00._8_4_ * auVar87._8_4_;
                          auVar152._12_4_ = local_a00._12_4_ * auVar87._12_4_;
                          auVar89 = vsubps_avx(auVar152,auVar120);
                          auVar87 = vshufps_avx(auVar89,auVar89,0xc9);
                          auVar149 = vshufps_avx(auVar91,auVar91,0xc9);
                          auVar153._0_4_ = auVar149._0_4_ * auVar87._0_4_;
                          auVar153._4_4_ = auVar149._4_4_ * auVar87._4_4_;
                          auVar153._8_4_ = auVar149._8_4_ * auVar87._8_4_;
                          auVar153._12_4_ = auVar149._12_4_ * auVar87._12_4_;
                          auVar87 = vshufps_avx(auVar89,auVar89,0xd2);
                          auVar92._0_4_ = auVar91._0_4_ * auVar87._0_4_;
                          auVar92._4_4_ = auVar91._4_4_ * auVar87._4_4_;
                          auVar92._8_4_ = auVar91._8_4_ * auVar87._8_4_;
                          auVar92._12_4_ = auVar91._12_4_ * auVar87._12_4_;
                          auVar149 = vsubps_avx(auVar153,auVar92);
                          auVar87 = vshufps_avx(auVar149,auVar149,0xe9);
                          local_8d0 = vmovlps_avx(auVar87);
                          local_8c8 = auVar149._0_4_;
                          local_8c0 = 0;
                          local_8bc = local_aa4;
                          local_8b8 = (undefined4)local_a68;
                          local_8b4 = local_ae8->user->instID[0];
                          local_8b0 = local_ae8->user->instPrimID[0];
                          ray->tfar = fVar169;
                          local_aec = -1;
                          local_970.valid = &local_aec;
                          local_970.geometryUserPtr = pGVar6->userPtr;
                          local_970.context = local_ae8->user;
                          local_970.hit = (RTCHitN *)&local_8d0;
                          local_970.N = 1;
                          uStack_a9c = 0;
                          uStack_a98 = 0;
                          uStack_a94 = 0;
                          _local_ae0 = ZEXT416((uint)fVar169);
                          local_a60 = fVar184;
                          local_970.ray = (RTCRayN *)ray;
                          local_8c4 = local_aa0;
                          if (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00eee895:
                            p_Var7 = local_ae8->args->filter;
                            if (p_Var7 != (RTCFilterFunctionN)0x0) {
                              if (((local_ae8->args->flags &
                                   RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                   RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                 (((pGVar6->field_8).field_0x2 & 0x40) != 0)) {
                                auVar244 = ZEXT1664(auVar244._0_16_);
                                auVar311 = ZEXT1664(auVar311._0_16_);
                                auVar318 = ZEXT1664(auVar318._0_16_);
                                auVar331 = ZEXT1664(auVar331._0_16_);
                                (*p_Var7)(&local_970);
                                auVar265 = ZEXT1664(_local_ae0);
                                auVar325 = ZEXT1664(CONCAT412(uStack_a94,
                                                              CONCAT48(uStack_a98,
                                                                       CONCAT44(uStack_a9c,local_aa0
                                                                               ))));
                                auVar227 = ZEXT1664(CONCAT412(0x7fffffff,
                                                              CONCAT48(0x7fffffff,0x7fffffff7fffffff
                                                                      )));
                              }
                              if (*local_970.valid == 0) goto LAB_00eee8f4;
                            }
                            unaff_R13B = 1;
                          }
                          else {
                            auVar244 = ZEXT1664(local_a40._0_16_);
                            auVar311 = ZEXT1664(local_a00._0_16_);
                            auVar318 = ZEXT1664(auVar318._0_16_);
                            auVar331 = ZEXT1664(auVar331._0_16_);
                            (*pGVar6->occlusionFilterN)(&local_970);
                            auVar265 = ZEXT1664(_local_ae0);
                            auVar325 = ZEXT1664(CONCAT412(uStack_a94,
                                                          CONCAT48(uStack_a98,
                                                                   CONCAT44(uStack_a9c,local_aa0))))
                            ;
                            auVar227 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                            if (*local_970.valid != 0) goto LAB_00eee895;
LAB_00eee8f4:
                            unaff_R13B = 0;
                          }
                          if (unaff_R13B == 0) {
                            ray->tfar = local_a60;
                          }
                        }
                        bVar57 = false;
                        goto LAB_00eee716;
                      }
                    }
                    bVar57 = false;
                    unaff_R13B = 0;
                  }
                }
LAB_00eee716:
                if (!bVar57) goto LAB_00eee90e;
                lVar71 = lVar71 + -1;
              } while (lVar71 != 0);
              unaff_R13B = 0;
LAB_00eee90e:
              unaff_R13B = unaff_R13B & 1;
              bVar73 = bVar73 | unaff_R13B;
              fVar169 = ray->tfar;
              auVar102._4_4_ = fVar169;
              auVar102._0_4_ = fVar169;
              auVar102._8_4_ = fVar169;
              auVar102._12_4_ = fVar169;
              auVar102._16_4_ = fVar169;
              auVar102._20_4_ = fVar169;
              auVar102._24_4_ = fVar169;
              auVar102._28_4_ = fVar169;
              auVar95 = vcmpps_avx(_local_6c0,auVar102,2);
              auVar94 = vandps_avx(auVar95,local_5c0);
              local_5c0 = local_5c0 & auVar95;
            } while ((((((((local_5c0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (local_5c0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_5c0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(local_5c0 >> 0x7f,0) != '\0') ||
                       (local_5c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(local_5c0 >> 0xbf,0) != '\0') ||
                     (local_5c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     local_5c0[0x1f] < '\0');
          }
          auVar94 = vandps_avx(local_760,local_560);
          auVar95 = vandps_avx(_local_840,local_6e0);
          auVar265 = ZEXT3264(_local_740);
          auVar159._0_4_ = local_740._0_4_ + local_480._0_4_;
          auVar159._4_4_ = local_740._4_4_ + local_480._4_4_;
          auVar159._8_4_ = local_740._8_4_ + local_480._8_4_;
          auVar159._12_4_ = local_740._12_4_ + local_480._12_4_;
          auVar159._16_4_ = local_740._16_4_ + local_480._16_4_;
          auVar159._20_4_ = local_740._20_4_ + local_480._20_4_;
          auVar159._24_4_ = local_740._24_4_ + local_480._24_4_;
          auVar159._28_4_ = local_740._28_4_ + local_480._28_4_;
          fVar169 = ray->tfar;
          auVar201._4_4_ = fVar169;
          auVar201._0_4_ = fVar169;
          auVar201._8_4_ = fVar169;
          auVar201._12_4_ = fVar169;
          auVar201._16_4_ = fVar169;
          auVar201._20_4_ = fVar169;
          auVar201._24_4_ = fVar169;
          auVar201._28_4_ = fVar169;
          auVar9 = vcmpps_avx(auVar159,auVar201,2);
          auVar94 = vandps_avx(auVar9,auVar94);
          auVar225._0_4_ = local_740._0_4_ + local_4c0._0_4_;
          auVar225._4_4_ = local_740._4_4_ + local_4c0._4_4_;
          auVar225._8_4_ = local_740._8_4_ + local_4c0._8_4_;
          auVar225._12_4_ = local_740._12_4_ + local_4c0._12_4_;
          auVar225._16_4_ = local_740._16_4_ + local_4c0._16_4_;
          auVar225._20_4_ = local_740._20_4_ + local_4c0._20_4_;
          auVar225._24_4_ = local_740._24_4_ + local_4c0._24_4_;
          auVar225._28_4_ = local_740._28_4_ + local_4c0._28_4_;
          auVar227 = ZEXT3264(auVar225);
          auVar9 = vcmpps_avx(auVar225,auVar201,2);
          auVar95 = vandps_avx(auVar9,auVar95);
          auVar95 = vorps_avx(auVar94,auVar95);
          if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar95 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar95 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar95 >> 0x7f,0) != '\0') ||
                (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar95 >> 0xbf,0) != '\0') ||
              (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar95[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar75 * 0x60) = auVar95;
            auVar94 = vblendvps_avx(_local_4c0,local_480,auVar94);
            *(undefined1 (*) [32])(auStack_160 + uVar75 * 0x60) = auVar94;
            uVar1 = vmovlps_avx(local_7b0);
            *(undefined8 *)(afStack_140 + uVar75 * 0x18) = uVar1;
            auStack_138[uVar75 * 0x18] = (int)local_5e0 + 1;
            uVar75 = (ulong)((int)uVar75 + 1);
          }
          goto LAB_00eed246;
        }
      }
      auVar265 = ZEXT3264(_local_740);
    }
LAB_00eed246:
    fVar169 = ray->tfar;
    auVar98._4_4_ = fVar169;
    auVar98._0_4_ = fVar169;
    auVar98._8_4_ = fVar169;
    auVar98._12_4_ = fVar169;
    auVar98._16_4_ = fVar169;
    auVar98._20_4_ = fVar169;
    auVar98._24_4_ = fVar169;
    auVar98._28_4_ = fVar169;
    uVar72 = uVar75;
    do {
      if ((int)uVar72 == 0) {
        if (bVar73 != 0) {
          return local_aed;
        }
        fVar169 = ray->tfar;
        auVar93._4_4_ = fVar169;
        auVar93._0_4_ = fVar169;
        auVar93._8_4_ = fVar169;
        auVar93._12_4_ = fVar169;
        auVar87 = vcmpps_avx(local_4d0,auVar93,2);
        uVar74 = vmovmskps_avx(auVar87);
        uVar74 = (uint)local_788 & uVar74;
        local_aed = uVar74 != 0;
        if (!local_aed) {
          return local_aed;
        }
        goto LAB_00eec184;
      }
      uVar75 = (ulong)((int)uVar72 - 1);
      lVar71 = uVar75 * 0x60;
      auVar94 = *(undefined1 (*) [32])(auStack_160 + lVar71);
      auVar125._0_4_ = auVar265._0_4_ + auVar94._0_4_;
      auVar125._4_4_ = auVar265._4_4_ + auVar94._4_4_;
      auVar125._8_4_ = auVar265._8_4_ + auVar94._8_4_;
      auVar125._12_4_ = auVar265._12_4_ + auVar94._12_4_;
      auVar125._16_4_ = auVar265._16_4_ + auVar94._16_4_;
      auVar125._20_4_ = auVar265._20_4_ + auVar94._20_4_;
      auVar125._24_4_ = auVar265._24_4_ + auVar94._24_4_;
      auVar125._28_4_ = auVar265._28_4_ + auVar94._28_4_;
      auVar9 = vcmpps_avx(auVar125,auVar98,2);
      auVar95 = vandps_avx(auVar9,*(undefined1 (*) [32])(auStack_180 + lVar71));
      local_480 = auVar95;
      auVar9 = *(undefined1 (*) [32])(auStack_180 + lVar71) & auVar9;
      bVar63 = (auVar9 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar64 = (auVar9 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar62 = (auVar9 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar61 = SUB321(auVar9 >> 0x7f,0) == '\0';
      bVar60 = (auVar9 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar59 = SUB321(auVar9 >> 0xbf,0) == '\0';
      bVar58 = (auVar9 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar57 = -1 < auVar9[0x1f];
      if (((((((!bVar63 || !bVar64) || !bVar62) || !bVar61) || !bVar60) || !bVar59) || !bVar58) ||
          !bVar57) {
        auVar180._8_4_ = 0x7f800000;
        auVar180._0_8_ = 0x7f8000007f800000;
        auVar180._12_4_ = 0x7f800000;
        auVar180._16_4_ = 0x7f800000;
        auVar180._20_4_ = 0x7f800000;
        auVar180._24_4_ = 0x7f800000;
        auVar180._28_4_ = 0x7f800000;
        auVar94 = vblendvps_avx(auVar180,auVar94,auVar95);
        auVar9 = vshufps_avx(auVar94,auVar94,0xb1);
        auVar9 = vminps_avx(auVar94,auVar9);
        auVar224 = vshufpd_avx(auVar9,auVar9,5);
        auVar9 = vminps_avx(auVar9,auVar224);
        auVar224 = vperm2f128_avx(auVar9,auVar9,1);
        auVar9 = vminps_avx(auVar9,auVar224);
        auVar94 = vcmpps_avx(auVar94,auVar9,0);
        auVar9 = auVar95 & auVar94;
        if ((((((((auVar9 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar9 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar9 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar9 >> 0x7f,0) != '\0') ||
              (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar9 >> 0xbf,0) != '\0') ||
            (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar9[0x1f] < '\0') {
          auVar95 = vandps_avx(auVar94,auVar95);
        }
        fVar169 = afStack_140[uVar75 * 0x18 + 1];
        local_5e0 = (ulong)auStack_138[uVar75 * 0x18];
        uVar76 = vmovmskps_avx(auVar95);
        uVar74 = 0;
        if (uVar76 != 0) {
          for (; (uVar76 >> uVar74 & 1) == 0; uVar74 = uVar74 + 1) {
          }
        }
        fVar184 = afStack_140[uVar75 * 0x18];
        *(undefined4 *)(local_480 + (ulong)uVar74 * 4) = 0;
        *(undefined1 (*) [32])(auStack_180 + lVar71) = local_480;
        if ((((((((local_480 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (local_480 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_480 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(local_480 >> 0x7f,0) != '\0') ||
              (local_480 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(local_480 >> 0xbf,0) != '\0') ||
            (local_480 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_480[0x1f] < '\0') {
          uVar75 = uVar72;
        }
        auVar87 = vshufps_avx(ZEXT416((uint)(fVar169 - fVar184)),ZEXT416((uint)(fVar169 - fVar184)),
                              0);
        local_4c0._4_4_ = fVar184 + auVar87._4_4_ * 0.14285715;
        local_4c0._0_4_ = fVar184 + auVar87._0_4_ * 0.0;
        fStack_4b8 = fVar184 + auVar87._8_4_ * 0.2857143;
        fStack_4b4 = fVar184 + auVar87._12_4_ * 0.42857146;
        fStack_4b0 = fVar184 + auVar87._0_4_ * 0.5714286;
        fStack_4ac = fVar184 + auVar87._4_4_ * 0.71428573;
        fStack_4a8 = fVar184 + auVar87._8_4_ * 0.8571429;
        fStack_4a4 = fVar184 + auVar87._12_4_;
        local_7b0._8_8_ = 0;
        local_7b0._0_8_ = *(ulong *)(local_4c0 + (ulong)uVar74 * 4);
      }
      uVar72 = uVar75;
    } while (((((((bVar63 && bVar64) && bVar62) && bVar61) && bVar60) && bVar59) && bVar58) &&
             bVar57);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }
          
          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }